

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AsmJsByteCodeDumper.cpp
# Opt level: O3

void Js::AsmJsByteCodeDumper::DumpOp
               (OpCodeAsmJs op,LayoutSize layoutSize,ByteCodeReader *reader,
               FunctionBody *dumpFunction)

{
  code *pcVar1;
  bool bVar2;
  OpLayoutTypeAsmJs OVar3;
  char16 *pcVar4;
  OpLayoutElementSlot_Small *data;
  OpLayoutFloat32x4_3_Small *data_00;
  OpLayoutDouble1Reg1_Small *pOVar5;
  OpLayoutWasmMemAccess_Small *data_01;
  OpLayoutInt32x4_3_Small *data_02;
  OpLayoutFloat32x4_1Float4_Small *data_03;
  OpLayoutInt32x4_2Int1_Small *data_04;
  OpLayoutAsmReg11_Small *data_05;
  OpLayoutInt8x16_3_Small *data_06;
  OpLayoutInt8x16_1Int16_Small *data_07;
  OpLayoutBool32x4_1Uint32x4_2_Small *data_08;
  OpLayoutUint16x8_1Int8_Small *data_09;
  OpLayoutAsmBr *pOVar6;
  OpLayoutUint16x8_2Int1_Small *data_10;
  OpLayoutInt8x16_2Int16_Small *data_11;
  OpLayoutInt16x8_2Int8_Small *data_12;
  OpLayoutUint32x4_1Bool32x4_1Uint32x4_2_Small *data_13;
  OpLayoutInt16x8_1Bool16x8_1Int16x8_2_Small *data_14;
  OpLayoutLong1Int64x2_1Int1_Small *data_15;
  OpLayoutAsmSimdTypedArr_Small *data_16;
  OpLayoutInt16x8_2Int1_Small *data_17;
  OpLayoutFloat64x2_2Int1Double1_Small *data_18;
  OpLayoutAsmReg3_Small *data_19;
  OpLayoutAsmTypedArr_Medium *data_20;
  OpLayoutLong1Const1_Small *pOVar7;
  OpLayoutInt16x8_3Int8_Small *data_21;
  OpLayoutLong3_Small *data_22;
  OpLayoutFloat32x4_1Bool32x4_1Float32x4_2_Medium *data_23;
  OpLayoutInt32x4_4_Small *data_24;
  OpLayoutLong1Const1_Medium *pOVar8;
  OpLayoutBool16x8_3_Small *data_25;
  OpLayoutInt32x4_4_Medium *data_26;
  OpLayoutFloat64x2_1Double1_Small *pOVar9;
  OpLayoutFloat1Const1_Medium *pOVar10;
  OpLayoutFloat32x4_4_Medium *data_27;
  OpLayoutInt1Bool8x16_1Int1_Small *data_28;
  OpLayoutWasmLoopStart_Medium *pOVar11;
  OpLayoutAsmReg18_Small *data_29;
  OpLayoutBool8x16_1Uint8x16_2_Small *data_30;
  OpLayoutInt32x4_2Int4_Small *data_31;
  OpLayoutFloat32x4_2Float1_Small *data_32;
  OpLayoutFloat32x4_1Bool32x4_1Float32x4_2_Small *data_33;
  OpLayoutUint32x4_2Int1_Small *data_34;
  OpLayoutBool16x8_1Uint16x8_2_Small *data_35;
  OpLayoutAsmReg9_Medium *data_36;
  OpLayoutInt1Int8x16_1Int1_Medium *data_37;
  OpLayoutFloat32x4_3_Medium *data_38;
  OpLayoutFloat32x4_3Int4_Small *data_39;
  OpLayoutDouble1Float1_Medium *pOVar12;
  OpLayoutFloat64x2_1Double1_Medium *pOVar13;
  OpLayoutStartCall *data_40;
  OpLayoutBool8x16_2Int2_Small *data_41;
  OpLayoutBool32x4_1Int32x4_2_Medium *data_42;
  OpLayoutUint32x4_2Int2_Medium *data_43;
  OpLayoutInt3_Medium *data_44;
  OpLayoutAsmReg11_Medium *data_45;
  OpLayoutFloat32x4_1Int32x4_1_Medium *pOVar14;
  OpLayoutDouble3_Small *data_46;
  OpLayoutFloat32x4_1Int8x16_1_Medium *pOVar15;
  OpLayoutUint16x8_2Int1_Medium *data_47;
  OpLayoutFloat32x4_1Float4_Medium *data_48;
  OpLayoutFloat1Const1_Small *pOVar16;
  OpLayoutUint16x8_2Int2_Medium *data_49;
  OpLayoutInt8x16_3Int16_Small *data_50;
  OpLayoutUint32x4_2Int1_Medium *data_51;
  OpLayoutFloat1Float32x4_1Int1_Medium *data_52;
  OpLayoutBool16x8_2Int2_Medium *data_53;
  OpLayoutInt32x4_1Int4_Small *data_54;
  OpLayoutFloat32x4_1Uint8x16_1_Medium *pOVar17;
  OpLayoutBool16x8_3_Medium *data_55;
  OpLayoutInt1Const1_Small *pOVar18;
  OpLayoutAsmReg2_Medium *pOVar19;
  OpLayoutAsmCall_Large *data_56;
  OpLayoutInt64x2_2_Int1_Long1_Medium *data_57;
  OpLayoutFloat32x4_1Uint32x4_1_Small *pOVar20;
  OpLayoutInt8x16_1Float32x4_1_Small *pOVar21;
  OpLayoutInt1Bool32x4_1Int1_Medium *data_58;
  OpLayoutFloat32x4_IntConst4_Medium *data_59;
  OpLayoutDouble1Reg1_Medium *pOVar22;
  OpLayoutBool32x4_1Uint32x4_2_Medium *data_60;
  OpLayoutWasmMemAccess_Large *data_61;
  OpLayoutFloat32x4_2Int4_Small *data_62;
  OpLayoutFloat32x4_1Int8x16_1_Small *pOVar23;
  OpLayoutAsmReg1_Large *pOVar24;
  OpLayoutDouble1Const1_Small *pOVar25;
  OpLayoutUint8x16_2Int1_Medium *data_63;
  OpLayoutInt16x8_1Int8_Small *data_64;
  OpLayoutFloat32x4_1Uint16x8_1_Medium *pOVar26;
  OpLayoutBool8x16_3_Small *data_65;
  OpLayoutAsmReg18_Large *data_66;
  OpLayoutInt1Const1_Medium *pOVar27;
  OpLayoutBool8x16_1Uint8x16_2_Medium *data_67;
  OpLayoutAsmReg17_Large *data_68;
  OpLayoutInt8x16_2Int2_Medium *data_69;
  OpLayoutInt16x8_3_Medium *data_70;
  OpLayoutLong3_Medium *data_71;
  OpLayoutFloat32x4_2Int1Float1_Small *data_72;
  OpLayoutInt1Double2_Large *data_73;
  OpLayoutInt1Uint32x4_1Int1_Medium *data_74;
  OpLayoutInt32x4_3_Medium *data_75;
  OpLayoutAsmTypedArr_Small *data_76;
  OpLayoutInt3_Large *data_77;
  OpLayoutAsmReg1_Small *pOVar28;
  OpLayoutUint16x8_2Int2_Small *data_78;
  OpLayoutBool32x4_1Int4_Medium *data_79;
  OpLayoutBool32x4_1Int32x4_2_Small *data_80;
  OpLayoutFloat64x2_1Double1_Large *pOVar29;
  OpLayoutUint8x16_2Int16_Medium *data_81;
  OpLayoutDouble1Float64x2_1Int1_Small *data_82;
  OpLayoutBrInt1Const1_Large *data_83;
  OpLayoutFloat32x4_2Float1_Large *data_84;
  OpLayoutInt32x4_2Int1_Medium *data_85;
  OpLayoutUint8x16_2Int16_Small *data_86;
  OpLayoutAsmReg4_Medium *data_87;
  OpLayoutAsmTypedArr_Large *data_88;
  OpLayoutBool8x16_1Int1_Small *pOVar30;
  OpLayoutWasmMemAccess_Medium *data_89;
  OpLayoutInt16x8_2Int2_Small *data_90;
  OpLayoutDouble3_Large *data_91;
  OpLayoutAsmReg5_Medium *data_92;
  OpLayoutProfiledAsmCall_Large *data_93;
  OpLayoutWasmLoopStart_Large *pOVar31;
  OpLayoutFloat1Float32x4_1Int1_Large *data_94;
  OpLayoutInt16x8_3Int8_Large *data_95;
  OpLayoutBool16x8_1Int16x8_2_Medium *data_96;
  OpLayoutInt1Bool64x2_1_Small *pOVar32;
  OpLayoutInt32x4_1Bool32x4_1Int32x4_2_Medium *data_97;
  OpLayoutInt32x4_2Int1_Large *data_98;
  OpLayoutBool16x8_2Int2_Small *data_99;
  OpLayoutDouble1Long1_Large *pOVar33;
  OpLayoutBrInt1_Large *pOVar34;
  OpLayoutFloat32x4_2Int4_Large *data_x00100;
  OpLayoutInt32x4_1Int4_Medium *data_x00101;
  OpLayoutInt8x16_1Int16_Medium *data_x00102;
  OpLayoutInt8x16_2Int1_Large *data_x00103;
  OpLayoutBool16x8_1Int16x8_2_Large *data_x00104;
  OpLayoutInt1Bool8x16_1_Medium *pOVar35;
  OpLayoutUint8x16_3Int16_Medium *data_x00105;
  OpLayoutAsmReg11_Large *data_x00106;
  OpLayoutAsmReg19_Small *data_x00107;
  OpLayoutFloat32x4_3Int4_Large *data_x00108;
  OpLayoutAsmReg10_Large *data_x00109;
  OpLayoutBool32x4_3_Small *data_x00110;
  OpLayoutInt8x16_2Int2_Small *data_x00111;
  OpLayoutUint32x4_1Int4_Large *data_x00112;
  OpLayoutInt64x2_2_Int1_Long1_Large *data_x00113;
  OpLayoutInt8x16_3_Large *data_x00114;
  OpLayoutInt16x8_1Bool16x8_1Int16x8_2_Large *data_x00115;
  OpLayoutBool32x4_1Uint32x4_2_Large *data_x00116;
  OpLayoutInt16x8_2Int8_Medium *data_x00117;
  OpLayoutAsmReg7_Small *data_x00118;
  OpLayoutInt8x16_3Int16_Large *data_x00119;
  OpLayoutInt1Uint8x16_1Int1_Medium *data_x00120;
  OpLayoutAsmReg3_Medium *data_x00121;
  OpLayoutUint16x8_2Int1_Large *data_x00122;
  OpLayoutBool32x4_1Int4_Small *data_x00123;
  OpLayoutInt3_Small *data_x00124;
  OpLayoutInt8x16_1Bool8x16_1Int8x16_2_Large *data_x00125;
  OpLayoutDouble1Const1_Large *pOVar36;
  OpLayoutUint8x16_1Int16_Large *data_x00126;
  OpLayoutDouble1Const1_Medium *pOVar37;
  OpLayoutAsmSimdTypedArr_Medium *data_x00127;
  OpLayoutAsmReg6_Large *data_x00128;
  OpLayoutAsmReg9_Small *data_x00129;
  OpLayoutFloat32x4_1Float4_Large *data_x00130;
  OpLayoutInt16x8_2Int2_Medium *data_x00131;
  undefined4 *puVar38;
  OpLayoutInt32x4_1Bool32x4_1Int32x4_2_Large *data_x00132;
  OpLayoutInt16x8_2Int2_Large *data_x00133;
  OpLayoutInt16x8_1Int8_Medium *data_x00134;
  OpLayoutInt8x16_2Int2_Large *data_x00135;
  OpLayoutUint32x4_3_Large *data_x00136;
  OpLayoutUint16x8_3_Large *data_x00137;
  OpLayoutInt16x8_3_Large *data_x00138;
  OpLayoutUint16x8_3Int8_Large *data_x00139;
  OpLayoutUint32x4_2Int4_Large *data_x00140;
  OpLayoutUint8x16_3_Large *data_x00141;
  OpLayoutUint8x16_2Int2_Large *data_x00142;
  OpLayoutAsmReg1_Medium *pOVar39;
  OpLayoutUint32x4_3_Medium *data_x00143;
  OpLayoutFloat32x4_2Int1Float1_Large *data_x00144;
  OpLayoutUint32x4_1Bool32x4_1Uint32x4_2_Large *data_x00145;
  OpLayoutFloat32x4_1Uint32x4_1_Large *pOVar40;
  OpLayoutBool8x16_1Uint8x16_2_Large *data_x00146;
  OpLayoutInt1Int32x4_1Int1_Large *data_x00147;
  OpLayoutBool16x8_1Int8_Large *data_x00148;
  OpLayoutBrInt1Const1_Small *data_x00149;
  OpLayoutBool8x16_1Int1_Medium *pOVar41;
  OpLayoutBrInt1_Medium *pOVar42;
  OpLayoutBool16x8_2Int2_Large *data_x00150;
  OpLayoutUint8x16_1Bool8x16_1Uint8x16_2_Large *data_x00151;
  OpLayoutLong1Const1_Large *pOVar43;
  OpLayoutInt64x2_2Int1_Large *data_x00152;
  OpLayoutDouble1Float64x2_1Int1_Medium *data_x00153;
  OpLayoutFloat32x4_1Int16x8_1_Medium *pOVar44;
  OpLayoutInt1Uint16x8_1Int1_Large *data_x00154;
  OpLayoutInt32x4_2Int2_Large *data_x00155;
  OpLayoutBool16x8_3_Large *data_x00156;
  OpLayoutLong1Int64x2_1Int1_Large *data_x00157;
  OpLayoutBool16x8_1Uint16x8_2_Medium *data_x00158;
  OpLayoutInt1Int8x16_1Int1_Large *data_x00159;
  OpLayoutBool8x16_2_Large *pOVar45;
  OpLayoutInt1Uint8x16_1Int1_Large *data_x00160;
  OpLayoutDouble1Float64x2_1Int1_Large *data_x00161;
  OpLayoutBool8x16_1Int1_Large *pOVar46;
  OpLayoutBool8x16_2_Medium *pOVar47;
  OpLayoutUint32x4_2Int4_Medium *data_x00162;
  OpLayoutAsmReg5_Large *data_x00163;
  OpLayoutBool32x4_1Int4_Large *data_x00164;
  OpLayoutUint32x4_2Int4_Small *data_x00165;
  OpLayoutInt1Bool8x16_1_Large *pOVar48;
  OpLayoutInt1Bool16x8_1Int1_Large *data_x00166;
  OpLayoutBool8x16_3_Large *data_x00167;
  OpLayoutUint8x16_1Int16_Small *data_x00168;
  OpLayoutInt1Bool8x16_1Int1_Medium *data_x00169;
  OpLayoutInt1Uint16x8_1Int1_Small *data_x00170;
  OpLayoutBool8x16_1Int16_Small *data_x00171;
  OpLayoutAsmSimdTypedArr_Large *data_x00172;
  OpLayoutAsmShuffle_Large *data_x00173;
  OpLayoutInt16x8_2Int1_Medium *data_x00174;
  OpLayoutInt8x16_1Float32x4_1_Large *pOVar49;
  OpLayoutInt8x16_2Int16_Large *data_x00175;
  OpLayoutInt1Uint32x4_1Int1_Large *data_x00176;
  OpLayoutUint16x8_1Int8_Large *data_x00177;
  OpLayoutBool8x16_2Int2_Large *data_x00178;
  OpLayoutInt1Bool8x16_1Int1_Large *data_x00179;
  OpLayoutInt1Bool32x4_1_Large *pOVar50;
  OpLayoutInt1Bool16x8_1_Large *pOVar51;
  OpLayoutBool8x16_1Int16_Large *data_x00180;
  OpLayoutAsmReg19_Medium *data_x00181;
  OpLayoutFloat32x4_1Int32x4_1_Large *pOVar52;
  OpLayoutUint8x16_2Int1_Large *data_x00182;
  OpLayoutInt8x16_1Float32x4_1_Medium *pOVar53;
  OpLayoutElementSlot_Large *data_x00183;
  OpLayoutFloat32x4_1Uint32x4_1_Medium *pOVar54;
  OpLayoutBool8x16_2Int2_Medium *data_x00184;
  OpLayoutAsmReg7_Large *data_x00185;
  OpLayoutInt1Int32x4_1Int1_Small *data_x00186;
  OpLayoutInt1Long2_Large *data_x00187;
  OpLayoutBool32x4_1Int32x4_2_Large *data_x00188;
  OpLayoutFloat64x2_2Int1Double1_Large *data_x00189;
  OpLayoutFloat32x4_IntConst4_Large *data_x00190;
  OpLayoutBool32x4_2Int2_Large *data_x00191;
  OpLayoutInt16x8_1Int8_Large *data_x00192;
  OpLayoutInt64x2_3_Large *data_x00193;
  OpLayoutInt1Int16x8_1Int1_Large *data_x00194;
  OpLayoutInt1Int16x8_1Int1_Medium *data_x00195;
  OpLayoutInt64x2_2Int1_Medium *data_x00196;
  OpLayoutLong1Int64x2_1Int1_Medium *data_x00197;
  OpLayoutUint8x16_2Int16_Large *data_x00198;
  OpLayoutBool32x4_3_Large *data_x00199;
  OpLayoutUint16x8_2Int8_Large *data_x00200;
  OpLayoutFloat32x4_1Uint8x16_1_Large *pOVar55;
  OpLayoutInt1Bool32x4_1Int1_Large *data_x00201;
  OpLayoutFloat32x4_1Int8x16_1_Large *pOVar56;
  OpLayoutFloat32x4_1Int16x8_1_Large *pOVar57;
  OpLayoutInt1Bool64x2_1_Large *pOVar58;
  OpLayoutFloat64x2_3_Medium *data_x00202;
  OpLayoutUint8x16_3Int16_Large *data_x00203;
  OpLayoutDouble3_Medium *data_x00204;
  OpLayoutInt1Int8x16_1Int1_Small *data_x00205;
  OpLayoutInt16x8_3Int8_Medium *data_x00206;
  OpLayoutFloat32x4_1Uint16x8_1_Large *pOVar59;
  OpLayoutUint8x16_2Int2_Medium *data_x00207;
  OpLayoutUint16x8_2Int2_Large *data_x00208;
  OpLayoutAsmCall_Small *data_x00209;
  OpLayoutInt32x4_4_Large *data_x00210;
  OpLayoutInt16x8_2Int8_Large *data_x00211;
  OpLayoutUint32x4_2Int2_Large *data_x00212;
  OpLayoutLong3_Large *data_x00213;
  OpLayoutFloat64x2_3_Large *data_x00214;
  OpLayoutBool16x8_1Uint16x8_2_Large *data_x00215;
  OpLayoutFloat32x4_1Int32x4_1_Small *pOVar60;
  OpLayoutFloat32x4_2Int1Float1_Medium *data_x00216;
  OpLayoutInt32x4_1Int4_Large *data_x00217;
  OpLayoutUint32x4_3Int4_Small *data_x00218;
  OpLayoutUint32x4_3Int4_Large *data_x00219;
  OpLayoutInt16x8_2Int1_Large *data_x00220;
  OpLayoutUint16x8_1Bool16x8_1Uint16x8_2_Large *data_x00221;
  OpLayoutFloat32x4_1Uint8x16_1_Small *pOVar61;
  OpLayoutInt1Uint32x4_1Int1_Small *data_x00222;
  OpLayoutFloat64x2_2Int1Double1_Medium *data_x00223;
  OpLayoutUint32x4_2Int1_Large *data_x00224;
  OpLayoutInt32x4_3Int4_Medium *data_x00225;
  OpLayoutUint8x16_3_Small *data_x00226;
  OpLayoutInt8x16_1Int16_Large *data_x00227;
  OpLayoutUint8x16_1Int16_Medium *data_x00228;
  OpLayoutBool16x8_1Int8_Small *data_x00229;
  OpLayoutInt1Double2_Small *data_x00230;
  OpLayoutWasmLoopStart_Small *pOVar62;
  OpLayoutUint16x8_2Int8_Medium *data_x00231;
  OpLayoutBool8x16_1Int8x16_2_Large *data_x00232;
  OpLayoutInt32x4_2Int4_Large *data_x00233;
  OpLayoutInt1Const1_Large *pOVar63;
  OpLayoutInt32x4_3_Large *data_x00234;
  OpLayoutUint32x4_2Int2_Small *data_x00235;
  OpLayoutInt32x4_3Int4_Small *data_x00236;
  OpLayoutInt1Long2_Medium *data_x00237;
  OpLayoutFloat32x4_1Bool32x4_1Float32x4_2_Large *data_x00238;
  OpLayoutUint32x4_3Int4_Medium *data_x00239;
  OpLayoutInt1Bool16x8_1Int1_Small *data_x00240;
  OpLayoutInt64x2_3_Medium *data_x00241;
  OpLayoutFloat32x4_3Int4_Medium *data_x00242;
  OpLayoutUint16x8_2Int8_Small *data_x00243;
  OpLayoutBrInt2_Large *data_x00244;
  OpLayoutInt8x16_3_Medium *data_x00245;
  OpLayoutDouble1Reg1_Large *pOVar64;
  OpLayoutBool16x8_1Int8_Medium *data_x00246;
  OpLayoutFloat3_Large *data_x00247;
  OpLayoutInt1Float2_Large *data_x00248;
  OpLayoutBool8x16_1Int16_Medium *data_x00249;
  OpLayoutFloat1Const1_Large *pOVar65;
  OpLayoutAsmReg9_Large *data_x00250;
  OpLayoutInt32x4_3Int4_Large *data_x00251;
  OpLayoutInt8x16_2Int16_Medium *data_x00252;
  OpLayoutFloat32x4_4_Large *data_x00253;
  OpLayoutInt1Float2_Small *data_x00254;
  OpLayoutDouble1Float1_Large *pOVar66;
  OpLayoutInt8x16_2Int1_Medium *data_x00255;
  OpLayoutUint32x4_1Int4_Small *data_x00256;
  OpLayoutFloat32x4_IntConst4_Small *data_x00257;
  OpLayoutAsmReg19_Large *data_x00258;
  OpLayoutBool32x4_3_Medium *data_x00259;
  OpLayoutBool32x4_1Float32x4_2_Large *data_x00260;
  OpLayoutBool32x4_2Int2_Medium *data_x00261;
  OpLayoutInt64x2_3_Small *data_x00262;
  OpLayoutFloat32x4_3_Large *data_x00263;
  OpLayoutInt16x8_1Bool16x8_1Int16x8_2_Medium *data_x00264;
  OpLayoutInt1Bool16x8_1_Small *pOVar67;
  OpLayoutAsmShuffle_Medium *data_x00265;
  OpLayoutUint16x8_1Bool16x8_1Uint16x8_2_Medium *data_x00266;
  OpLayoutInt1Bool16x8_1Int1_Medium *data_x00267;
  OpLayoutAsmReg3_Large *data_x00268;
  OpLayoutAsmReg18_Medium *data_x00269;
  OpLayoutAsmReg4_Large *data_x00270;
  OpLayoutInt1Bool32x4_1_Medium *pOVar68;
  OpLayoutInt1Bool64x2_1_Medium *pOVar69;
  OpLayoutUint32x4_1Bool32x4_1Uint32x4_2_Medium *data_x00271;
  OpLayoutAsmReg17_Medium *data_x00272;
  OpLayoutInt1Uint16x8_1Int1_Medium *data_x00273;
  OpLayoutBool8x16_3_Medium *data_x00274;
  OpLayoutElementSlot_Medium *data_x00275;
  OpLayoutDouble1Long1_Medium *pOVar70;
  OpLayoutInt1Bool16x8_1_Medium *pOVar71;
  OpLayoutBool8x16_1Int8x16_2_Medium *data_x00276;
  OpLayoutBrInt2_Medium *data_x00277;
  OpLayoutBool8x16_1Int8x16_2_Small *data_x00278;
  OpLayoutBrInt1_Small *pOVar72;
  OpLayoutBool32x4_2Int2_Small *data_x00279;
  OpLayoutInt1Double2_Medium *data_x00280;
  OpLayoutInt1Bool32x4_1Int1_Small *data_x00281;
  OpLayoutBool16x8_1Int16x8_2_Small *data_x00282;
  OpLayoutInt1Bool32x4_1_Small *pOVar73;
  OpLayoutInt32x4_2Int2_Small *data_x00283;
  OpLayoutUint8x16_3_Medium *data_x00284;
  OpLayoutUint16x8_3Int8_Medium *data_x00285;
  OpLayoutBrInt1Const1_Medium *data_x00286;
  OpLayoutInt1Float2_Medium *data_x00287;
  OpLayoutUint8x16_1Bool8x16_1Uint8x16_2_Medium *data_x00288;
  OpLayoutUint16x8_3_Medium *data_x00289;
  OpLayoutProfiledAsmCall_Medium *data_x00290;
  OpLayoutAsmReg6_Medium *data_x00291;
  OpLayoutUint32x4_1Int4_Medium *data_x00292;
  OpLayoutInt8x16_1Bool8x16_1Int8x16_2_Medium *data_x00293;
  OpLayoutUint16x8_1Int8_Medium *data_x00294;
  OpLayoutAsmReg10_Medium *data_x00295;
  OpLayoutBool32x4_1Float32x4_2_Medium *data_x00296;
  OpLayoutInt8x16_3Int16_Medium *data_x00297;
  OpLayoutFloat1Float32x4_1Int1_Small *data_x00298;
  OpLayoutFloat32x4_2Float1_Medium *data_x00299;
  OpLayoutUint16x8_3_Small *data_x00300;
  OpLayoutInt1Int32x4_1Int1_Medium *data_x00301;
  OpLayoutAsmReg5_Small *data_x00302;
  OpLayoutInt64x2_2Int1_Small *data_x00303;
  OpLayoutFloat32x4_2Int4_Medium *data_x00304;
  OpLayoutBrInt2_Small *data_x00305;
  OpLayoutInt32x4_1Bool32x4_1Int32x4_2_Small *data_x00306;
  OpLayoutInt1Uint8x16_1Int1_Small *data_x00307;
  OpLayoutUint8x16_2Int1_Small *data_x00308;
  OpLayoutInt32x4_2Int4_Medium *data_x00309;
  OpLayoutFloat32x4_1Int16x8_1_Small *pOVar74;
  OpLayoutBool8x16_2_Small *pOVar75;
  OpLayoutInt1Long2_Small *data_x00310;
  OpLayoutInt8x16_2Int1_Small *data_x00311;
  OpLayoutAsmShuffle_Small *data_x00312;
  OpLayoutAsmReg2_Small *pOVar76;
  OpLayoutUint8x16_2Int2_Small *data_x00313;
  OpLayoutInt32x4_2Int2_Medium *data_x00314;
  OpLayoutUint8x16_1Bool8x16_1Uint8x16_2_Small *data_x00315;
  OpLayoutFloat3_Medium *data_x00316;
  OpLayoutAsmCall_Medium *data_x00317;
  OpLayoutFloat3_Small *data_x00318;
  OpLayoutAsmReg7_Medium *data_x00319;
  OpLayoutUint16x8_1Bool16x8_1Uint16x8_2_Small *data_x00320;
  OpLayoutFloat32x4_4_Small *data_x00321;
  OpLayoutInt1Bool8x16_1_Small *pOVar77;
  OpLayoutInt16x8_3_Small *data_x00322;
  OpLayoutAsmReg17_Small *data_x00323;
  OpLayoutAsmReg4_Small *data_x00324;
  OpLayoutDouble1Float1_Small *pOVar78;
  OpLayoutUint32x4_3_Small *data_x00325;
  OpLayoutDouble1Long1_Small *pOVar79;
  OpLayoutBool32x4_1Float32x4_2_Small *data_x00326;
  OpLayoutFloat32x4_1Uint16x8_1_Small *pOVar80;
  OpLayoutUint8x16_3Int16_Small *data_x00327;
  OpLayoutInt1Int16x8_1Int1_Small *data_x00328;
  OpLayoutFloat64x2_3_Small *data_x00329;
  OpLayoutInt8x16_1Bool8x16_1Int8x16_2_Small *data_x00330;
  OpLayoutProfiledAsmCall_Small *data_x00331;
  OpLayoutUint16x8_3Int8_Small *data_x00332;
  OpLayoutAsmReg6_Small *data_x00333;
  OpLayoutInt64x2_2_Int1_Long1_Small *data_x00334;
  OpLayoutAsmReg10_Small *data_x00335;
  uint uVar81;
  char *reader_00;
  FunctionBody *dumpFunction_00;
  ulong uVar82;
  RegSlotType registerID;
  RegSlotType registerID_00;
  UnsignedType value;
  RegSlotType registerID_01;
  int value_00;
  int64 value_01;
  char16_t *pcVar83;
  float value_02;
  double value_03;
  
  pcVar4 = OpCodeUtilAsmJs::GetOpCodeName(op);
  Output::Print(L"%-20s",pcVar4);
  OVar3 = OpCodeUtilAsmJs::GetOpCodeLayout(op);
  uVar81 = layoutSize * 0xe5 + OVar3._value;
  if (0x2ae < uVar81) {
switchD_007cf5c4_caseD_e6:
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar38 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar38 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/AsmJsByteCodeDumper.cpp"
                                ,0x11d,"(false)","Unknown OpLayout");
    if (bVar2) {
      *puVar38 = 0;
      return;
    }
LAB_007d48fb:
    pcVar1 = (code *)invalidInstructionException();
    (*pcVar1)();
  }
  reader_00 = (char *)((long)&switchD_007cf5c4::switchdataD_010b2dcc +
                      (long)(int)(&switchD_007cf5c4::switchdataD_010b2dcc)[uVar81]);
  switch(uVar81) {
  case 0:
    data = ByteCodeReader::ElementSlot_Small(reader);
    DumpElementSlot<Js::OpLayoutT_ElementSlot<Js::LayoutSizePolicy<(Js::LayoutSize)0>>__unaligned>
              (op,data,dumpFunction,reader);
    return;
  case 1:
    if (layoutSize == SmallLayout) {
LAB_007cff3b:
      data_40 = ByteCodeReader::StartCall(reader);
      DumpStartCall(op,data_40,dumpFunction_00,(ByteCodeReader *)reader_00);
      return;
    }
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar38 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar38 = 1;
    reader_00 = "layoutSize == SmallLayout";
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./ByteCode/LayoutTypesAsmJs.h"
                                ,0x82,"(layoutSize == SmallLayout)","layoutSize == SmallLayout");
    if (bVar2) {
      *puVar38 = 0;
      goto LAB_007cff3b;
    }
    goto LAB_007d48fb;
  case 2:
    if (layoutSize != SmallLayout) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar38 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar38 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./ByteCode/LayoutTypesAsmJs.h"
                                  ,0x83,"(layoutSize == SmallLayout)","layoutSize == SmallLayout");
      if (!bVar2) goto LAB_007d48fb;
      *puVar38 = 0;
    }
    ByteCodeReader::Empty(reader);
    return;
  case 3:
    data_76 = ByteCodeReader::AsmTypedArr_Small(reader);
    DumpAsmTypedArr<Js::OpLayoutT_AsmTypedArr<Js::LayoutSizePolicy<(Js::LayoutSize)0>>__unaligned>
              (op,data_76,dumpFunction,reader);
    return;
  case 4:
    data_01 = ByteCodeReader::WasmMemAccess_Small(reader);
    DumpWasmMemAccess<Js::OpLayoutT_WasmMemAccess<Js::LayoutSizePolicy<(Js::LayoutSize)0>>__unaligned>
              (op,data_01,dumpFunction,reader);
    return;
  case 5:
    data_x00209 = ByteCodeReader::AsmCall_Small(reader);
    DumpAsmCall<Js::OpLayoutT_AsmCall<Js::LayoutSizePolicy<(Js::LayoutSize)0>>__unaligned>
              (op,data_x00209,dumpFunction,reader);
    return;
  case 6:
    data_x00331 = ByteCodeReader::ProfiledAsmCall_Small(reader);
    DumpProfiledAsmCall<Js::OpLayoutDynamicProfile<Js::OpLayoutT_AsmCall<Js::LayoutSizePolicy<(Js::LayoutSize)0>>>__unaligned>
              (op,data_x00331,dumpFunction,reader);
    return;
  case 7:
    if (layoutSize != SmallLayout) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar38 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar38 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./ByteCode/LayoutTypesAsmJs.h"
                                  ,0x88,"(layoutSize == SmallLayout)","layoutSize == SmallLayout");
      if (!bVar2) goto LAB_007d48fb;
      *puVar38 = 0;
    }
    pOVar6 = ByteCodeReader::AsmBr(reader);
    ByteCodeDumper::DumpOffset(pOVar6->RelativeJumpOffset,reader);
    return;
  case 8:
    pOVar28 = ByteCodeReader::AsmReg1_Small(reader);
    registerID = pOVar28->R0;
    goto LAB_007d421d;
  case 9:
    pOVar76 = ByteCodeReader::AsmReg2_Small(reader);
    ByteCodeDumper::DumpReg(pOVar76->R0);
    registerID = pOVar76->R1;
LAB_007d421d:
    ByteCodeDumper::DumpReg(registerID);
    return;
  case 10:
    data_19 = ByteCodeReader::AsmReg3_Small(reader);
    DumpAsmReg3<Js::OpLayoutT_AsmReg3<Js::LayoutSizePolicy<(Js::LayoutSize)0>>__unaligned>
              (op,data_19,dumpFunction,reader);
    return;
  case 0xb:
    data_x00324 = ByteCodeReader::AsmReg4_Small(reader);
    DumpAsmReg4<Js::OpLayoutT_AsmReg4<Js::LayoutSizePolicy<(Js::LayoutSize)0>>__unaligned>
              (op,data_x00324,dumpFunction,reader);
    return;
  case 0xc:
    data_x00302 = ByteCodeReader::AsmReg5_Small(reader);
    DumpAsmReg5<Js::OpLayoutT_AsmReg5<Js::LayoutSizePolicy<(Js::LayoutSize)0>>__unaligned>
              (op,data_x00302,dumpFunction,reader);
    return;
  case 0xd:
    data_x00333 = ByteCodeReader::AsmReg6_Small(reader);
    DumpAsmReg6<Js::OpLayoutT_AsmReg6<Js::LayoutSizePolicy<(Js::LayoutSize)0>>__unaligned>
              (op,data_x00333,dumpFunction,reader);
    return;
  case 0xe:
    data_x00118 = ByteCodeReader::AsmReg7_Small(reader);
    DumpAsmReg7<Js::OpLayoutT_AsmReg7<Js::LayoutSizePolicy<(Js::LayoutSize)0>>__unaligned>
              (op,data_x00118,dumpFunction,reader);
    return;
  case 0xf:
    data_x00129 = ByteCodeReader::AsmReg9_Small(reader);
    DumpAsmReg9<Js::OpLayoutT_AsmReg9<Js::LayoutSizePolicy<(Js::LayoutSize)0>>__unaligned>
              (op,data_x00129,dumpFunction,reader);
    return;
  case 0x10:
    data_x00335 = ByteCodeReader::AsmReg10_Small(reader);
    DumpAsmReg10<Js::OpLayoutT_AsmReg10<Js::LayoutSizePolicy<(Js::LayoutSize)0>>__unaligned>
              (op,data_x00335,dumpFunction,reader);
    return;
  case 0x11:
    data_05 = ByteCodeReader::AsmReg11_Small(reader);
    DumpAsmReg11<Js::OpLayoutT_AsmReg11<Js::LayoutSizePolicy<(Js::LayoutSize)0>>__unaligned>
              (op,data_05,dumpFunction,reader);
    return;
  case 0x12:
    data_x00323 = ByteCodeReader::AsmReg17_Small(reader);
    DumpAsmReg17<Js::OpLayoutT_AsmReg17<Js::LayoutSizePolicy<(Js::LayoutSize)0>>__unaligned>
              (op,data_x00323,dumpFunction,reader);
    return;
  case 0x13:
    data_29 = ByteCodeReader::AsmReg18_Small(reader);
    DumpAsmReg18<Js::OpLayoutT_AsmReg18<Js::LayoutSizePolicy<(Js::LayoutSize)0>>__unaligned>
              (op,data_29,dumpFunction,reader);
    return;
  case 0x14:
    data_x00107 = ByteCodeReader::AsmReg19_Small(reader);
    DumpAsmReg19<Js::OpLayoutT_AsmReg19<Js::LayoutSizePolicy<(Js::LayoutSize)0>>__unaligned>
              (op,data_x00107,dumpFunction,reader);
    return;
  case 0x15:
    pOVar9 = (OpLayoutFloat64x2_1Double1_Small *)ByteCodeReader::Int1Double1_Small(reader);
    uVar82 = (ulong)pOVar9->D2_0;
    pcVar83 = L" I%d ";
    goto LAB_007d1aa9;
  case 0x16:
    pOVar78 = (OpLayoutDouble1Float1_Small *)ByteCodeReader::Int1Float1_Small(reader);
    uVar82 = (ulong)pOVar78->D0;
    pcVar83 = L" I%d ";
    goto LAB_007d45a9;
  case 0x17:
    pOVar25 = ByteCodeReader::Double1Const1_Small(reader);
    Output::Print(L" D%d ",(ulong)pOVar25->D0);
    value_03 = pOVar25->C1;
    goto LAB_007d1524;
  case 0x18:
    pOVar30 = (OpLayoutBool8x16_1Int1_Small *)ByteCodeReader::Double1Int1_Small(reader);
    uVar82 = (ulong)pOVar30->B16_0;
    pcVar83 = L" D%d ";
    goto LAB_007d440a;
  case 0x19:
    pOVar78 = ByteCodeReader::Double1Float1_Small(reader);
    uVar82 = (ulong)pOVar78->D0;
    pcVar83 = L" D%d ";
    goto LAB_007d45a9;
  case 0x1a:
    pOVar5 = ByteCodeReader::Double1Reg1_Small(reader);
    uVar82 = (ulong)pOVar5->D0;
    pcVar83 = L" D%d ";
    goto LAB_007d48c1;
  case 0x1b:
    pOVar5 = (OpLayoutDouble1Reg1_Small *)ByteCodeReader::Float1Reg1_Small(reader);
    uVar82 = (ulong)pOVar5->D0;
    pcVar83 = L" F%d ";
    goto LAB_007d48c1;
  case 0x1c:
    pOVar5 = (OpLayoutDouble1Reg1_Small *)ByteCodeReader::Int1Reg1_Small(reader);
    uVar82 = (ulong)pOVar5->D0;
    pcVar83 = L" I%d ";
    goto LAB_007d48c1;
  case 0x1d:
    pOVar9 = (OpLayoutFloat64x2_1Double1_Small *)ByteCodeReader::Reg1Double1_Small(reader);
    ByteCodeDumper::DumpReg((uint)pOVar9->D2_0);
    goto LAB_007d1ab0;
  case 0x1e:
    pOVar78 = (OpLayoutDouble1Float1_Small *)ByteCodeReader::Reg1Float1_Small(reader);
    ByteCodeDumper::DumpReg((uint)pOVar78->D0);
    goto LAB_007d45b0;
  case 0x1f:
    pOVar30 = (OpLayoutBool8x16_1Int1_Small *)ByteCodeReader::Reg1Int1_Small(reader);
    ByteCodeDumper::DumpReg((uint)pOVar30->B16_0);
    goto LAB_007d4411;
  case 0x20:
    pOVar18 = ByteCodeReader::Int1Const1_Small(reader);
    Output::Print(L" I%d ",(ulong)pOVar18->I0);
    goto LAB_007d4746;
  case 0x21:
    pOVar18 = (OpLayoutInt1Const1_Small *)ByteCodeReader::Reg1IntConst1_Small(reader);
    ByteCodeDumper::DumpReg((uint)pOVar18->I0);
LAB_007d4746:
    value_00 = pOVar18->C1;
LAB_007d4749:
    ByteCodeDumper::DumpI4(value_00);
    return;
  case 0x22:
    data_x00230 = ByteCodeReader::Int1Double2_Small(reader);
    DumpInt1Double2<Js::OpLayoutT_Int1Double2<Js::LayoutSizePolicy<(Js::LayoutSize)0>>__unaligned>
              (op,data_x00230,dumpFunction,reader);
    return;
  case 0x23:
    data_x00254 = ByteCodeReader::Int1Float2_Small(reader);
    DumpInt1Float2<Js::OpLayoutT_Int1Float2<Js::LayoutSizePolicy<(Js::LayoutSize)0>>__unaligned>
              (op,data_x00254,dumpFunction,reader);
    return;
  case 0x24:
    pOVar75 = (OpLayoutBool8x16_2_Small *)ByteCodeReader::Int2_Small(reader);
    uVar82 = (ulong)pOVar75->B16_0;
    pcVar83 = L" I%d ";
    break;
  case 0x25:
    data_x00124 = ByteCodeReader::Int3_Small(reader);
    DumpInt3<Js::OpLayoutT_Int3<Js::LayoutSizePolicy<(Js::LayoutSize)0>>__unaligned>
              (op,data_x00124,dumpFunction,reader);
    return;
  case 0x26:
    pOVar75 = (OpLayoutBool8x16_2_Small *)ByteCodeReader::Double2_Small(reader);
    uVar82 = (ulong)pOVar75->B16_0;
    pcVar83 = L" D%d ";
    break;
  case 0x27:
    pOVar75 = (OpLayoutBool8x16_2_Small *)ByteCodeReader::Float2_Small(reader);
    uVar82 = (ulong)pOVar75->B16_0;
    pcVar83 = L" F%d ";
    break;
  case 0x28:
    data_x00318 = ByteCodeReader::Float3_Small(reader);
    DumpFloat3<Js::OpLayoutT_Float3<Js::LayoutSizePolicy<(Js::LayoutSize)0>>__unaligned>
              (op,data_x00318,dumpFunction,reader);
    return;
  case 0x29:
    pOVar16 = ByteCodeReader::Float1Const1_Small(reader);
    Output::Print(L" F%d ",(ulong)pOVar16->F0);
    value_02 = pOVar16->C1;
    goto LAB_007d3459;
  case 0x2a:
    pOVar9 = (OpLayoutFloat64x2_1Double1_Small *)ByteCodeReader::Float1Double1_Small(reader);
    uVar82 = (ulong)pOVar9->D2_0;
    pcVar83 = L" F%d ";
    goto LAB_007d1aa9;
  case 0x2b:
    pOVar30 = (OpLayoutBool8x16_1Int1_Small *)ByteCodeReader::Float1Int1_Small(reader);
    uVar82 = (ulong)pOVar30->B16_0;
    pcVar83 = L" F%d ";
    goto LAB_007d440a;
  case 0x2c:
    data_46 = ByteCodeReader::Double3_Small(reader);
    DumpDouble3<Js::OpLayoutT_Double3<Js::LayoutSizePolicy<(Js::LayoutSize)0>>__unaligned>
              (op,data_46,dumpFunction,reader);
    return;
  case 0x2d:
    pOVar72 = ByteCodeReader::BrInt1_Small(reader);
    ByteCodeDumper::DumpOffset(pOVar72->RelativeJumpOffset,reader);
    uVar82 = (ulong)pOVar72->I1;
    goto LAB_007d4415;
  case 0x2e:
    data_x00305 = ByteCodeReader::BrInt2_Small(reader);
    DumpBrInt2<Js::OpLayoutT_BrInt2<Js::LayoutSizePolicy<(Js::LayoutSize)0>>__unaligned>
              (op,data_x00305,dumpFunction,reader);
    return;
  case 0x2f:
    data_x00149 = ByteCodeReader::BrInt1Const1_Small(reader);
    DumpBrInt1Const1<Js::OpLayoutT_BrInt1Const1<Js::LayoutSizePolicy<(Js::LayoutSize)0>>__unaligned>
              (op,data_x00149,dumpFunction,reader);
    return;
  case 0x30:
    pOVar62 = (OpLayoutWasmLoopStart_Small *)ByteCodeReader::AsmUnsigned1_Small(reader);
    goto LAB_007d2f07;
  case 0x31:
    pOVar62 = ByteCodeReader::WasmLoopStart_Small(reader);
LAB_007d2f07:
    value = (UnsignedType)pOVar62->loopId;
LAB_007d2f0a:
    ByteCodeDumper::DumpU4(value);
    return;
  case 0x32:
    pOVar5 = (OpLayoutDouble1Reg1_Small *)ByteCodeReader::Long1Reg1_Small(reader);
    uVar82 = (ulong)pOVar5->D0;
    pcVar83 = L" L%d ";
LAB_007d48c1:
    Output::Print(pcVar83,uVar82);
    registerID_01 = (RegSlotType)pOVar5->R1;
LAB_007d48cc:
    ByteCodeDumper::DumpReg(registerID_01);
    return;
  case 0x33:
    pOVar79 = (OpLayoutDouble1Long1_Small *)ByteCodeReader::Reg1Long1_Small(reader);
    ByteCodeDumper::DumpReg((uint)pOVar79->D0);
    goto LAB_007d462a;
  case 0x34:
    pOVar7 = ByteCodeReader::Long1Const1_Small(reader);
    Output::Print(L" L%d ",(ulong)pOVar7->L0);
    value_01 = pOVar7->C1;
    goto LAB_007d1b88;
  case 0x35:
    pOVar75 = (OpLayoutBool8x16_2_Small *)ByteCodeReader::Long2_Small(reader);
    uVar82 = (ulong)pOVar75->B16_0;
    pcVar83 = L" L%d ";
    break;
  case 0x36:
    data_22 = ByteCodeReader::Long3_Small(reader);
    DumpLong3<Js::OpLayoutT_Long3<Js::LayoutSizePolicy<(Js::LayoutSize)0>>__unaligned>
              (op,data_22,dumpFunction,reader);
    return;
  case 0x37:
    data_x00310 = ByteCodeReader::Int1Long2_Small(reader);
    DumpInt1Long2<Js::OpLayoutT_Int1Long2<Js::LayoutSizePolicy<(Js::LayoutSize)0>>__unaligned>
              (op,data_x00310,dumpFunction,reader);
    return;
  case 0x38:
    pOVar30 = (OpLayoutBool8x16_1Int1_Small *)ByteCodeReader::Long1Int1_Small(reader);
    uVar82 = (ulong)pOVar30->B16_0;
    pcVar83 = L" L%d ";
    goto LAB_007d440a;
  case 0x39:
    pOVar79 = (OpLayoutDouble1Long1_Small *)ByteCodeReader::Int1Long1_Small(reader);
    uVar82 = (ulong)pOVar79->D0;
    pcVar83 = L" I%d ";
    goto LAB_007d4623;
  case 0x3a:
    pOVar78 = (OpLayoutDouble1Float1_Small *)ByteCodeReader::Long1Float1_Small(reader);
    uVar82 = (ulong)pOVar78->D0;
    pcVar83 = L" L%d ";
    goto LAB_007d45a9;
  case 0x3b:
    pOVar79 = (OpLayoutDouble1Long1_Small *)ByteCodeReader::Float1Long1_Small(reader);
    uVar82 = (ulong)pOVar79->D0;
    pcVar83 = L" F%d ";
    goto LAB_007d4623;
  case 0x3c:
    pOVar9 = (OpLayoutFloat64x2_1Double1_Small *)ByteCodeReader::Long1Double1_Small(reader);
    uVar82 = (ulong)pOVar9->D2_0;
    pcVar83 = L" L%d ";
    goto LAB_007d1aa9;
  case 0x3d:
    pOVar79 = ByteCodeReader::Double1Long1_Small(reader);
    uVar82 = (ulong)pOVar79->D0;
    pcVar83 = L" D%d ";
    goto LAB_007d4623;
  case 0x3e:
    pOVar75 = (OpLayoutBool8x16_2_Small *)ByteCodeReader::Float32x4_2_Small(reader);
    uVar82 = (ulong)pOVar75->B16_0;
    pcVar83 = L" F4_%d ";
    break;
  case 0x3f:
    data_00 = ByteCodeReader::Float32x4_3_Small(reader);
    DumpFloat32x4_3<Js::OpLayoutT_Float32x4_3<Js::LayoutSizePolicy<(Js::LayoutSize)0>>__unaligned>
              (op,data_00,dumpFunction,reader);
    return;
  case 0x40:
    data_x00321 = ByteCodeReader::Float32x4_4_Small(reader);
    DumpFloat32x4_4<Js::OpLayoutT_Float32x4_4<Js::LayoutSizePolicy<(Js::LayoutSize)0>>__unaligned>
              (op,data_x00321,dumpFunction,reader);
    return;
  case 0x41:
    data_x00326 = ByteCodeReader::Bool32x4_1Float32x4_2_Small(reader);
    DumpBool32x4_1Float32x4_2<Js::OpLayoutT_Bool32x4_1Float32x4_2<Js::LayoutSizePolicy<(Js::LayoutSize)0>>__unaligned>
              (op,data_x00326,dumpFunction,reader);
    return;
  case 0x42:
    data_33 = ByteCodeReader::Float32x4_1Bool32x4_1Float32x4_2_Small(reader);
    DumpFloat32x4_1Bool32x4_1Float32x4_2<Js::OpLayoutT_Float32x4_1Bool32x4_1Float32x4_2<Js::LayoutSizePolicy<(Js::LayoutSize)0>>__unaligned>
              (op,data_33,dumpFunction,reader);
    return;
  case 0x43:
    data_03 = ByteCodeReader::Float32x4_1Float4_Small(reader);
    DumpFloat32x4_1Float4<Js::OpLayoutT_Float32x4_1Float4<Js::LayoutSizePolicy<(Js::LayoutSize)0>>__unaligned>
              (op,data_03,dumpFunction,reader);
    return;
  case 0x44:
    data_62 = ByteCodeReader::Float32x4_2Int4_Small(reader);
    DumpFloat32x4_2Int4<Js::OpLayoutT_Float32x4_2Int4<Js::LayoutSizePolicy<(Js::LayoutSize)0>>__unaligned>
              (op,data_62,dumpFunction,reader);
    return;
  case 0x45:
    data_39 = ByteCodeReader::Float32x4_3Int4_Small(reader);
    DumpFloat32x4_3Int4<Js::OpLayoutT_Float32x4_3Int4<Js::LayoutSizePolicy<(Js::LayoutSize)0>>__unaligned>
              (op,data_39,dumpFunction,reader);
    return;
  case 0x46:
    pOVar78 = (OpLayoutDouble1Float1_Small *)ByteCodeReader::Float32x4_1Float1_Small(reader);
    uVar82 = (ulong)pOVar78->D0;
    pcVar83 = L" F4_%d ";
LAB_007d45a9:
    Output::Print(pcVar83,uVar82);
LAB_007d45b0:
    uVar82 = (ulong)pOVar78->F1;
LAB_007d45b4:
    pcVar83 = L" F%d ";
    goto LAB_007d4859;
  case 0x47:
    data_32 = ByteCodeReader::Float32x4_2Float1_Small(reader);
    DumpFloat32x4_2Float1<Js::OpLayoutT_Float32x4_2Float1<Js::LayoutSizePolicy<(Js::LayoutSize)0>>__unaligned>
              (op,data_32,dumpFunction,reader);
    return;
  case 0x48:
    pOVar60 = ByteCodeReader::Float32x4_1Int32x4_1_Small(reader);
    uVar82 = (ulong)pOVar60->F4_0;
    pcVar83 = L" F4_%d ";
    goto LAB_007d3c6e;
  case 0x49:
    pOVar20 = ByteCodeReader::Float32x4_1Uint32x4_1_Small(reader);
    uVar82 = (ulong)pOVar20->F4_0;
    pcVar83 = L" F4_%d ";
    goto LAB_007d46ad;
  case 0x4a:
    pOVar74 = ByteCodeReader::Float32x4_1Int16x8_1_Small(reader);
    uVar82 = (ulong)pOVar74->F4_0;
    pcVar83 = L" F4_%d ";
    goto LAB_007d4436;
  case 0x4b:
    pOVar80 = ByteCodeReader::Float32x4_1Uint16x8_1_Small(reader);
    uVar82 = (ulong)pOVar80->F4_0;
    pcVar83 = L" F4_%d ";
    goto LAB_007d4713;
  case 0x4c:
    pOVar23 = ByteCodeReader::Float32x4_1Int8x16_1_Small(reader);
    uVar82 = (ulong)pOVar23->F4_0;
    pcVar83 = L" F4_%d ";
    goto LAB_007d45d5;
  case 0x4d:
    pOVar61 = ByteCodeReader::Float32x4_1Uint8x16_1_Small(reader);
    uVar82 = (ulong)pOVar61->F4_0;
    pcVar83 = L" F4_%d ";
    goto LAB_007d4847;
  case 0x4e:
    pOVar21 = (OpLayoutInt8x16_1Float32x4_1_Small *)ByteCodeReader::Reg1Float32x4_1_Small(reader);
    ByteCodeDumper::DumpReg((uint)pOVar21->I16_0);
    goto LAB_007d4794;
  case 0x4f:
    data_x00298 = ByteCodeReader::Float1Float32x4_1Int1_Small(reader);
    DumpFloat1Float32x4_1Int1<Js::OpLayoutT_Float1Float32x4_1Int1<Js::LayoutSizePolicy<(Js::LayoutSize)0>>__unaligned>
              (op,data_x00298,dumpFunction,reader);
    return;
  case 0x50:
    data_72 = ByteCodeReader::Float32x4_2Int1Float1_Small(reader);
    DumpFloat32x4_2Int1Float1<Js::OpLayoutT_Float32x4_2Int1Float1<Js::LayoutSizePolicy<(Js::LayoutSize)0>>__unaligned>
              (op,data_72,dumpFunction,reader);
    return;
  case 0x51:
    pOVar75 = (OpLayoutBool8x16_2_Small *)ByteCodeReader::Int32x4_2_Small(reader);
    uVar82 = (ulong)pOVar75->B16_0;
    pcVar83 = L" I4_%d ";
    break;
  case 0x52:
    data_02 = ByteCodeReader::Int32x4_3_Small(reader);
    DumpInt32x4_3<Js::OpLayoutT_Int32x4_3<Js::LayoutSizePolicy<(Js::LayoutSize)0>>__unaligned>
              (op,data_02,dumpFunction,reader);
    return;
  case 0x53:
    data_24 = ByteCodeReader::Int32x4_4_Small(reader);
    DumpInt32x4_4<Js::OpLayoutT_Int32x4_4<Js::LayoutSizePolicy<(Js::LayoutSize)0>>__unaligned>
              (op,data_24,dumpFunction,reader);
    return;
  case 0x54:
    data_80 = ByteCodeReader::Bool32x4_1Int32x4_2_Small(reader);
    DumpBool32x4_1Int32x4_2<Js::OpLayoutT_Bool32x4_1Int32x4_2<Js::LayoutSizePolicy<(Js::LayoutSize)0>>__unaligned>
              (op,data_80,dumpFunction,reader);
    return;
  case 0x55:
    data_x00306 = ByteCodeReader::Int32x4_1Bool32x4_1Int32x4_2_Small(reader);
    DumpInt32x4_1Bool32x4_1Int32x4_2<Js::OpLayoutT_Int32x4_1Bool32x4_1Int32x4_2<Js::LayoutSizePolicy<(Js::LayoutSize)0>>__unaligned>
              (op,data_x00306,dumpFunction,reader);
    return;
  case 0x56:
    data_54 = ByteCodeReader::Int32x4_1Int4_Small(reader);
    DumpInt32x4_1Int4<Js::OpLayoutT_Int32x4_1Int4<Js::LayoutSizePolicy<(Js::LayoutSize)0>>__unaligned>
              (op,data_54,dumpFunction,reader);
    return;
  case 0x57:
    data_31 = ByteCodeReader::Int32x4_2Int4_Small(reader);
    DumpInt32x4_2Int4<Js::OpLayoutT_Int32x4_2Int4<Js::LayoutSizePolicy<(Js::LayoutSize)0>>__unaligned>
              (op,data_31,dumpFunction,reader);
    return;
  case 0x58:
    data_x00236 = ByteCodeReader::Int32x4_3Int4_Small(reader);
    DumpInt32x4_3Int4<Js::OpLayoutT_Int32x4_3Int4<Js::LayoutSizePolicy<(Js::LayoutSize)0>>__unaligned>
              (op,data_x00236,dumpFunction,reader);
    return;
  case 0x59:
    pOVar30 = (OpLayoutBool8x16_1Int1_Small *)ByteCodeReader::Int32x4_1Int1_Small(reader);
    uVar82 = (ulong)pOVar30->B16_0;
    pcVar83 = L" I4_%d ";
    goto LAB_007d440a;
  case 0x5a:
    data_04 = ByteCodeReader::Int32x4_2Int1_Small(reader);
    DumpInt32x4_2Int1<Js::OpLayoutT_Int32x4_2Int1<Js::LayoutSizePolicy<(Js::LayoutSize)0>>__unaligned>
              (op,data_04,dumpFunction,reader);
    return;
  case 0x5b:
    pOVar60 = (OpLayoutFloat32x4_1Int32x4_1_Small *)ByteCodeReader::Reg1Int32x4_1_Small(reader);
    ByteCodeDumper::DumpReg((uint)pOVar60->F4_0);
    goto LAB_007d3c75;
  case 0x5c:
    pOVar21 = (OpLayoutInt8x16_1Float32x4_1_Small *)
              ByteCodeReader::Int32x4_1Float32x4_1_Small(reader);
    uVar82 = (ulong)pOVar21->I16_0;
    pcVar83 = L" I4_%d ";
    goto LAB_007d478d;
  case 0x5d:
    pOVar20 = (OpLayoutFloat32x4_1Uint32x4_1_Small *)
              ByteCodeReader::Int32x4_1Uint32x4_1_Small(reader);
    uVar82 = (ulong)pOVar20->F4_0;
    pcVar83 = L" I4_%d ";
    goto LAB_007d46ad;
  case 0x5e:
    pOVar74 = (OpLayoutFloat32x4_1Int16x8_1_Small *)ByteCodeReader::Int32x4_1Int16x8_1_Small(reader)
    ;
    uVar82 = (ulong)pOVar74->F4_0;
    pcVar83 = L" I4_%d ";
    goto LAB_007d4436;
  case 0x5f:
    pOVar80 = (OpLayoutFloat32x4_1Uint16x8_1_Small *)
              ByteCodeReader::Int32x4_1Uint16x8_1_Small(reader);
    uVar82 = (ulong)pOVar80->F4_0;
    pcVar83 = L" I4_%d ";
    goto LAB_007d4713;
  case 0x60:
    pOVar23 = (OpLayoutFloat32x4_1Int8x16_1_Small *)ByteCodeReader::Int32x4_1Int8x16_1_Small(reader)
    ;
    uVar82 = (ulong)pOVar23->F4_0;
    pcVar83 = L" I4_%d ";
    goto LAB_007d45d5;
  case 0x61:
    pOVar61 = (OpLayoutFloat32x4_1Uint8x16_1_Small *)
              ByteCodeReader::Int32x4_1Uint8x16_1_Small(reader);
    uVar82 = (ulong)pOVar61->F4_0;
    pcVar83 = L" I4_%d ";
    goto LAB_007d4847;
  case 0x62:
    data_x00186 = ByteCodeReader::Int1Int32x4_1Int1_Small(reader);
    DumpInt1Int32x4_1Int1<Js::OpLayoutT_Int1Int32x4_1Int1<Js::LayoutSizePolicy<(Js::LayoutSize)0>>__unaligned>
              (op,data_x00186,dumpFunction,reader);
    return;
  case 99:
    data_x00283 = ByteCodeReader::Int32x4_2Int2_Small(reader);
    DumpInt32x4_2Int2<Js::OpLayoutT_Int32x4_2Int2<Js::LayoutSizePolicy<(Js::LayoutSize)0>>__unaligned>
              (op,data_x00283,dumpFunction,reader);
    return;
  case 100:
    data_x00257 = ByteCodeReader::Float32x4_IntConst4_Small(reader);
    DumpFloat32x4_IntConst4<Js::OpLayoutT_Float32x4_IntConst4<Js::LayoutSizePolicy<(Js::LayoutSize)0>>__unaligned>
              (op,data_x00257,dumpFunction,reader);
    return;
  case 0x65:
    data_82 = ByteCodeReader::Double1Float64x2_1Int1_Small(reader);
    DumpDouble1Float64x2_1Int1<Js::OpLayoutT_Double1Float64x2_1Int1<Js::LayoutSizePolicy<(Js::LayoutSize)0>>__unaligned>
              (op,data_82,dumpFunction,reader);
    return;
  case 0x66:
    data_18 = ByteCodeReader::Float64x2_2Int1Double1_Small(reader);
    DumpFloat64x2_2Int1Double1<Js::OpLayoutT_Float64x2_2Int1Double1<Js::LayoutSizePolicy<(Js::LayoutSize)0>>__unaligned>
              (op,data_18,dumpFunction,reader);
    return;
  case 0x67:
    pOVar75 = (OpLayoutBool8x16_2_Small *)ByteCodeReader::Float64x2_2_Small(reader);
    uVar82 = (ulong)pOVar75->B16_0;
    pcVar83 = L" D2_%d ";
    break;
  case 0x68:
    data_x00329 = ByteCodeReader::Float64x2_3_Small(reader);
    DumpFloat64x2_3<Js::OpLayoutT_Float64x2_3<Js::LayoutSizePolicy<(Js::LayoutSize)0>>__unaligned>
              (op,data_x00329,dumpFunction,reader);
    return;
  case 0x69:
    pOVar9 = ByteCodeReader::Float64x2_1Double1_Small(reader);
    uVar82 = (ulong)pOVar9->D2_0;
    pcVar83 = L" D2_%d ";
LAB_007d1aa9:
    Output::Print(pcVar83,uVar82);
LAB_007d1ab0:
    uVar82 = (ulong)pOVar9->D1;
LAB_007d43e9:
    pcVar83 = L" D%d ";
    goto LAB_007d4859;
  case 0x6a:
    pOVar79 = (OpLayoutDouble1Long1_Small *)ByteCodeReader::Int64x2_1Long1_Small(reader);
    uVar82 = (ulong)pOVar79->D0;
    pcVar83 = L" I2_%d ";
LAB_007d4623:
    Output::Print(pcVar83,uVar82);
LAB_007d462a:
    uVar82 = (ulong)pOVar79->L1;
LAB_007d462e:
    pcVar83 = L" L%d ";
    goto LAB_007d4859;
  case 0x6b:
    data_15 = ByteCodeReader::Long1Int64x2_1Int1_Small(reader);
    DumpLong1Int64x2_1Int1<Js::OpLayoutT_Long1Int64x2_1Int1<Js::LayoutSizePolicy<(Js::LayoutSize)0>>__unaligned>
              (op,data_15,dumpFunction,reader);
    return;
  case 0x6c:
    data_x00334 = ByteCodeReader::Int64x2_2_Int1_Long1_Small(reader);
    DumpInt64x2_2_Int1_Long1<Js::OpLayoutT_Int64x2_2_Int1_Long1<Js::LayoutSizePolicy<(Js::LayoutSize)0>>__unaligned>
              (op,data_x00334,dumpFunction,reader);
    return;
  case 0x6d:
    data_x00262 = ByteCodeReader::Int64x2_3_Small(reader);
    DumpInt64x2_3<Js::OpLayoutT_Int64x2_3<Js::LayoutSizePolicy<(Js::LayoutSize)0>>__unaligned>
              (op,data_x00262,dumpFunction,reader);
    return;
  case 0x6e:
    pOVar75 = (OpLayoutBool8x16_2_Small *)ByteCodeReader::Int64x2_2_Small(reader);
    uVar82 = (ulong)pOVar75->B16_0;
    pcVar83 = L" I2_%d ";
    break;
  case 0x6f:
    data_x00303 = ByteCodeReader::Int64x2_2Int1_Small(reader);
    DumpInt64x2_2Int1<Js::OpLayoutT_Int64x2_2Int1<Js::LayoutSizePolicy<(Js::LayoutSize)0>>__unaligned>
              (op,data_x00303,dumpFunction,reader);
    return;
  case 0x70:
    pOVar32 = ByteCodeReader::Int1Bool64x2_1_Small(reader);
    Output::Print(L" I%d ",(ulong)pOVar32->I0);
    uVar82 = (ulong)pOVar32->I2_1;
    goto LAB_007d38fb;
  case 0x71:
    data_64 = ByteCodeReader::Int16x8_1Int8_Small(reader);
    DumpInt16x8_1Int8<Js::OpLayoutT_Int16x8_1Int8<Js::LayoutSizePolicy<(Js::LayoutSize)0>>__unaligned>
              (op,data_64,dumpFunction,reader);
    return;
  case 0x72:
    pOVar74 = (OpLayoutFloat32x4_1Int16x8_1_Small *)ByteCodeReader::Reg1Int16x8_1_Small(reader);
    ByteCodeDumper::DumpReg((uint)pOVar74->F4_0);
    goto LAB_007d443d;
  case 0x73:
    pOVar75 = (OpLayoutBool8x16_2_Small *)ByteCodeReader::Int16x8_2_Small(reader);
    uVar82 = (ulong)pOVar75->B16_0;
    pcVar83 = L" I8_%d ";
    break;
  case 0x74:
    data_x00328 = ByteCodeReader::Int1Int16x8_1Int1_Small(reader);
    DumpInt1Int16x8_1Int1<Js::OpLayoutT_Int1Int16x8_1Int1<Js::LayoutSizePolicy<(Js::LayoutSize)0>>__unaligned>
              (op,data_x00328,dumpFunction,reader);
    return;
  case 0x75:
    data_12 = ByteCodeReader::Int16x8_2Int8_Small(reader);
    DumpInt16x8_2Int8<Js::OpLayoutT_Int16x8_2Int8<Js::LayoutSizePolicy<(Js::LayoutSize)0>>__unaligned>
              (op,data_12,dumpFunction,reader);
    return;
  case 0x76:
    data_21 = ByteCodeReader::Int16x8_3Int8_Small(reader);
    DumpInt16x8_3Int8<Js::OpLayoutT_Int16x8_3Int8<Js::LayoutSizePolicy<(Js::LayoutSize)0>>__unaligned>
              (op,data_21,dumpFunction,reader);
    return;
  case 0x77:
    pOVar30 = (OpLayoutBool8x16_1Int1_Small *)ByteCodeReader::Int16x8_1Int1_Small(reader);
    uVar82 = (ulong)pOVar30->B16_0;
    pcVar83 = L" I8_%d ";
    goto LAB_007d440a;
  case 0x78:
    data_90 = ByteCodeReader::Int16x8_2Int2_Small(reader);
    DumpInt16x8_2Int2<Js::OpLayoutT_Int16x8_2Int2<Js::LayoutSizePolicy<(Js::LayoutSize)0>>__unaligned>
              (op,data_90,dumpFunction,reader);
    return;
  case 0x79:
    data_x00322 = ByteCodeReader::Int16x8_3_Small(reader);
    DumpInt16x8_3<Js::OpLayoutT_Int16x8_3<Js::LayoutSizePolicy<(Js::LayoutSize)0>>__unaligned>
              (op,data_x00322,dumpFunction,reader);
    return;
  case 0x7a:
    data_x00282 = ByteCodeReader::Bool16x8_1Int16x8_2_Small(reader);
    DumpBool16x8_1Int16x8_2<Js::OpLayoutT_Bool16x8_1Int16x8_2<Js::LayoutSizePolicy<(Js::LayoutSize)0>>__unaligned>
              (op,data_x00282,dumpFunction,reader);
    return;
  case 0x7b:
    data_14 = ByteCodeReader::Int16x8_1Bool16x8_1Int16x8_2_Small(reader);
    DumpInt16x8_1Bool16x8_1Int16x8_2<Js::OpLayoutT_Int16x8_1Bool16x8_1Int16x8_2<Js::LayoutSizePolicy<(Js::LayoutSize)0>>__unaligned>
              (op,data_14,dumpFunction,reader);
    return;
  case 0x7c:
    data_17 = ByteCodeReader::Int16x8_2Int1_Small(reader);
    DumpInt16x8_2Int1<Js::OpLayoutT_Int16x8_2Int1<Js::LayoutSizePolicy<(Js::LayoutSize)0>>__unaligned>
              (op,data_17,dumpFunction,reader);
    return;
  case 0x7d:
    pOVar21 = (OpLayoutInt8x16_1Float32x4_1_Small *)
              ByteCodeReader::Int16x8_1Float32x4_1_Small(reader);
    uVar82 = (ulong)pOVar21->I16_0;
    pcVar83 = L" I8_%d ";
    goto LAB_007d478d;
  case 0x7e:
    pOVar60 = (OpLayoutFloat32x4_1Int32x4_1_Small *)ByteCodeReader::Int16x8_1Int32x4_1_Small(reader)
    ;
    uVar82 = (ulong)pOVar60->F4_0;
    pcVar83 = L" I8_%d ";
    goto LAB_007d3c6e;
  case 0x7f:
    pOVar23 = (OpLayoutFloat32x4_1Int8x16_1_Small *)ByteCodeReader::Int16x8_1Int8x16_1_Small(reader)
    ;
    uVar82 = (ulong)pOVar23->F4_0;
    pcVar83 = L" I8_%d ";
    goto LAB_007d45d5;
  case 0x80:
    pOVar20 = (OpLayoutFloat32x4_1Uint32x4_1_Small *)
              ByteCodeReader::Int16x8_1Uint32x4_1_Small(reader);
    uVar82 = (ulong)pOVar20->F4_0;
    pcVar83 = L" I8_%d ";
    goto LAB_007d46ad;
  case 0x81:
    pOVar80 = (OpLayoutFloat32x4_1Uint16x8_1_Small *)
              ByteCodeReader::Int16x8_1Uint16x8_1_Small(reader);
    uVar82 = (ulong)pOVar80->F4_0;
    pcVar83 = L" I8_%d ";
    goto LAB_007d4713;
  case 0x82:
    pOVar61 = (OpLayoutFloat32x4_1Uint8x16_1_Small *)
              ByteCodeReader::Int16x8_1Uint8x16_1_Small(reader);
    uVar82 = (ulong)pOVar61->F4_0;
    pcVar83 = L" I8_%d ";
    goto LAB_007d4847;
  case 0x83:
    pOVar75 = (OpLayoutBool8x16_2_Small *)ByteCodeReader::Int8x16_2_Small(reader);
    uVar82 = (ulong)pOVar75->B16_0;
    pcVar83 = L" I16_%d ";
    break;
  case 0x84:
    data_06 = ByteCodeReader::Int8x16_3_Small(reader);
    DumpInt8x16_3<Js::OpLayoutT_Int8x16_3<Js::LayoutSizePolicy<(Js::LayoutSize)0>>__unaligned>
              (op,data_06,dumpFunction,reader);
    return;
  case 0x85:
    data_07 = ByteCodeReader::Int8x16_1Int16_Small(reader);
    DumpInt8x16_1Int16<Js::OpLayoutT_Int8x16_1Int16<Js::LayoutSizePolicy<(Js::LayoutSize)0>>__unaligned>
              (op,data_07,dumpFunction,reader);
    return;
  case 0x86:
    data_11 = ByteCodeReader::Int8x16_2Int16_Small(reader);
    DumpInt8x16_2Int16<Js::OpLayoutT_Int8x16_2Int16<Js::LayoutSizePolicy<(Js::LayoutSize)0>>__unaligned>
              (op,data_11,dumpFunction,reader);
    return;
  case 0x87:
    data_50 = ByteCodeReader::Int8x16_3Int16_Small(reader);
    DumpInt8x16_3Int16<Js::OpLayoutT_Int8x16_3Int16<Js::LayoutSizePolicy<(Js::LayoutSize)0>>__unaligned>
              (op,data_50,dumpFunction,reader);
    return;
  case 0x88:
    pOVar30 = (OpLayoutBool8x16_1Int1_Small *)ByteCodeReader::Int8x16_1Int1_Small(reader);
    uVar82 = (ulong)pOVar30->B16_0;
    pcVar83 = L" I16_%d ";
    goto LAB_007d440a;
  case 0x89:
    data_x00311 = ByteCodeReader::Int8x16_2Int1_Small(reader);
    DumpInt8x16_2Int1<Js::OpLayoutT_Int8x16_2Int1<Js::LayoutSizePolicy<(Js::LayoutSize)0>>__unaligned>
              (op,data_x00311,dumpFunction,reader);
    return;
  case 0x8a:
    pOVar23 = (OpLayoutFloat32x4_1Int8x16_1_Small *)ByteCodeReader::Reg1Int8x16_1_Small(reader);
    ByteCodeDumper::DumpReg((uint)pOVar23->F4_0);
    goto LAB_007d45dc;
  case 0x8b:
    data_x00278 = ByteCodeReader::Bool8x16_1Int8x16_2_Small(reader);
    DumpBool8x16_1Int8x16_2<Js::OpLayoutT_Bool8x16_1Int8x16_2<Js::LayoutSizePolicy<(Js::LayoutSize)0>>__unaligned>
              (op,data_x00278,dumpFunction,reader);
    return;
  case 0x8c:
    data_x00330 = ByteCodeReader::Int8x16_1Bool8x16_1Int8x16_2_Small(reader);
    DumpInt8x16_1Bool8x16_1Int8x16_2<Js::OpLayoutT_Int8x16_1Bool8x16_1Int8x16_2<Js::LayoutSizePolicy<(Js::LayoutSize)0>>__unaligned>
              (op,data_x00330,dumpFunction,reader);
    return;
  case 0x8d:
    pOVar21 = ByteCodeReader::Int8x16_1Float32x4_1_Small(reader);
    uVar82 = (ulong)pOVar21->I16_0;
    pcVar83 = L" I16_%d ";
    goto LAB_007d478d;
  case 0x8e:
    pOVar60 = (OpLayoutFloat32x4_1Int32x4_1_Small *)ByteCodeReader::Int8x16_1Int32x4_1_Small(reader)
    ;
    uVar82 = (ulong)pOVar60->F4_0;
    pcVar83 = L" I16_%d ";
    goto LAB_007d3c6e;
  case 0x8f:
    pOVar74 = (OpLayoutFloat32x4_1Int16x8_1_Small *)ByteCodeReader::Int8x16_1Int16x8_1_Small(reader)
    ;
    uVar82 = (ulong)pOVar74->F4_0;
    pcVar83 = L" I16_%d ";
    goto LAB_007d4436;
  case 0x90:
    pOVar20 = (OpLayoutFloat32x4_1Uint32x4_1_Small *)
              ByteCodeReader::Int8x16_1Uint32x4_1_Small(reader);
    uVar82 = (ulong)pOVar20->F4_0;
    pcVar83 = L" I16_%d ";
    goto LAB_007d46ad;
  case 0x91:
    pOVar80 = (OpLayoutFloat32x4_1Uint16x8_1_Small *)
              ByteCodeReader::Int8x16_1Uint16x8_1_Small(reader);
    uVar82 = (ulong)pOVar80->F4_0;
    pcVar83 = L" I16_%d ";
    goto LAB_007d4713;
  case 0x92:
    pOVar61 = (OpLayoutFloat32x4_1Uint8x16_1_Small *)
              ByteCodeReader::Int8x16_1Uint8x16_1_Small(reader);
    uVar82 = (ulong)pOVar61->F4_0;
    pcVar83 = L" I16_%d ";
    goto LAB_007d4847;
  case 0x93:
    data_x00205 = ByteCodeReader::Int1Int8x16_1Int1_Small(reader);
    DumpInt1Int8x16_1Int1<Js::OpLayoutT_Int1Int8x16_1Int1<Js::LayoutSizePolicy<(Js::LayoutSize)0>>__unaligned>
              (op,data_x00205,dumpFunction,reader);
    return;
  case 0x94:
    data_x00111 = ByteCodeReader::Int8x16_2Int2_Small(reader);
    DumpInt8x16_2Int2<Js::OpLayoutT_Int8x16_2Int2<Js::LayoutSizePolicy<(Js::LayoutSize)0>>__unaligned>
              (op,data_x00111,dumpFunction,reader);
    return;
  case 0x95:
    data_x00256 = ByteCodeReader::Uint32x4_1Int4_Small(reader);
    DumpUint32x4_1Int4<Js::OpLayoutT_Uint32x4_1Int4<Js::LayoutSizePolicy<(Js::LayoutSize)0>>__unaligned>
              (op,data_x00256,dumpFunction,reader);
    return;
  case 0x96:
    pOVar20 = (OpLayoutFloat32x4_1Uint32x4_1_Small *)ByteCodeReader::Reg1Uint32x4_1_Small(reader);
    ByteCodeDumper::DumpReg((uint)pOVar20->F4_0);
    goto LAB_007d46b4;
  case 0x97:
    pOVar75 = (OpLayoutBool8x16_2_Small *)ByteCodeReader::Uint32x4_2_Small(reader);
    uVar82 = (ulong)pOVar75->B16_0;
    pcVar83 = L" U4_%d ";
    break;
  case 0x98:
    data_x00222 = ByteCodeReader::Int1Uint32x4_1Int1_Small(reader);
    DumpInt1Uint32x4_1Int1<Js::OpLayoutT_Int1Uint32x4_1Int1<Js::LayoutSizePolicy<(Js::LayoutSize)0>>__unaligned>
              (op,data_x00222,dumpFunction,reader);
    return;
  case 0x99:
    data_x00165 = ByteCodeReader::Uint32x4_2Int4_Small(reader);
    DumpUint32x4_2Int4<Js::OpLayoutT_Uint32x4_2Int4<Js::LayoutSizePolicy<(Js::LayoutSize)0>>__unaligned>
              (op,data_x00165,dumpFunction,reader);
    return;
  case 0x9a:
    data_x00218 = ByteCodeReader::Uint32x4_3Int4_Small(reader);
    DumpUint32x4_3Int4<Js::OpLayoutT_Uint32x4_3Int4<Js::LayoutSizePolicy<(Js::LayoutSize)0>>__unaligned>
              (op,data_x00218,dumpFunction,reader);
    return;
  case 0x9b:
    pOVar30 = (OpLayoutBool8x16_1Int1_Small *)ByteCodeReader::Uint32x4_1Int1_Small(reader);
    uVar82 = (ulong)pOVar30->B16_0;
    pcVar83 = L" U4_%d ";
    goto LAB_007d440a;
  case 0x9c:
    data_x00235 = ByteCodeReader::Uint32x4_2Int2_Small(reader);
    DumpUint32x4_2Int2<Js::OpLayoutT_Uint32x4_2Int2<Js::LayoutSizePolicy<(Js::LayoutSize)0>>__unaligned>
              (op,data_x00235,dumpFunction,reader);
    return;
  case 0x9d:
    data_x00325 = ByteCodeReader::Uint32x4_3_Small(reader);
    DumpUint32x4_3<Js::OpLayoutT_Uint32x4_3<Js::LayoutSizePolicy<(Js::LayoutSize)0>>__unaligned>
              (op,data_x00325,dumpFunction,reader);
    return;
  case 0x9e:
    data_08 = ByteCodeReader::Bool32x4_1Uint32x4_2_Small(reader);
    DumpBool32x4_1Uint32x4_2<Js::OpLayoutT_Bool32x4_1Uint32x4_2<Js::LayoutSizePolicy<(Js::LayoutSize)0>>__unaligned>
              (op,data_08,dumpFunction,reader);
    return;
  case 0x9f:
    data_13 = ByteCodeReader::Uint32x4_1Bool32x4_1Uint32x4_2_Small(reader);
    DumpUint32x4_1Bool32x4_1Uint32x4_2<Js::OpLayoutT_Uint32x4_1Bool32x4_1Uint32x4_2<Js::LayoutSizePolicy<(Js::LayoutSize)0>>__unaligned>
              (op,data_13,dumpFunction,reader);
    return;
  case 0xa0:
    data_34 = ByteCodeReader::Uint32x4_2Int1_Small(reader);
    DumpUint32x4_2Int1<Js::OpLayoutT_Uint32x4_2Int1<Js::LayoutSizePolicy<(Js::LayoutSize)0>>__unaligned>
              (op,data_34,dumpFunction,reader);
    return;
  case 0xa1:
    pOVar21 = (OpLayoutInt8x16_1Float32x4_1_Small *)
              ByteCodeReader::Uint32x4_1Float32x4_1_Small(reader);
    uVar82 = (ulong)pOVar21->I16_0;
    pcVar83 = L" U4_%d ";
    goto LAB_007d478d;
  case 0xa2:
    pOVar60 = (OpLayoutFloat32x4_1Int32x4_1_Small *)
              ByteCodeReader::Uint32x4_1Int32x4_1_Small(reader);
    uVar82 = (ulong)pOVar60->F4_0;
    pcVar83 = L" U4_%d ";
    goto LAB_007d3c6e;
  case 0xa3:
    pOVar74 = (OpLayoutFloat32x4_1Int16x8_1_Small *)
              ByteCodeReader::Uint32x4_1Int16x8_1_Small(reader);
    uVar82 = (ulong)pOVar74->F4_0;
    pcVar83 = L" U4_%d ";
    goto LAB_007d4436;
  case 0xa4:
    pOVar23 = (OpLayoutFloat32x4_1Int8x16_1_Small *)
              ByteCodeReader::Uint32x4_1Int8x16_1_Small(reader);
    uVar82 = (ulong)pOVar23->F4_0;
    pcVar83 = L" U4_%d ";
    goto LAB_007d45d5;
  case 0xa5:
    pOVar80 = (OpLayoutFloat32x4_1Uint16x8_1_Small *)
              ByteCodeReader::Uint32x4_1Uint16x8_1_Small(reader);
    uVar82 = (ulong)pOVar80->F4_0;
    pcVar83 = L" U4_%d ";
    goto LAB_007d4713;
  case 0xa6:
    pOVar61 = (OpLayoutFloat32x4_1Uint8x16_1_Small *)
              ByteCodeReader::Uint32x4_1Uint8x16_1_Small(reader);
    uVar82 = (ulong)pOVar61->F4_0;
    pcVar83 = L" U4_%d ";
    goto LAB_007d4847;
  case 0xa7:
    data_09 = ByteCodeReader::Uint16x8_1Int8_Small(reader);
    DumpUint16x8_1Int8<Js::OpLayoutT_Uint16x8_1Int8<Js::LayoutSizePolicy<(Js::LayoutSize)0>>__unaligned>
              (op,data_09,dumpFunction,reader);
    return;
  case 0xa8:
    pOVar80 = (OpLayoutFloat32x4_1Uint16x8_1_Small *)ByteCodeReader::Reg1Uint16x8_1_Small(reader);
    ByteCodeDumper::DumpReg((uint)pOVar80->F4_0);
    goto LAB_007d471a;
  case 0xa9:
    pOVar75 = (OpLayoutBool8x16_2_Small *)ByteCodeReader::Uint16x8_2_Small(reader);
    uVar82 = (ulong)pOVar75->B16_0;
    pcVar83 = L" U8_%d ";
    break;
  case 0xaa:
    data_x00170 = ByteCodeReader::Int1Uint16x8_1Int1_Small(reader);
    DumpInt1Uint16x8_1Int1<Js::OpLayoutT_Int1Uint16x8_1Int1<Js::LayoutSizePolicy<(Js::LayoutSize)0>>__unaligned>
              (op,data_x00170,dumpFunction,reader);
    return;
  case 0xab:
    data_x00243 = ByteCodeReader::Uint16x8_2Int8_Small(reader);
    DumpUint16x8_2Int8<Js::OpLayoutT_Uint16x8_2Int8<Js::LayoutSizePolicy<(Js::LayoutSize)0>>__unaligned>
              (op,data_x00243,dumpFunction,reader);
    return;
  case 0xac:
    data_x00332 = ByteCodeReader::Uint16x8_3Int8_Small(reader);
    DumpUint16x8_3Int8<Js::OpLayoutT_Uint16x8_3Int8<Js::LayoutSizePolicy<(Js::LayoutSize)0>>__unaligned>
              (op,data_x00332,dumpFunction,reader);
    return;
  case 0xad:
    pOVar30 = (OpLayoutBool8x16_1Int1_Small *)ByteCodeReader::Uint16x8_1Int1_Small(reader);
    uVar82 = (ulong)pOVar30->B16_0;
    pcVar83 = L" U8_%d ";
    goto LAB_007d440a;
  case 0xae:
    data_78 = ByteCodeReader::Uint16x8_2Int2_Small(reader);
    DumpUint16x8_2Int2<Js::OpLayoutT_Uint16x8_2Int2<Js::LayoutSizePolicy<(Js::LayoutSize)0>>__unaligned>
              (op,data_78,dumpFunction,reader);
    return;
  case 0xaf:
    data_x00300 = ByteCodeReader::Uint16x8_3_Small(reader);
    DumpUint16x8_3<Js::OpLayoutT_Uint16x8_3<Js::LayoutSizePolicy<(Js::LayoutSize)0>>__unaligned>
              (op,data_x00300,dumpFunction,reader);
    return;
  case 0xb0:
    data_35 = ByteCodeReader::Bool16x8_1Uint16x8_2_Small(reader);
    DumpBool16x8_1Uint16x8_2<Js::OpLayoutT_Bool16x8_1Uint16x8_2<Js::LayoutSizePolicy<(Js::LayoutSize)0>>__unaligned>
              (op,data_35,dumpFunction,reader);
    return;
  case 0xb1:
    data_x00320 = ByteCodeReader::Uint16x8_1Bool16x8_1Uint16x8_2_Small(reader);
    DumpUint16x8_1Bool16x8_1Uint16x8_2<Js::OpLayoutT_Uint16x8_1Bool16x8_1Uint16x8_2<Js::LayoutSizePolicy<(Js::LayoutSize)0>>__unaligned>
              (op,data_x00320,dumpFunction,reader);
    return;
  case 0xb2:
    data_10 = ByteCodeReader::Uint16x8_2Int1_Small(reader);
    DumpUint16x8_2Int1<Js::OpLayoutT_Uint16x8_2Int1<Js::LayoutSizePolicy<(Js::LayoutSize)0>>__unaligned>
              (op,data_10,dumpFunction,reader);
    return;
  case 0xb3:
    pOVar21 = (OpLayoutInt8x16_1Float32x4_1_Small *)
              ByteCodeReader::Uint16x8_1Float32x4_1_Small(reader);
    uVar82 = (ulong)pOVar21->I16_0;
    pcVar83 = L" U8_%d ";
    goto LAB_007d478d;
  case 0xb4:
    pOVar60 = (OpLayoutFloat32x4_1Int32x4_1_Small *)
              ByteCodeReader::Uint16x8_1Int32x4_1_Small(reader);
    uVar82 = (ulong)pOVar60->F4_0;
    pcVar83 = L" U8_%d ";
    goto LAB_007d3c6e;
  case 0xb5:
    pOVar74 = (OpLayoutFloat32x4_1Int16x8_1_Small *)
              ByteCodeReader::Uint16x8_1Int16x8_1_Small(reader);
    uVar82 = (ulong)pOVar74->F4_0;
    pcVar83 = L" U8_%d ";
    goto LAB_007d4436;
  case 0xb6:
    pOVar23 = (OpLayoutFloat32x4_1Int8x16_1_Small *)
              ByteCodeReader::Uint16x8_1Int8x16_1_Small(reader);
    uVar82 = (ulong)pOVar23->F4_0;
    pcVar83 = L" U8_%d ";
    goto LAB_007d45d5;
  case 0xb7:
    pOVar20 = (OpLayoutFloat32x4_1Uint32x4_1_Small *)
              ByteCodeReader::Uint16x8_1Uint32x4_1_Small(reader);
    uVar82 = (ulong)pOVar20->F4_0;
    pcVar83 = L" U8_%d ";
    goto LAB_007d46ad;
  case 0xb8:
    pOVar61 = (OpLayoutFloat32x4_1Uint8x16_1_Small *)
              ByteCodeReader::Uint16x8_1Uint8x16_1_Small(reader);
    uVar82 = (ulong)pOVar61->F4_0;
    pcVar83 = L" U8_%d ";
LAB_007d4847:
    Output::Print(pcVar83,uVar82);
LAB_007d484e:
    uVar82 = (ulong)pOVar61->U16_1;
LAB_007d4852:
    pcVar83 = L" U16_%d ";
    goto LAB_007d4859;
  case 0xb9:
    data_x00168 = ByteCodeReader::Uint8x16_1Int16_Small(reader);
    DumpUint8x16_1Int16<Js::OpLayoutT_Uint8x16_1Int16<Js::LayoutSizePolicy<(Js::LayoutSize)0>>__unaligned>
              (op,data_x00168,dumpFunction,reader);
    return;
  case 0xba:
    pOVar61 = (OpLayoutFloat32x4_1Uint8x16_1_Small *)ByteCodeReader::Reg1Uint8x16_1_Small(reader);
    ByteCodeDumper::DumpReg((uint)pOVar61->F4_0);
    goto LAB_007d484e;
  case 0xbb:
    pOVar75 = (OpLayoutBool8x16_2_Small *)ByteCodeReader::Uint8x16_2_Small(reader);
    uVar82 = (ulong)pOVar75->B16_0;
    pcVar83 = L" U16_%d ";
    break;
  case 0xbc:
    data_x00307 = ByteCodeReader::Int1Uint8x16_1Int1_Small(reader);
    DumpInt1Uint8x16_1Int1<Js::OpLayoutT_Int1Uint8x16_1Int1<Js::LayoutSizePolicy<(Js::LayoutSize)0>>__unaligned>
              (op,data_x00307,dumpFunction,reader);
    return;
  case 0xbd:
    data_86 = ByteCodeReader::Uint8x16_2Int16_Small(reader);
    DumpUint8x16_2Int16<Js::OpLayoutT_Uint8x16_2Int16<Js::LayoutSizePolicy<(Js::LayoutSize)0>>__unaligned>
              (op,data_86,dumpFunction,reader);
    return;
  case 0xbe:
    data_x00327 = ByteCodeReader::Uint8x16_3Int16_Small(reader);
    DumpUint8x16_3Int16<Js::OpLayoutT_Uint8x16_3Int16<Js::LayoutSizePolicy<(Js::LayoutSize)0>>__unaligned>
              (op,data_x00327,dumpFunction,reader);
    return;
  case 0xbf:
    pOVar30 = (OpLayoutBool8x16_1Int1_Small *)ByteCodeReader::Uint8x16_1Int1_Small(reader);
    uVar82 = (ulong)pOVar30->B16_0;
    pcVar83 = L" U16_%d ";
    goto LAB_007d440a;
  case 0xc0:
    data_x00313 = ByteCodeReader::Uint8x16_2Int2_Small(reader);
    DumpUint8x16_2Int2<Js::OpLayoutT_Uint8x16_2Int2<Js::LayoutSizePolicy<(Js::LayoutSize)0>>__unaligned>
              (op,data_x00313,dumpFunction,reader);
    return;
  case 0xc1:
    data_x00226 = ByteCodeReader::Uint8x16_3_Small(reader);
    DumpUint8x16_3<Js::OpLayoutT_Uint8x16_3<Js::LayoutSizePolicy<(Js::LayoutSize)0>>__unaligned>
              (op,data_x00226,dumpFunction,reader);
    return;
  case 0xc2:
    data_30 = ByteCodeReader::Bool8x16_1Uint8x16_2_Small(reader);
    DumpBool8x16_1Uint8x16_2<Js::OpLayoutT_Bool8x16_1Uint8x16_2<Js::LayoutSizePolicy<(Js::LayoutSize)0>>__unaligned>
              (op,data_30,dumpFunction,reader);
    return;
  case 0xc3:
    data_x00315 = ByteCodeReader::Uint8x16_1Bool8x16_1Uint8x16_2_Small(reader);
    DumpUint8x16_1Bool8x16_1Uint8x16_2<Js::OpLayoutT_Uint8x16_1Bool8x16_1Uint8x16_2<Js::LayoutSizePolicy<(Js::LayoutSize)0>>__unaligned>
              (op,data_x00315,dumpFunction,reader);
    return;
  case 0xc4:
    data_x00308 = ByteCodeReader::Uint8x16_2Int1_Small(reader);
    DumpUint8x16_2Int1<Js::OpLayoutT_Uint8x16_2Int1<Js::LayoutSizePolicy<(Js::LayoutSize)0>>__unaligned>
              (op,data_x00308,dumpFunction,reader);
    return;
  case 0xc5:
    pOVar21 = (OpLayoutInt8x16_1Float32x4_1_Small *)
              ByteCodeReader::Uint8x16_1Float32x4_1_Small(reader);
    uVar82 = (ulong)pOVar21->I16_0;
    pcVar83 = L" U16_%d ";
LAB_007d478d:
    Output::Print(pcVar83,uVar82);
LAB_007d4794:
    uVar82 = (ulong)pOVar21->F4_1;
LAB_007d4798:
    pcVar83 = L" F4_%d ";
    goto LAB_007d4859;
  case 0xc6:
    pOVar60 = (OpLayoutFloat32x4_1Int32x4_1_Small *)
              ByteCodeReader::Uint8x16_1Int32x4_1_Small(reader);
    uVar82 = (ulong)pOVar60->F4_0;
    pcVar83 = L" U16_%d ";
LAB_007d3c6e:
    Output::Print(pcVar83,uVar82);
LAB_007d3c75:
    uVar82 = (ulong)pOVar60->I4_1;
LAB_007d3c79:
    pcVar83 = L" I4_%d ";
    goto LAB_007d4859;
  case 199:
    pOVar74 = (OpLayoutFloat32x4_1Int16x8_1_Small *)
              ByteCodeReader::Uint8x16_1Int16x8_1_Small(reader);
    uVar82 = (ulong)pOVar74->F4_0;
    pcVar83 = L" U16_%d ";
LAB_007d4436:
    Output::Print(pcVar83,uVar82);
LAB_007d443d:
    uVar82 = (ulong)pOVar74->I8_1;
LAB_007d4441:
    pcVar83 = L" I8_%d ";
    goto LAB_007d4859;
  case 200:
    pOVar23 = (OpLayoutFloat32x4_1Int8x16_1_Small *)
              ByteCodeReader::Uint8x16_1Int8x16_1_Small(reader);
    uVar82 = (ulong)pOVar23->F4_0;
    pcVar83 = L" U16_%d ";
LAB_007d45d5:
    Output::Print(pcVar83,uVar82);
LAB_007d45dc:
    uVar82 = (ulong)pOVar23->I16_1;
LAB_007d45e0:
    pcVar83 = L" I16_%d ";
    goto LAB_007d4859;
  case 0xc9:
    pOVar20 = (OpLayoutFloat32x4_1Uint32x4_1_Small *)
              ByteCodeReader::Uint8x16_1Uint32x4_1_Small(reader);
    uVar82 = (ulong)pOVar20->F4_0;
    pcVar83 = L" U16_%d ";
LAB_007d46ad:
    Output::Print(pcVar83,uVar82);
LAB_007d46b4:
    uVar82 = (ulong)pOVar20->U4_1;
LAB_007d46b8:
    pcVar83 = L" U4_%d ";
    goto LAB_007d4859;
  case 0xca:
    pOVar80 = (OpLayoutFloat32x4_1Uint16x8_1_Small *)
              ByteCodeReader::Uint8x16_1Uint16x8_1_Small(reader);
    uVar82 = (ulong)pOVar80->F4_0;
    pcVar83 = L" U16_%d ";
LAB_007d4713:
    Output::Print(pcVar83,uVar82);
LAB_007d471a:
    uVar82 = (ulong)pOVar80->U8_1;
LAB_007d471e:
    pcVar83 = L" U8_%d ";
    goto LAB_007d4859;
  case 0xcb:
    pOVar30 = (OpLayoutBool8x16_1Int1_Small *)ByteCodeReader::Bool32x4_1Int1_Small(reader);
    uVar82 = (ulong)pOVar30->B16_0;
    pcVar83 = L" B4_%d ";
    goto LAB_007d440a;
  case 0xcc:
    data_x00123 = ByteCodeReader::Bool32x4_1Int4_Small(reader);
    DumpBool32x4_1Int4<Js::OpLayoutT_Bool32x4_1Int4<Js::LayoutSizePolicy<(Js::LayoutSize)0>>__unaligned>
              (op,data_x00123,dumpFunction,reader);
    return;
  case 0xcd:
    data_x00281 = ByteCodeReader::Int1Bool32x4_1Int1_Small(reader);
    DumpInt1Bool32x4_1Int1<Js::OpLayoutT_Int1Bool32x4_1Int1<Js::LayoutSizePolicy<(Js::LayoutSize)0>>__unaligned>
              (op,data_x00281,dumpFunction,reader);
    return;
  case 0xce:
    data_x00279 = ByteCodeReader::Bool32x4_2Int2_Small(reader);
    DumpBool32x4_2Int2<Js::OpLayoutT_Bool32x4_2Int2<Js::LayoutSizePolicy<(Js::LayoutSize)0>>__unaligned>
              (op,data_x00279,dumpFunction,reader);
    return;
  case 0xcf:
    pOVar73 = ByteCodeReader::Int1Bool32x4_1_Small(reader);
    Output::Print(L" I%d ",(ulong)pOVar73->I0);
    goto LAB_007d3bb1;
  case 0xd0:
    pOVar75 = (OpLayoutBool8x16_2_Small *)ByteCodeReader::Bool32x4_2_Small(reader);
    uVar82 = (ulong)pOVar75->B16_0;
    pcVar83 = L" B4_%d ";
    break;
  case 0xd1:
    data_x00110 = ByteCodeReader::Bool32x4_3_Small(reader);
    DumpBool32x4_3<Js::OpLayoutT_Bool32x4_3<Js::LayoutSizePolicy<(Js::LayoutSize)0>>__unaligned>
              (op,data_x00110,dumpFunction,reader);
    return;
  case 0xd2:
    pOVar73 = (OpLayoutInt1Bool32x4_1_Small *)ByteCodeReader::Reg1Bool32x4_1_Small(reader);
    ByteCodeDumper::DumpReg((uint)pOVar73->I0);
LAB_007d3bb1:
    uVar82 = (ulong)pOVar73->B4_1;
LAB_007d3bb5:
    pcVar83 = L" B4_%d ";
    goto LAB_007d4859;
  case 0xd3:
    pOVar30 = (OpLayoutBool8x16_1Int1_Small *)ByteCodeReader::Bool16x8_1Int1_Small(reader);
    uVar82 = (ulong)pOVar30->B16_0;
    pcVar83 = L" B8_%d ";
    goto LAB_007d440a;
  case 0xd4:
    data_x00229 = ByteCodeReader::Bool16x8_1Int8_Small(reader);
    DumpBool16x8_1Int8<Js::OpLayoutT_Bool16x8_1Int8<Js::LayoutSizePolicy<(Js::LayoutSize)0>>__unaligned>
              (op,data_x00229,dumpFunction,reader);
    return;
  case 0xd5:
    data_x00240 = ByteCodeReader::Int1Bool16x8_1Int1_Small(reader);
    DumpInt1Bool16x8_1Int1<Js::OpLayoutT_Int1Bool16x8_1Int1<Js::LayoutSizePolicy<(Js::LayoutSize)0>>__unaligned>
              (op,data_x00240,dumpFunction,reader);
    return;
  case 0xd6:
    data_99 = ByteCodeReader::Bool16x8_2Int2_Small(reader);
    DumpBool16x8_2Int2<Js::OpLayoutT_Bool16x8_2Int2<Js::LayoutSizePolicy<(Js::LayoutSize)0>>__unaligned>
              (op,data_99,dumpFunction,reader);
    return;
  case 0xd7:
    pOVar67 = ByteCodeReader::Int1Bool16x8_1_Small(reader);
    Output::Print(L" I%d ",(ulong)pOVar67->I0);
    goto LAB_007d3749;
  case 0xd8:
    pOVar75 = (OpLayoutBool8x16_2_Small *)ByteCodeReader::Bool16x8_2_Small(reader);
    uVar82 = (ulong)pOVar75->B16_0;
    pcVar83 = L" B8_%d ";
    break;
  case 0xd9:
    data_25 = ByteCodeReader::Bool16x8_3_Small(reader);
    DumpBool16x8_3<Js::OpLayoutT_Bool16x8_3<Js::LayoutSizePolicy<(Js::LayoutSize)0>>__unaligned>
              (op,data_25,dumpFunction,reader);
    return;
  case 0xda:
    pOVar67 = (OpLayoutInt1Bool16x8_1_Small *)ByteCodeReader::Reg1Bool16x8_1_Small(reader);
    ByteCodeDumper::DumpReg((uint)pOVar67->I0);
LAB_007d3749:
    uVar82 = (ulong)pOVar67->B8_1;
LAB_007d3a3b:
    pcVar83 = L" B8_%d ";
    goto LAB_007d4859;
  case 0xdb:
    pOVar30 = ByteCodeReader::Bool8x16_1Int1_Small(reader);
    uVar82 = (ulong)pOVar30->B16_0;
    pcVar83 = L" B16_%d ";
LAB_007d440a:
    Output::Print(pcVar83,uVar82);
LAB_007d4411:
    uVar82 = (ulong)pOVar30->I1;
LAB_007d4415:
    pcVar83 = L" I%d ";
    goto LAB_007d4859;
  case 0xdc:
    data_x00171 = ByteCodeReader::Bool8x16_1Int16_Small(reader);
    DumpBool8x16_1Int16<Js::OpLayoutT_Bool8x16_1Int16<Js::LayoutSizePolicy<(Js::LayoutSize)0>>__unaligned>
              (op,data_x00171,dumpFunction,reader);
    return;
  case 0xdd:
    pOVar77 = ByteCodeReader::Int1Bool8x16_1_Small(reader);
    Output::Print(L" I%d ",(ulong)pOVar77->I0);
    goto LAB_007d44c6;
  case 0xde:
    data_28 = ByteCodeReader::Int1Bool8x16_1Int1_Small(reader);
    DumpInt1Bool8x16_1Int1<Js::OpLayoutT_Int1Bool8x16_1Int1<Js::LayoutSizePolicy<(Js::LayoutSize)0>>__unaligned>
              (op,data_28,dumpFunction,reader);
    return;
  case 0xdf:
    data_41 = ByteCodeReader::Bool8x16_2Int2_Small(reader);
    DumpBool8x16_2Int2<Js::OpLayoutT_Bool8x16_2Int2<Js::LayoutSizePolicy<(Js::LayoutSize)0>>__unaligned>
              (op,data_41,dumpFunction,reader);
    return;
  case 0xe0:
    pOVar75 = ByteCodeReader::Bool8x16_2_Small(reader);
    uVar82 = (ulong)pOVar75->B16_0;
    pcVar83 = L" B16_%d ";
    break;
  case 0xe1:
    data_65 = ByteCodeReader::Bool8x16_3_Small(reader);
    DumpBool8x16_3<Js::OpLayoutT_Bool8x16_3<Js::LayoutSizePolicy<(Js::LayoutSize)0>>__unaligned>
              (op,data_65,dumpFunction,reader);
    return;
  case 0xe2:
    pOVar77 = (OpLayoutInt1Bool8x16_1_Small *)ByteCodeReader::Reg1Bool8x16_1_Small(reader);
    ByteCodeDumper::DumpReg((uint)pOVar77->I0);
LAB_007d44c6:
    uVar82 = (ulong)pOVar77->B16_1;
LAB_007d44ca:
    pcVar83 = L" B16_%d ";
    goto LAB_007d4859;
  case 0xe3:
    data_16 = ByteCodeReader::AsmSimdTypedArr_Small(reader);
    DumpAsmSimdTypedArr<Js::OpLayoutT_AsmSimdTypedArr<Js::LayoutSizePolicy<(Js::LayoutSize)0>>__unaligned>
              (op,data_16,dumpFunction,reader);
    return;
  case 0xe4:
    data_x00312 = ByteCodeReader::AsmShuffle_Small(reader);
    DumpAsmShuffle<Js::OpLayoutT_AsmShuffle<Js::LayoutSizePolicy<(Js::LayoutSize)0>>__unaligned>
              (op,data_x00312,dumpFunction,reader);
    return;
  case 0xe5:
    data_x00275 = ByteCodeReader::ElementSlot_Medium(reader);
    DumpElementSlot<Js::OpLayoutT_ElementSlot<Js::LayoutSizePolicy<(Js::LayoutSize)1>>__unaligned>
              (op,data_x00275,dumpFunction,reader);
    return;
  default:
    goto switchD_007cf5c4_caseD_e6;
  case 0xe8:
    data_20 = ByteCodeReader::AsmTypedArr_Medium(reader);
    DumpAsmTypedArr<Js::OpLayoutT_AsmTypedArr<Js::LayoutSizePolicy<(Js::LayoutSize)1>>__unaligned>
              (op,data_20,dumpFunction,reader);
    return;
  case 0xe9:
    data_89 = ByteCodeReader::WasmMemAccess_Medium(reader);
    DumpWasmMemAccess<Js::OpLayoutT_WasmMemAccess<Js::LayoutSizePolicy<(Js::LayoutSize)1>>__unaligned>
              (op,data_89,dumpFunction,reader);
    return;
  case 0xea:
    data_x00317 = ByteCodeReader::AsmCall_Medium(reader);
    DumpAsmCall<Js::OpLayoutT_AsmCall<Js::LayoutSizePolicy<(Js::LayoutSize)1>>__unaligned>
              (op,data_x00317,dumpFunction,reader);
    return;
  case 0xeb:
    data_x00290 = ByteCodeReader::ProfiledAsmCall_Medium(reader);
    DumpProfiledAsmCall<Js::OpLayoutDynamicProfile<Js::OpLayoutT_AsmCall<Js::LayoutSizePolicy<(Js::LayoutSize)1>>>__unaligned>
              (op,data_x00290,dumpFunction,reader);
    return;
  case 0xed:
    pOVar39 = ByteCodeReader::AsmReg1_Medium(reader);
    registerID_00 = pOVar39->R0;
    goto LAB_007d1900;
  case 0xee:
    pOVar19 = ByteCodeReader::AsmReg2_Medium(reader);
    ByteCodeDumper::DumpReg(pOVar19->R0);
    registerID_00 = pOVar19->R1;
LAB_007d1900:
    ByteCodeDumper::DumpReg(registerID_00);
    return;
  case 0xef:
    data_x00121 = ByteCodeReader::AsmReg3_Medium(reader);
    DumpAsmReg3<Js::OpLayoutT_AsmReg3<Js::LayoutSizePolicy<(Js::LayoutSize)1>>__unaligned>
              (op,data_x00121,dumpFunction,reader);
    return;
  case 0xf0:
    data_87 = ByteCodeReader::AsmReg4_Medium(reader);
    DumpAsmReg4<Js::OpLayoutT_AsmReg4<Js::LayoutSizePolicy<(Js::LayoutSize)1>>__unaligned>
              (op,data_87,dumpFunction,reader);
    return;
  case 0xf1:
    data_92 = ByteCodeReader::AsmReg5_Medium(reader);
    DumpAsmReg5<Js::OpLayoutT_AsmReg5<Js::LayoutSizePolicy<(Js::LayoutSize)1>>__unaligned>
              (op,data_92,dumpFunction,reader);
    return;
  case 0xf2:
    data_x00291 = ByteCodeReader::AsmReg6_Medium(reader);
    DumpAsmReg6<Js::OpLayoutT_AsmReg6<Js::LayoutSizePolicy<(Js::LayoutSize)1>>__unaligned>
              (op,data_x00291,dumpFunction,reader);
    return;
  case 0xf3:
    data_x00319 = ByteCodeReader::AsmReg7_Medium(reader);
    DumpAsmReg7<Js::OpLayoutT_AsmReg7<Js::LayoutSizePolicy<(Js::LayoutSize)1>>__unaligned>
              (op,data_x00319,dumpFunction,reader);
    return;
  case 0xf4:
    data_36 = ByteCodeReader::AsmReg9_Medium(reader);
    DumpAsmReg9<Js::OpLayoutT_AsmReg9<Js::LayoutSizePolicy<(Js::LayoutSize)1>>__unaligned>
              (op,data_36,dumpFunction,reader);
    return;
  case 0xf5:
    data_x00295 = ByteCodeReader::AsmReg10_Medium(reader);
    DumpAsmReg10<Js::OpLayoutT_AsmReg10<Js::LayoutSizePolicy<(Js::LayoutSize)1>>__unaligned>
              (op,data_x00295,dumpFunction,reader);
    return;
  case 0xf6:
    data_45 = ByteCodeReader::AsmReg11_Medium(reader);
    DumpAsmReg11<Js::OpLayoutT_AsmReg11<Js::LayoutSizePolicy<(Js::LayoutSize)1>>__unaligned>
              (op,data_45,dumpFunction,reader);
    return;
  case 0xf7:
    data_x00272 = ByteCodeReader::AsmReg17_Medium(reader);
    DumpAsmReg17<Js::OpLayoutT_AsmReg17<Js::LayoutSizePolicy<(Js::LayoutSize)1>>__unaligned>
              (op,data_x00272,dumpFunction,reader);
    return;
  case 0xf8:
    data_x00269 = ByteCodeReader::AsmReg18_Medium(reader);
    DumpAsmReg18<Js::OpLayoutT_AsmReg18<Js::LayoutSizePolicy<(Js::LayoutSize)1>>__unaligned>
              (op,data_x00269,dumpFunction,reader);
    return;
  case 0xf9:
    data_x00181 = ByteCodeReader::AsmReg19_Medium(reader);
    DumpAsmReg19<Js::OpLayoutT_AsmReg19<Js::LayoutSizePolicy<(Js::LayoutSize)1>>__unaligned>
              (op,data_x00181,dumpFunction,reader);
    return;
  case 0xfa:
    pOVar13 = (OpLayoutFloat64x2_1Double1_Medium *)ByteCodeReader::Int1Double1_Medium(reader);
    uVar82 = (ulong)pOVar13->D2_0;
    pcVar83 = L" I%d ";
    goto LAB_007d43de;
  case 0xfb:
    pOVar12 = (OpLayoutDouble1Float1_Medium *)ByteCodeReader::Int1Float1_Medium(reader);
    uVar82 = (ulong)pOVar12->D0;
    pcVar83 = L" I%d ";
    goto LAB_007d24a5;
  case 0xfc:
    pOVar37 = ByteCodeReader::Double1Const1_Medium(reader);
    Output::Print(L" D%d ",(ulong)pOVar37->D0);
    value_03 = pOVar37->C1;
    goto LAB_007d1524;
  case 0xfd:
    pOVar41 = (OpLayoutBool8x16_1Int1_Medium *)ByteCodeReader::Double1Int1_Medium(reader);
    uVar82 = (ulong)pOVar41->B16_0;
    pcVar83 = L" D%d ";
    goto LAB_007d3f6f;
  case 0xfe:
    pOVar12 = ByteCodeReader::Double1Float1_Medium(reader);
    uVar82 = (ulong)pOVar12->D0;
    pcVar83 = L" D%d ";
    goto LAB_007d24a5;
  case 0xff:
    pOVar22 = ByteCodeReader::Double1Reg1_Medium(reader);
    uVar82 = (ulong)pOVar22->D0;
    pcVar83 = L" D%d ";
    goto LAB_007d4351;
  case 0x100:
    pOVar22 = (OpLayoutDouble1Reg1_Medium *)ByteCodeReader::Float1Reg1_Medium(reader);
    uVar82 = (ulong)pOVar22->D0;
    pcVar83 = L" F%d ";
    goto LAB_007d4351;
  case 0x101:
    pOVar22 = (OpLayoutDouble1Reg1_Medium *)ByteCodeReader::Int1Reg1_Medium(reader);
    uVar82 = (ulong)pOVar22->D0;
    pcVar83 = L" I%d ";
    goto LAB_007d4351;
  case 0x102:
    pOVar13 = (OpLayoutFloat64x2_1Double1_Medium *)ByteCodeReader::Reg1Double1_Medium(reader);
    ByteCodeDumper::DumpReg((uint)pOVar13->D2_0);
    goto LAB_007d43e5;
  case 0x103:
    pOVar12 = (OpLayoutDouble1Float1_Medium *)ByteCodeReader::Reg1Float1_Medium(reader);
    ByteCodeDumper::DumpReg((uint)pOVar12->D0);
    goto LAB_007d24ac;
  case 0x104:
    pOVar41 = (OpLayoutBool8x16_1Int1_Medium *)ByteCodeReader::Reg1Int1_Medium(reader);
    ByteCodeDumper::DumpReg((uint)pOVar41->B16_0);
    goto LAB_007d3f76;
  case 0x105:
    pOVar27 = ByteCodeReader::Int1Const1_Medium(reader);
    Output::Print(L" I%d ",(ulong)pOVar27->I0);
    goto LAB_007d452e;
  case 0x106:
    pOVar27 = (OpLayoutInt1Const1_Medium *)ByteCodeReader::Reg1IntConst1_Medium(reader);
    ByteCodeDumper::DumpReg((uint)pOVar27->I0);
LAB_007d452e:
    value_00 = pOVar27->C1;
    goto LAB_007d4749;
  case 0x107:
    data_x00280 = ByteCodeReader::Int1Double2_Medium(reader);
    DumpInt1Double2<Js::OpLayoutT_Int1Double2<Js::LayoutSizePolicy<(Js::LayoutSize)1>>__unaligned>
              (op,data_x00280,dumpFunction,reader);
    return;
  case 0x108:
    data_x00287 = ByteCodeReader::Int1Float2_Medium(reader);
    DumpInt1Float2<Js::OpLayoutT_Int1Float2<Js::LayoutSizePolicy<(Js::LayoutSize)1>>__unaligned>
              (op,data_x00287,dumpFunction,reader);
    return;
  case 0x109:
    pOVar47 = (OpLayoutBool8x16_2_Medium *)ByteCodeReader::Int2_Medium(reader);
    uVar82 = (ulong)pOVar47->B16_0;
    pcVar83 = L" I%d ";
    goto LAB_007d3fb6;
  case 0x10a:
    data_44 = ByteCodeReader::Int3_Medium(reader);
    DumpInt3<Js::OpLayoutT_Int3<Js::LayoutSizePolicy<(Js::LayoutSize)1>>__unaligned>
              (op,data_44,dumpFunction,reader);
    return;
  case 0x10b:
    pOVar47 = (OpLayoutBool8x16_2_Medium *)ByteCodeReader::Double2_Medium(reader);
    uVar82 = (ulong)pOVar47->B16_0;
    pcVar83 = L" D%d ";
    goto LAB_007d3fb6;
  case 0x10c:
    pOVar47 = (OpLayoutBool8x16_2_Medium *)ByteCodeReader::Float2_Medium(reader);
    uVar82 = (ulong)pOVar47->B16_0;
    pcVar83 = L" F%d ";
    goto LAB_007d3fb6;
  case 0x10d:
    data_x00316 = ByteCodeReader::Float3_Medium(reader);
    DumpFloat3<Js::OpLayoutT_Float3<Js::LayoutSizePolicy<(Js::LayoutSize)1>>__unaligned>
              (op,data_x00316,dumpFunction,reader);
    return;
  case 0x10e:
    pOVar10 = ByteCodeReader::Float1Const1_Medium(reader);
    Output::Print(L" F%d ",(ulong)pOVar10->F0);
    value_02 = pOVar10->C1;
    goto LAB_007d3459;
  case 0x10f:
    pOVar13 = (OpLayoutFloat64x2_1Double1_Medium *)ByteCodeReader::Float1Double1_Medium(reader);
    uVar82 = (ulong)pOVar13->D2_0;
    pcVar83 = L" F%d ";
    goto LAB_007d43de;
  case 0x110:
    pOVar41 = (OpLayoutBool8x16_1Int1_Medium *)ByteCodeReader::Float1Int1_Medium(reader);
    uVar82 = (ulong)pOVar41->B16_0;
    pcVar83 = L" F%d ";
    goto LAB_007d3f6f;
  case 0x111:
    data_x00204 = ByteCodeReader::Double3_Medium(reader);
    DumpDouble3<Js::OpLayoutT_Double3<Js::LayoutSizePolicy<(Js::LayoutSize)1>>__unaligned>
              (op,data_x00204,dumpFunction,reader);
    return;
  case 0x112:
    pOVar42 = ByteCodeReader::BrInt1_Medium(reader);
    ByteCodeDumper::DumpOffset(pOVar42->RelativeJumpOffset,reader);
    uVar82 = (ulong)pOVar42->I1;
    goto LAB_007d4415;
  case 0x113:
    data_x00277 = ByteCodeReader::BrInt2_Medium(reader);
    DumpBrInt2<Js::OpLayoutT_BrInt2<Js::LayoutSizePolicy<(Js::LayoutSize)1>>__unaligned>
              (op,data_x00277,dumpFunction,reader);
    return;
  case 0x114:
    data_x00286 = ByteCodeReader::BrInt1Const1_Medium(reader);
    DumpBrInt1Const1<Js::OpLayoutT_BrInt1Const1<Js::LayoutSizePolicy<(Js::LayoutSize)1>>__unaligned>
              (op,data_x00286,dumpFunction,reader);
    return;
  case 0x115:
    pOVar11 = (OpLayoutWasmLoopStart_Medium *)ByteCodeReader::AsmUnsigned1_Medium(reader);
    goto LAB_007cfd37;
  case 0x116:
    pOVar11 = ByteCodeReader::WasmLoopStart_Medium(reader);
LAB_007cfd37:
    value = (UnsignedType)pOVar11->loopId;
    goto LAB_007d2f0a;
  case 0x117:
    pOVar22 = (OpLayoutDouble1Reg1_Medium *)ByteCodeReader::Long1Reg1_Medium(reader);
    uVar82 = (ulong)pOVar22->D0;
    pcVar83 = L" L%d ";
LAB_007d4351:
    Output::Print(pcVar83,uVar82);
    registerID_01 = (RegSlotType)pOVar22->R1;
    goto LAB_007d48cc;
  case 0x118:
    pOVar70 = (OpLayoutDouble1Long1_Medium *)ByteCodeReader::Reg1Long1_Medium(reader);
    ByteCodeDumper::DumpReg((uint)pOVar70->D0);
    goto LAB_007d39e7;
  case 0x119:
    pOVar8 = ByteCodeReader::Long1Const1_Medium(reader);
    Output::Print(L" L%d ",(ulong)pOVar8->L0);
    value_01 = pOVar8->C1;
    goto LAB_007d1b88;
  case 0x11a:
    pOVar47 = (OpLayoutBool8x16_2_Medium *)ByteCodeReader::Long2_Medium(reader);
    uVar82 = (ulong)pOVar47->B16_0;
    pcVar83 = L" L%d ";
    goto LAB_007d3fb6;
  case 0x11b:
    data_71 = ByteCodeReader::Long3_Medium(reader);
    DumpLong3<Js::OpLayoutT_Long3<Js::LayoutSizePolicy<(Js::LayoutSize)1>>__unaligned>
              (op,data_71,dumpFunction,reader);
    return;
  case 0x11c:
    data_x00237 = ByteCodeReader::Int1Long2_Medium(reader);
    DumpInt1Long2<Js::OpLayoutT_Int1Long2<Js::LayoutSizePolicy<(Js::LayoutSize)1>>__unaligned>
              (op,data_x00237,dumpFunction,reader);
    return;
  case 0x11d:
    pOVar41 = (OpLayoutBool8x16_1Int1_Medium *)ByteCodeReader::Long1Int1_Medium(reader);
    uVar82 = (ulong)pOVar41->B16_0;
    pcVar83 = L" L%d ";
    goto LAB_007d3f6f;
  case 0x11e:
    pOVar70 = (OpLayoutDouble1Long1_Medium *)ByteCodeReader::Int1Long1_Medium(reader);
    uVar82 = (ulong)pOVar70->D0;
    pcVar83 = L" I%d ";
    goto LAB_007d39e0;
  case 0x11f:
    pOVar12 = (OpLayoutDouble1Float1_Medium *)ByteCodeReader::Long1Float1_Medium(reader);
    uVar82 = (ulong)pOVar12->D0;
    pcVar83 = L" L%d ";
    goto LAB_007d24a5;
  case 0x120:
    pOVar70 = (OpLayoutDouble1Long1_Medium *)ByteCodeReader::Float1Long1_Medium(reader);
    uVar82 = (ulong)pOVar70->D0;
    pcVar83 = L" F%d ";
    goto LAB_007d39e0;
  case 0x121:
    pOVar13 = (OpLayoutFloat64x2_1Double1_Medium *)ByteCodeReader::Long1Double1_Medium(reader);
    uVar82 = (ulong)pOVar13->D2_0;
    pcVar83 = L" L%d ";
    goto LAB_007d43de;
  case 0x122:
    pOVar70 = ByteCodeReader::Double1Long1_Medium(reader);
    uVar82 = (ulong)pOVar70->D0;
    pcVar83 = L" D%d ";
    goto LAB_007d39e0;
  case 0x123:
    pOVar47 = (OpLayoutBool8x16_2_Medium *)ByteCodeReader::Float32x4_2_Medium(reader);
    uVar82 = (ulong)pOVar47->B16_0;
    pcVar83 = L" F4_%d ";
    goto LAB_007d3fb6;
  case 0x124:
    data_38 = ByteCodeReader::Float32x4_3_Medium(reader);
    DumpFloat32x4_3<Js::OpLayoutT_Float32x4_3<Js::LayoutSizePolicy<(Js::LayoutSize)1>>__unaligned>
              (op,data_38,dumpFunction,reader);
    return;
  case 0x125:
    data_27 = ByteCodeReader::Float32x4_4_Medium(reader);
    DumpFloat32x4_4<Js::OpLayoutT_Float32x4_4<Js::LayoutSizePolicy<(Js::LayoutSize)1>>__unaligned>
              (op,data_27,dumpFunction,reader);
    return;
  case 0x126:
    data_x00296 = ByteCodeReader::Bool32x4_1Float32x4_2_Medium(reader);
    DumpBool32x4_1Float32x4_2<Js::OpLayoutT_Bool32x4_1Float32x4_2<Js::LayoutSizePolicy<(Js::LayoutSize)1>>__unaligned>
              (op,data_x00296,dumpFunction,reader);
    return;
  case 0x127:
    data_23 = ByteCodeReader::Float32x4_1Bool32x4_1Float32x4_2_Medium(reader);
    DumpFloat32x4_1Bool32x4_1Float32x4_2<Js::OpLayoutT_Float32x4_1Bool32x4_1Float32x4_2<Js::LayoutSizePolicy<(Js::LayoutSize)1>>__unaligned>
              (op,data_23,dumpFunction,reader);
    return;
  case 0x128:
    data_48 = ByteCodeReader::Float32x4_1Float4_Medium(reader);
    DumpFloat32x4_1Float4<Js::OpLayoutT_Float32x4_1Float4<Js::LayoutSizePolicy<(Js::LayoutSize)1>>__unaligned>
              (op,data_48,dumpFunction,reader);
    return;
  case 0x129:
    data_x00304 = ByteCodeReader::Float32x4_2Int4_Medium(reader);
    DumpFloat32x4_2Int4<Js::OpLayoutT_Float32x4_2Int4<Js::LayoutSizePolicy<(Js::LayoutSize)1>>__unaligned>
              (op,data_x00304,dumpFunction,reader);
    return;
  case 0x12a:
    data_x00242 = ByteCodeReader::Float32x4_3Int4_Medium(reader);
    DumpFloat32x4_3Int4<Js::OpLayoutT_Float32x4_3Int4<Js::LayoutSizePolicy<(Js::LayoutSize)1>>__unaligned>
              (op,data_x00242,dumpFunction,reader);
    return;
  case 299:
    pOVar12 = (OpLayoutDouble1Float1_Medium *)ByteCodeReader::Float32x4_1Float1_Medium(reader);
    uVar82 = (ulong)pOVar12->D0;
    pcVar83 = L" F4_%d ";
LAB_007d24a5:
    Output::Print(pcVar83,uVar82);
LAB_007d24ac:
    uVar82 = (ulong)pOVar12->F1;
    goto LAB_007d45b4;
  case 300:
    data_x00299 = ByteCodeReader::Float32x4_2Float1_Medium(reader);
    DumpFloat32x4_2Float1<Js::OpLayoutT_Float32x4_2Float1<Js::LayoutSizePolicy<(Js::LayoutSize)1>>__unaligned>
              (op,data_x00299,dumpFunction,reader);
    return;
  case 0x12d:
    pOVar14 = ByteCodeReader::Float32x4_1Int32x4_1_Medium(reader);
    uVar82 = (ulong)pOVar14->F4_0;
    pcVar83 = L" F4_%d ";
    goto LAB_007d3c08;
  case 0x12e:
    pOVar54 = ByteCodeReader::Float32x4_1Uint32x4_1_Medium(reader);
    uVar82 = (ulong)pOVar54->F4_0;
    pcVar83 = L" F4_%d ";
    goto LAB_007d3cf8;
  case 0x12f:
    pOVar44 = ByteCodeReader::Float32x4_1Int16x8_1_Medium(reader);
    uVar82 = (ulong)pOVar44->F4_0;
    pcVar83 = L" F4_%d ";
    goto LAB_007d3e06;
  case 0x130:
    pOVar26 = ByteCodeReader::Float32x4_1Uint16x8_1_Medium(reader);
    uVar82 = (ulong)pOVar26->F4_0;
    pcVar83 = L" F4_%d ";
    goto LAB_007d3fde;
  case 0x131:
    pOVar15 = ByteCodeReader::Float32x4_1Int8x16_1_Medium(reader);
    uVar82 = (ulong)pOVar15->F4_0;
    pcVar83 = L" F4_%d ";
    goto LAB_007d3d59;
  case 0x132:
    pOVar17 = ByteCodeReader::Float32x4_1Uint8x16_1_Medium(reader);
    uVar82 = (ulong)pOVar17->F4_0;
    pcVar83 = L" F4_%d ";
    goto LAB_007d3726;
  case 0x133:
    pOVar53 = (OpLayoutInt8x16_1Float32x4_1_Medium *)ByteCodeReader::Reg1Float32x4_1_Medium(reader);
    ByteCodeDumper::DumpReg((uint)pOVar53->I16_0);
    goto LAB_007d3521;
  case 0x134:
    data_52 = ByteCodeReader::Float1Float32x4_1Int1_Medium(reader);
    DumpFloat1Float32x4_1Int1<Js::OpLayoutT_Float1Float32x4_1Int1<Js::LayoutSizePolicy<(Js::LayoutSize)1>>__unaligned>
              (op,data_52,dumpFunction,reader);
    return;
  case 0x135:
    data_x00216 = ByteCodeReader::Float32x4_2Int1Float1_Medium(reader);
    DumpFloat32x4_2Int1Float1<Js::OpLayoutT_Float32x4_2Int1Float1<Js::LayoutSizePolicy<(Js::LayoutSize)1>>__unaligned>
              (op,data_x00216,dumpFunction,reader);
    return;
  case 0x136:
    pOVar47 = (OpLayoutBool8x16_2_Medium *)ByteCodeReader::Int32x4_2_Medium(reader);
    uVar82 = (ulong)pOVar47->B16_0;
    pcVar83 = L" I4_%d ";
    goto LAB_007d3fb6;
  case 0x137:
    data_75 = ByteCodeReader::Int32x4_3_Medium(reader);
    DumpInt32x4_3<Js::OpLayoutT_Int32x4_3<Js::LayoutSizePolicy<(Js::LayoutSize)1>>__unaligned>
              (op,data_75,dumpFunction,reader);
    return;
  case 0x138:
    data_26 = ByteCodeReader::Int32x4_4_Medium(reader);
    DumpInt32x4_4<Js::OpLayoutT_Int32x4_4<Js::LayoutSizePolicy<(Js::LayoutSize)1>>__unaligned>
              (op,data_26,dumpFunction,reader);
    return;
  case 0x139:
    data_42 = ByteCodeReader::Bool32x4_1Int32x4_2_Medium(reader);
    DumpBool32x4_1Int32x4_2<Js::OpLayoutT_Bool32x4_1Int32x4_2<Js::LayoutSizePolicy<(Js::LayoutSize)1>>__unaligned>
              (op,data_42,dumpFunction,reader);
    return;
  case 0x13a:
    data_97 = ByteCodeReader::Int32x4_1Bool32x4_1Int32x4_2_Medium(reader);
    DumpInt32x4_1Bool32x4_1Int32x4_2<Js::OpLayoutT_Int32x4_1Bool32x4_1Int32x4_2<Js::LayoutSizePolicy<(Js::LayoutSize)1>>__unaligned>
              (op,data_97,dumpFunction,reader);
    return;
  case 0x13b:
    data_x00101 = ByteCodeReader::Int32x4_1Int4_Medium(reader);
    DumpInt32x4_1Int4<Js::OpLayoutT_Int32x4_1Int4<Js::LayoutSizePolicy<(Js::LayoutSize)1>>__unaligned>
              (op,data_x00101,dumpFunction,reader);
    return;
  case 0x13c:
    data_x00309 = ByteCodeReader::Int32x4_2Int4_Medium(reader);
    DumpInt32x4_2Int4<Js::OpLayoutT_Int32x4_2Int4<Js::LayoutSizePolicy<(Js::LayoutSize)1>>__unaligned>
              (op,data_x00309,dumpFunction,reader);
    return;
  case 0x13d:
    data_x00225 = ByteCodeReader::Int32x4_3Int4_Medium(reader);
    DumpInt32x4_3Int4<Js::OpLayoutT_Int32x4_3Int4<Js::LayoutSizePolicy<(Js::LayoutSize)1>>__unaligned>
              (op,data_x00225,dumpFunction,reader);
    return;
  case 0x13e:
    pOVar41 = (OpLayoutBool8x16_1Int1_Medium *)ByteCodeReader::Int32x4_1Int1_Medium(reader);
    uVar82 = (ulong)pOVar41->B16_0;
    pcVar83 = L" I4_%d ";
    goto LAB_007d3f6f;
  case 0x13f:
    data_85 = ByteCodeReader::Int32x4_2Int1_Medium(reader);
    DumpInt32x4_2Int1<Js::OpLayoutT_Int32x4_2Int1<Js::LayoutSizePolicy<(Js::LayoutSize)1>>__unaligned>
              (op,data_85,dumpFunction,reader);
    return;
  case 0x140:
    pOVar14 = (OpLayoutFloat32x4_1Int32x4_1_Medium *)ByteCodeReader::Reg1Int32x4_1_Medium(reader);
    ByteCodeDumper::DumpReg((uint)pOVar14->F4_0);
    goto LAB_007d3c0f;
  case 0x141:
    pOVar53 = (OpLayoutInt8x16_1Float32x4_1_Medium *)
              ByteCodeReader::Int32x4_1Float32x4_1_Medium(reader);
    uVar82 = (ulong)pOVar53->I16_0;
    pcVar83 = L" I4_%d ";
    goto LAB_007d351a;
  case 0x142:
    pOVar54 = (OpLayoutFloat32x4_1Uint32x4_1_Medium *)
              ByteCodeReader::Int32x4_1Uint32x4_1_Medium(reader);
    uVar82 = (ulong)pOVar54->F4_0;
    pcVar83 = L" I4_%d ";
    goto LAB_007d3cf8;
  case 0x143:
    pOVar44 = (OpLayoutFloat32x4_1Int16x8_1_Medium *)
              ByteCodeReader::Int32x4_1Int16x8_1_Medium(reader);
    uVar82 = (ulong)pOVar44->F4_0;
    pcVar83 = L" I4_%d ";
    goto LAB_007d3e06;
  case 0x144:
    pOVar26 = (OpLayoutFloat32x4_1Uint16x8_1_Medium *)
              ByteCodeReader::Int32x4_1Uint16x8_1_Medium(reader);
    uVar82 = (ulong)pOVar26->F4_0;
    pcVar83 = L" I4_%d ";
    goto LAB_007d3fde;
  case 0x145:
    pOVar15 = (OpLayoutFloat32x4_1Int8x16_1_Medium *)
              ByteCodeReader::Int32x4_1Int8x16_1_Medium(reader);
    uVar82 = (ulong)pOVar15->F4_0;
    pcVar83 = L" I4_%d ";
    goto LAB_007d3d59;
  case 0x146:
    pOVar17 = (OpLayoutFloat32x4_1Uint8x16_1_Medium *)
              ByteCodeReader::Int32x4_1Uint8x16_1_Medium(reader);
    uVar82 = (ulong)pOVar17->F4_0;
    pcVar83 = L" I4_%d ";
    goto LAB_007d3726;
  case 0x147:
    data_x00301 = ByteCodeReader::Int1Int32x4_1Int1_Medium(reader);
    DumpInt1Int32x4_1Int1<Js::OpLayoutT_Int1Int32x4_1Int1<Js::LayoutSizePolicy<(Js::LayoutSize)1>>__unaligned>
              (op,data_x00301,dumpFunction,reader);
    return;
  case 0x148:
    data_x00314 = ByteCodeReader::Int32x4_2Int2_Medium(reader);
    DumpInt32x4_2Int2<Js::OpLayoutT_Int32x4_2Int2<Js::LayoutSizePolicy<(Js::LayoutSize)1>>__unaligned>
              (op,data_x00314,dumpFunction,reader);
    return;
  case 0x149:
    data_59 = ByteCodeReader::Float32x4_IntConst4_Medium(reader);
    DumpFloat32x4_IntConst4<Js::OpLayoutT_Float32x4_IntConst4<Js::LayoutSizePolicy<(Js::LayoutSize)1>>__unaligned>
              (op,data_59,dumpFunction,reader);
    return;
  case 0x14a:
    data_x00153 = ByteCodeReader::Double1Float64x2_1Int1_Medium(reader);
    DumpDouble1Float64x2_1Int1<Js::OpLayoutT_Double1Float64x2_1Int1<Js::LayoutSizePolicy<(Js::LayoutSize)1>>__unaligned>
              (op,data_x00153,dumpFunction,reader);
    return;
  case 0x14b:
    data_x00223 = ByteCodeReader::Float64x2_2Int1Double1_Medium(reader);
    DumpFloat64x2_2Int1Double1<Js::OpLayoutT_Float64x2_2Int1Double1<Js::LayoutSizePolicy<(Js::LayoutSize)1>>__unaligned>
              (op,data_x00223,dumpFunction,reader);
    return;
  case 0x14c:
    pOVar47 = (OpLayoutBool8x16_2_Medium *)ByteCodeReader::Float64x2_2_Medium(reader);
    uVar82 = (ulong)pOVar47->B16_0;
    pcVar83 = L" D2_%d ";
    goto LAB_007d3fb6;
  case 0x14d:
    data_x00202 = ByteCodeReader::Float64x2_3_Medium(reader);
    DumpFloat64x2_3<Js::OpLayoutT_Float64x2_3<Js::LayoutSizePolicy<(Js::LayoutSize)1>>__unaligned>
              (op,data_x00202,dumpFunction,reader);
    return;
  case 0x14e:
    pOVar13 = ByteCodeReader::Float64x2_1Double1_Medium(reader);
    uVar82 = (ulong)pOVar13->D2_0;
    pcVar83 = L" D2_%d ";
LAB_007d43de:
    Output::Print(pcVar83,uVar82);
LAB_007d43e5:
    uVar82 = (ulong)pOVar13->D1;
    goto LAB_007d43e9;
  case 0x14f:
    pOVar70 = (OpLayoutDouble1Long1_Medium *)ByteCodeReader::Int64x2_1Long1_Medium(reader);
    uVar82 = (ulong)pOVar70->D0;
    pcVar83 = L" I2_%d ";
LAB_007d39e0:
    Output::Print(pcVar83,uVar82);
LAB_007d39e7:
    uVar82 = (ulong)pOVar70->L1;
    goto LAB_007d462e;
  case 0x150:
    data_x00197 = ByteCodeReader::Long1Int64x2_1Int1_Medium(reader);
    DumpLong1Int64x2_1Int1<Js::OpLayoutT_Long1Int64x2_1Int1<Js::LayoutSizePolicy<(Js::LayoutSize)1>>__unaligned>
              (op,data_x00197,dumpFunction,reader);
    return;
  case 0x151:
    data_57 = ByteCodeReader::Int64x2_2_Int1_Long1_Medium(reader);
    DumpInt64x2_2_Int1_Long1<Js::OpLayoutT_Int64x2_2_Int1_Long1<Js::LayoutSizePolicy<(Js::LayoutSize)1>>__unaligned>
              (op,data_57,dumpFunction,reader);
    return;
  case 0x152:
    data_x00241 = ByteCodeReader::Int64x2_3_Medium(reader);
    DumpInt64x2_3<Js::OpLayoutT_Int64x2_3<Js::LayoutSizePolicy<(Js::LayoutSize)1>>__unaligned>
              (op,data_x00241,dumpFunction,reader);
    return;
  case 0x153:
    pOVar47 = (OpLayoutBool8x16_2_Medium *)ByteCodeReader::Int64x2_2_Medium(reader);
    uVar82 = (ulong)pOVar47->B16_0;
    pcVar83 = L" I2_%d ";
    goto LAB_007d3fb6;
  case 0x154:
    data_x00196 = ByteCodeReader::Int64x2_2Int1_Medium(reader);
    DumpInt64x2_2Int1<Js::OpLayoutT_Int64x2_2Int1<Js::LayoutSizePolicy<(Js::LayoutSize)1>>__unaligned>
              (op,data_x00196,dumpFunction,reader);
    return;
  case 0x155:
    pOVar69 = ByteCodeReader::Int1Bool64x2_1_Medium(reader);
    Output::Print(L" I%d ",(ulong)pOVar69->I0);
    uVar82 = (ulong)pOVar69->I2_1;
    goto LAB_007d38fb;
  case 0x156:
    data_x00134 = ByteCodeReader::Int16x8_1Int8_Medium(reader);
    DumpInt16x8_1Int8<Js::OpLayoutT_Int16x8_1Int8<Js::LayoutSizePolicy<(Js::LayoutSize)1>>__unaligned>
              (op,data_x00134,dumpFunction,reader);
    return;
  case 0x157:
    pOVar44 = (OpLayoutFloat32x4_1Int16x8_1_Medium *)ByteCodeReader::Reg1Int16x8_1_Medium(reader);
    ByteCodeDumper::DumpReg((uint)pOVar44->F4_0);
    goto LAB_007d3e0d;
  case 0x158:
    pOVar47 = (OpLayoutBool8x16_2_Medium *)ByteCodeReader::Int16x8_2_Medium(reader);
    uVar82 = (ulong)pOVar47->B16_0;
    pcVar83 = L" I8_%d ";
    goto LAB_007d3fb6;
  case 0x159:
    data_x00195 = ByteCodeReader::Int1Int16x8_1Int1_Medium(reader);
    DumpInt1Int16x8_1Int1<Js::OpLayoutT_Int1Int16x8_1Int1<Js::LayoutSizePolicy<(Js::LayoutSize)1>>__unaligned>
              (op,data_x00195,dumpFunction,reader);
    return;
  case 0x15a:
    data_x00117 = ByteCodeReader::Int16x8_2Int8_Medium(reader);
    DumpInt16x8_2Int8<Js::OpLayoutT_Int16x8_2Int8<Js::LayoutSizePolicy<(Js::LayoutSize)1>>__unaligned>
              (op,data_x00117,dumpFunction,reader);
    return;
  case 0x15b:
    data_x00206 = ByteCodeReader::Int16x8_3Int8_Medium(reader);
    DumpInt16x8_3Int8<Js::OpLayoutT_Int16x8_3Int8<Js::LayoutSizePolicy<(Js::LayoutSize)1>>__unaligned>
              (op,data_x00206,dumpFunction,reader);
    return;
  case 0x15c:
    pOVar41 = (OpLayoutBool8x16_1Int1_Medium *)ByteCodeReader::Int16x8_1Int1_Medium(reader);
    uVar82 = (ulong)pOVar41->B16_0;
    pcVar83 = L" I8_%d ";
    goto LAB_007d3f6f;
  case 0x15d:
    data_x00131 = ByteCodeReader::Int16x8_2Int2_Medium(reader);
    DumpInt16x8_2Int2<Js::OpLayoutT_Int16x8_2Int2<Js::LayoutSizePolicy<(Js::LayoutSize)1>>__unaligned>
              (op,data_x00131,dumpFunction,reader);
    return;
  case 0x15e:
    data_70 = ByteCodeReader::Int16x8_3_Medium(reader);
    DumpInt16x8_3<Js::OpLayoutT_Int16x8_3<Js::LayoutSizePolicy<(Js::LayoutSize)1>>__unaligned>
              (op,data_70,dumpFunction,reader);
    return;
  case 0x15f:
    data_96 = ByteCodeReader::Bool16x8_1Int16x8_2_Medium(reader);
    DumpBool16x8_1Int16x8_2<Js::OpLayoutT_Bool16x8_1Int16x8_2<Js::LayoutSizePolicy<(Js::LayoutSize)1>>__unaligned>
              (op,data_96,dumpFunction,reader);
    return;
  case 0x160:
    data_x00264 = ByteCodeReader::Int16x8_1Bool16x8_1Int16x8_2_Medium(reader);
    DumpInt16x8_1Bool16x8_1Int16x8_2<Js::OpLayoutT_Int16x8_1Bool16x8_1Int16x8_2<Js::LayoutSizePolicy<(Js::LayoutSize)1>>__unaligned>
              (op,data_x00264,dumpFunction,reader);
    return;
  case 0x161:
    data_x00174 = ByteCodeReader::Int16x8_2Int1_Medium(reader);
    DumpInt16x8_2Int1<Js::OpLayoutT_Int16x8_2Int1<Js::LayoutSizePolicy<(Js::LayoutSize)1>>__unaligned>
              (op,data_x00174,dumpFunction,reader);
    return;
  case 0x162:
    pOVar53 = (OpLayoutInt8x16_1Float32x4_1_Medium *)
              ByteCodeReader::Int16x8_1Float32x4_1_Medium(reader);
    uVar82 = (ulong)pOVar53->I16_0;
    pcVar83 = L" I8_%d ";
    goto LAB_007d351a;
  case 0x163:
    pOVar14 = (OpLayoutFloat32x4_1Int32x4_1_Medium *)
              ByteCodeReader::Int16x8_1Int32x4_1_Medium(reader);
    uVar82 = (ulong)pOVar14->F4_0;
    pcVar83 = L" I8_%d ";
    goto LAB_007d3c08;
  case 0x164:
    pOVar15 = (OpLayoutFloat32x4_1Int8x16_1_Medium *)
              ByteCodeReader::Int16x8_1Int8x16_1_Medium(reader);
    uVar82 = (ulong)pOVar15->F4_0;
    pcVar83 = L" I8_%d ";
    goto LAB_007d3d59;
  case 0x165:
    pOVar54 = (OpLayoutFloat32x4_1Uint32x4_1_Medium *)
              ByteCodeReader::Int16x8_1Uint32x4_1_Medium(reader);
    uVar82 = (ulong)pOVar54->F4_0;
    pcVar83 = L" I8_%d ";
    goto LAB_007d3cf8;
  case 0x166:
    pOVar26 = (OpLayoutFloat32x4_1Uint16x8_1_Medium *)
              ByteCodeReader::Int16x8_1Uint16x8_1_Medium(reader);
    uVar82 = (ulong)pOVar26->F4_0;
    pcVar83 = L" I8_%d ";
    goto LAB_007d3fde;
  case 0x167:
    pOVar17 = (OpLayoutFloat32x4_1Uint8x16_1_Medium *)
              ByteCodeReader::Int16x8_1Uint8x16_1_Medium(reader);
    uVar82 = (ulong)pOVar17->F4_0;
    pcVar83 = L" I8_%d ";
    goto LAB_007d3726;
  case 0x168:
    pOVar47 = (OpLayoutBool8x16_2_Medium *)ByteCodeReader::Int8x16_2_Medium(reader);
    uVar82 = (ulong)pOVar47->B16_0;
    pcVar83 = L" I16_%d ";
    goto LAB_007d3fb6;
  case 0x169:
    data_x00245 = ByteCodeReader::Int8x16_3_Medium(reader);
    DumpInt8x16_3<Js::OpLayoutT_Int8x16_3<Js::LayoutSizePolicy<(Js::LayoutSize)1>>__unaligned>
              (op,data_x00245,dumpFunction,reader);
    return;
  case 0x16a:
    data_x00102 = ByteCodeReader::Int8x16_1Int16_Medium(reader);
    DumpInt8x16_1Int16<Js::OpLayoutT_Int8x16_1Int16<Js::LayoutSizePolicy<(Js::LayoutSize)1>>__unaligned>
              (op,data_x00102,dumpFunction,reader);
    return;
  case 0x16b:
    data_x00252 = ByteCodeReader::Int8x16_2Int16_Medium(reader);
    DumpInt8x16_2Int16<Js::OpLayoutT_Int8x16_2Int16<Js::LayoutSizePolicy<(Js::LayoutSize)1>>__unaligned>
              (op,data_x00252,dumpFunction,reader);
    return;
  case 0x16c:
    data_x00297 = ByteCodeReader::Int8x16_3Int16_Medium(reader);
    DumpInt8x16_3Int16<Js::OpLayoutT_Int8x16_3Int16<Js::LayoutSizePolicy<(Js::LayoutSize)1>>__unaligned>
              (op,data_x00297,dumpFunction,reader);
    return;
  case 0x16d:
    pOVar41 = (OpLayoutBool8x16_1Int1_Medium *)ByteCodeReader::Int8x16_1Int1_Medium(reader);
    uVar82 = (ulong)pOVar41->B16_0;
    pcVar83 = L" I16_%d ";
    goto LAB_007d3f6f;
  case 0x16e:
    data_x00255 = ByteCodeReader::Int8x16_2Int1_Medium(reader);
    DumpInt8x16_2Int1<Js::OpLayoutT_Int8x16_2Int1<Js::LayoutSizePolicy<(Js::LayoutSize)1>>__unaligned>
              (op,data_x00255,dumpFunction,reader);
    return;
  case 0x16f:
    pOVar15 = (OpLayoutFloat32x4_1Int8x16_1_Medium *)ByteCodeReader::Reg1Int8x16_1_Medium(reader);
    ByteCodeDumper::DumpReg((uint)pOVar15->F4_0);
    goto LAB_007d3d60;
  case 0x170:
    data_x00276 = ByteCodeReader::Bool8x16_1Int8x16_2_Medium(reader);
    DumpBool8x16_1Int8x16_2<Js::OpLayoutT_Bool8x16_1Int8x16_2<Js::LayoutSizePolicy<(Js::LayoutSize)1>>__unaligned>
              (op,data_x00276,dumpFunction,reader);
    return;
  case 0x171:
    data_x00293 = ByteCodeReader::Int8x16_1Bool8x16_1Int8x16_2_Medium(reader);
    DumpInt8x16_1Bool8x16_1Int8x16_2<Js::OpLayoutT_Int8x16_1Bool8x16_1Int8x16_2<Js::LayoutSizePolicy<(Js::LayoutSize)1>>__unaligned>
              (op,data_x00293,dumpFunction,reader);
    return;
  case 0x172:
    pOVar53 = ByteCodeReader::Int8x16_1Float32x4_1_Medium(reader);
    uVar82 = (ulong)pOVar53->I16_0;
    pcVar83 = L" I16_%d ";
    goto LAB_007d351a;
  case 0x173:
    pOVar14 = (OpLayoutFloat32x4_1Int32x4_1_Medium *)
              ByteCodeReader::Int8x16_1Int32x4_1_Medium(reader);
    uVar82 = (ulong)pOVar14->F4_0;
    pcVar83 = L" I16_%d ";
    goto LAB_007d3c08;
  case 0x174:
    pOVar44 = (OpLayoutFloat32x4_1Int16x8_1_Medium *)
              ByteCodeReader::Int8x16_1Int16x8_1_Medium(reader);
    uVar82 = (ulong)pOVar44->F4_0;
    pcVar83 = L" I16_%d ";
    goto LAB_007d3e06;
  case 0x175:
    pOVar54 = (OpLayoutFloat32x4_1Uint32x4_1_Medium *)
              ByteCodeReader::Int8x16_1Uint32x4_1_Medium(reader);
    uVar82 = (ulong)pOVar54->F4_0;
    pcVar83 = L" I16_%d ";
    goto LAB_007d3cf8;
  case 0x176:
    pOVar26 = (OpLayoutFloat32x4_1Uint16x8_1_Medium *)
              ByteCodeReader::Int8x16_1Uint16x8_1_Medium(reader);
    uVar82 = (ulong)pOVar26->F4_0;
    pcVar83 = L" I16_%d ";
    goto LAB_007d3fde;
  case 0x177:
    pOVar17 = (OpLayoutFloat32x4_1Uint8x16_1_Medium *)
              ByteCodeReader::Int8x16_1Uint8x16_1_Medium(reader);
    uVar82 = (ulong)pOVar17->F4_0;
    pcVar83 = L" I16_%d ";
    goto LAB_007d3726;
  case 0x178:
    data_37 = ByteCodeReader::Int1Int8x16_1Int1_Medium(reader);
    DumpInt1Int8x16_1Int1<Js::OpLayoutT_Int1Int8x16_1Int1<Js::LayoutSizePolicy<(Js::LayoutSize)1>>__unaligned>
              (op,data_37,dumpFunction,reader);
    return;
  case 0x179:
    data_69 = ByteCodeReader::Int8x16_2Int2_Medium(reader);
    DumpInt8x16_2Int2<Js::OpLayoutT_Int8x16_2Int2<Js::LayoutSizePolicy<(Js::LayoutSize)1>>__unaligned>
              (op,data_69,dumpFunction,reader);
    return;
  case 0x17a:
    data_x00292 = ByteCodeReader::Uint32x4_1Int4_Medium(reader);
    DumpUint32x4_1Int4<Js::OpLayoutT_Uint32x4_1Int4<Js::LayoutSizePolicy<(Js::LayoutSize)1>>__unaligned>
              (op,data_x00292,dumpFunction,reader);
    return;
  case 0x17b:
    pOVar54 = (OpLayoutFloat32x4_1Uint32x4_1_Medium *)ByteCodeReader::Reg1Uint32x4_1_Medium(reader);
    ByteCodeDumper::DumpReg((uint)pOVar54->F4_0);
    goto LAB_007d3cff;
  case 0x17c:
    pOVar47 = (OpLayoutBool8x16_2_Medium *)ByteCodeReader::Uint32x4_2_Medium(reader);
    uVar82 = (ulong)pOVar47->B16_0;
    pcVar83 = L" U4_%d ";
    goto LAB_007d3fb6;
  case 0x17d:
    data_74 = ByteCodeReader::Int1Uint32x4_1Int1_Medium(reader);
    DumpInt1Uint32x4_1Int1<Js::OpLayoutT_Int1Uint32x4_1Int1<Js::LayoutSizePolicy<(Js::LayoutSize)1>>__unaligned>
              (op,data_74,dumpFunction,reader);
    return;
  case 0x17e:
    data_x00162 = ByteCodeReader::Uint32x4_2Int4_Medium(reader);
    DumpUint32x4_2Int4<Js::OpLayoutT_Uint32x4_2Int4<Js::LayoutSizePolicy<(Js::LayoutSize)1>>__unaligned>
              (op,data_x00162,dumpFunction,reader);
    return;
  case 0x17f:
    data_x00239 = ByteCodeReader::Uint32x4_3Int4_Medium(reader);
    DumpUint32x4_3Int4<Js::OpLayoutT_Uint32x4_3Int4<Js::LayoutSizePolicy<(Js::LayoutSize)1>>__unaligned>
              (op,data_x00239,dumpFunction,reader);
    return;
  case 0x180:
    pOVar41 = (OpLayoutBool8x16_1Int1_Medium *)ByteCodeReader::Uint32x4_1Int1_Medium(reader);
    uVar82 = (ulong)pOVar41->B16_0;
    pcVar83 = L" U4_%d ";
    goto LAB_007d3f6f;
  case 0x181:
    data_43 = ByteCodeReader::Uint32x4_2Int2_Medium(reader);
    DumpUint32x4_2Int2<Js::OpLayoutT_Uint32x4_2Int2<Js::LayoutSizePolicy<(Js::LayoutSize)1>>__unaligned>
              (op,data_43,dumpFunction,reader);
    return;
  case 0x182:
    data_x00143 = ByteCodeReader::Uint32x4_3_Medium(reader);
    DumpUint32x4_3<Js::OpLayoutT_Uint32x4_3<Js::LayoutSizePolicy<(Js::LayoutSize)1>>__unaligned>
              (op,data_x00143,dumpFunction,reader);
    return;
  case 0x183:
    data_60 = ByteCodeReader::Bool32x4_1Uint32x4_2_Medium(reader);
    DumpBool32x4_1Uint32x4_2<Js::OpLayoutT_Bool32x4_1Uint32x4_2<Js::LayoutSizePolicy<(Js::LayoutSize)1>>__unaligned>
              (op,data_60,dumpFunction,reader);
    return;
  case 0x184:
    data_x00271 = ByteCodeReader::Uint32x4_1Bool32x4_1Uint32x4_2_Medium(reader);
    DumpUint32x4_1Bool32x4_1Uint32x4_2<Js::OpLayoutT_Uint32x4_1Bool32x4_1Uint32x4_2<Js::LayoutSizePolicy<(Js::LayoutSize)1>>__unaligned>
              (op,data_x00271,dumpFunction,reader);
    return;
  case 0x185:
    data_51 = ByteCodeReader::Uint32x4_2Int1_Medium(reader);
    DumpUint32x4_2Int1<Js::OpLayoutT_Uint32x4_2Int1<Js::LayoutSizePolicy<(Js::LayoutSize)1>>__unaligned>
              (op,data_51,dumpFunction,reader);
    return;
  case 0x186:
    pOVar53 = (OpLayoutInt8x16_1Float32x4_1_Medium *)
              ByteCodeReader::Uint32x4_1Float32x4_1_Medium(reader);
    uVar82 = (ulong)pOVar53->I16_0;
    pcVar83 = L" U4_%d ";
    goto LAB_007d351a;
  case 0x187:
    pOVar14 = (OpLayoutFloat32x4_1Int32x4_1_Medium *)
              ByteCodeReader::Uint32x4_1Int32x4_1_Medium(reader);
    uVar82 = (ulong)pOVar14->F4_0;
    pcVar83 = L" U4_%d ";
    goto LAB_007d3c08;
  case 0x188:
    pOVar44 = (OpLayoutFloat32x4_1Int16x8_1_Medium *)
              ByteCodeReader::Uint32x4_1Int16x8_1_Medium(reader);
    uVar82 = (ulong)pOVar44->F4_0;
    pcVar83 = L" U4_%d ";
    goto LAB_007d3e06;
  case 0x189:
    pOVar15 = (OpLayoutFloat32x4_1Int8x16_1_Medium *)
              ByteCodeReader::Uint32x4_1Int8x16_1_Medium(reader);
    uVar82 = (ulong)pOVar15->F4_0;
    pcVar83 = L" U4_%d ";
    goto LAB_007d3d59;
  case 0x18a:
    pOVar26 = (OpLayoutFloat32x4_1Uint16x8_1_Medium *)
              ByteCodeReader::Uint32x4_1Uint16x8_1_Medium(reader);
    uVar82 = (ulong)pOVar26->F4_0;
    pcVar83 = L" U4_%d ";
    goto LAB_007d3fde;
  case 0x18b:
    pOVar17 = (OpLayoutFloat32x4_1Uint8x16_1_Medium *)
              ByteCodeReader::Uint32x4_1Uint8x16_1_Medium(reader);
    uVar82 = (ulong)pOVar17->F4_0;
    pcVar83 = L" U4_%d ";
    goto LAB_007d3726;
  case 0x18c:
    data_x00294 = ByteCodeReader::Uint16x8_1Int8_Medium(reader);
    DumpUint16x8_1Int8<Js::OpLayoutT_Uint16x8_1Int8<Js::LayoutSizePolicy<(Js::LayoutSize)1>>__unaligned>
              (op,data_x00294,dumpFunction,reader);
    return;
  case 0x18d:
    pOVar26 = (OpLayoutFloat32x4_1Uint16x8_1_Medium *)ByteCodeReader::Reg1Uint16x8_1_Medium(reader);
    ByteCodeDumper::DumpReg((uint)pOVar26->F4_0);
    goto LAB_007d3fe5;
  case 0x18e:
    pOVar47 = (OpLayoutBool8x16_2_Medium *)ByteCodeReader::Uint16x8_2_Medium(reader);
    uVar82 = (ulong)pOVar47->B16_0;
    pcVar83 = L" U8_%d ";
    goto LAB_007d3fb6;
  case 399:
    data_x00273 = ByteCodeReader::Int1Uint16x8_1Int1_Medium(reader);
    DumpInt1Uint16x8_1Int1<Js::OpLayoutT_Int1Uint16x8_1Int1<Js::LayoutSizePolicy<(Js::LayoutSize)1>>__unaligned>
              (op,data_x00273,dumpFunction,reader);
    return;
  case 400:
    data_x00231 = ByteCodeReader::Uint16x8_2Int8_Medium(reader);
    DumpUint16x8_2Int8<Js::OpLayoutT_Uint16x8_2Int8<Js::LayoutSizePolicy<(Js::LayoutSize)1>>__unaligned>
              (op,data_x00231,dumpFunction,reader);
    return;
  case 0x191:
    data_x00285 = ByteCodeReader::Uint16x8_3Int8_Medium(reader);
    DumpUint16x8_3Int8<Js::OpLayoutT_Uint16x8_3Int8<Js::LayoutSizePolicy<(Js::LayoutSize)1>>__unaligned>
              (op,data_x00285,dumpFunction,reader);
    return;
  case 0x192:
    pOVar41 = (OpLayoutBool8x16_1Int1_Medium *)ByteCodeReader::Uint16x8_1Int1_Medium(reader);
    uVar82 = (ulong)pOVar41->B16_0;
    pcVar83 = L" U8_%d ";
    goto LAB_007d3f6f;
  case 0x193:
    data_49 = ByteCodeReader::Uint16x8_2Int2_Medium(reader);
    DumpUint16x8_2Int2<Js::OpLayoutT_Uint16x8_2Int2<Js::LayoutSizePolicy<(Js::LayoutSize)1>>__unaligned>
              (op,data_49,dumpFunction,reader);
    return;
  case 0x194:
    data_x00289 = ByteCodeReader::Uint16x8_3_Medium(reader);
    DumpUint16x8_3<Js::OpLayoutT_Uint16x8_3<Js::LayoutSizePolicy<(Js::LayoutSize)1>>__unaligned>
              (op,data_x00289,dumpFunction,reader);
    return;
  case 0x195:
    data_x00158 = ByteCodeReader::Bool16x8_1Uint16x8_2_Medium(reader);
    DumpBool16x8_1Uint16x8_2<Js::OpLayoutT_Bool16x8_1Uint16x8_2<Js::LayoutSizePolicy<(Js::LayoutSize)1>>__unaligned>
              (op,data_x00158,dumpFunction,reader);
    return;
  case 0x196:
    data_x00266 = ByteCodeReader::Uint16x8_1Bool16x8_1Uint16x8_2_Medium(reader);
    DumpUint16x8_1Bool16x8_1Uint16x8_2<Js::OpLayoutT_Uint16x8_1Bool16x8_1Uint16x8_2<Js::LayoutSizePolicy<(Js::LayoutSize)1>>__unaligned>
              (op,data_x00266,dumpFunction,reader);
    return;
  case 0x197:
    data_47 = ByteCodeReader::Uint16x8_2Int1_Medium(reader);
    DumpUint16x8_2Int1<Js::OpLayoutT_Uint16x8_2Int1<Js::LayoutSizePolicy<(Js::LayoutSize)1>>__unaligned>
              (op,data_47,dumpFunction,reader);
    return;
  case 0x198:
    pOVar53 = (OpLayoutInt8x16_1Float32x4_1_Medium *)
              ByteCodeReader::Uint16x8_1Float32x4_1_Medium(reader);
    uVar82 = (ulong)pOVar53->I16_0;
    pcVar83 = L" U8_%d ";
    goto LAB_007d351a;
  case 0x199:
    pOVar14 = (OpLayoutFloat32x4_1Int32x4_1_Medium *)
              ByteCodeReader::Uint16x8_1Int32x4_1_Medium(reader);
    uVar82 = (ulong)pOVar14->F4_0;
    pcVar83 = L" U8_%d ";
    goto LAB_007d3c08;
  case 0x19a:
    pOVar44 = (OpLayoutFloat32x4_1Int16x8_1_Medium *)
              ByteCodeReader::Uint16x8_1Int16x8_1_Medium(reader);
    uVar82 = (ulong)pOVar44->F4_0;
    pcVar83 = L" U8_%d ";
    goto LAB_007d3e06;
  case 0x19b:
    pOVar15 = (OpLayoutFloat32x4_1Int8x16_1_Medium *)
              ByteCodeReader::Uint16x8_1Int8x16_1_Medium(reader);
    uVar82 = (ulong)pOVar15->F4_0;
    pcVar83 = L" U8_%d ";
    goto LAB_007d3d59;
  case 0x19c:
    pOVar54 = (OpLayoutFloat32x4_1Uint32x4_1_Medium *)
              ByteCodeReader::Uint16x8_1Uint32x4_1_Medium(reader);
    uVar82 = (ulong)pOVar54->F4_0;
    pcVar83 = L" U8_%d ";
    goto LAB_007d3cf8;
  case 0x19d:
    pOVar17 = (OpLayoutFloat32x4_1Uint8x16_1_Medium *)
              ByteCodeReader::Uint16x8_1Uint8x16_1_Medium(reader);
    uVar82 = (ulong)pOVar17->F4_0;
    pcVar83 = L" U8_%d ";
LAB_007d3726:
    Output::Print(pcVar83,uVar82);
LAB_007d372d:
    uVar82 = (ulong)pOVar17->U16_1;
    goto LAB_007d4852;
  case 0x19e:
    data_x00228 = ByteCodeReader::Uint8x16_1Int16_Medium(reader);
    DumpUint8x16_1Int16<Js::OpLayoutT_Uint8x16_1Int16<Js::LayoutSizePolicy<(Js::LayoutSize)1>>__unaligned>
              (op,data_x00228,dumpFunction,reader);
    return;
  case 0x19f:
    pOVar17 = (OpLayoutFloat32x4_1Uint8x16_1_Medium *)ByteCodeReader::Reg1Uint8x16_1_Medium(reader);
    ByteCodeDumper::DumpReg((uint)pOVar17->F4_0);
    goto LAB_007d372d;
  case 0x1a0:
    pOVar47 = (OpLayoutBool8x16_2_Medium *)ByteCodeReader::Uint8x16_2_Medium(reader);
    uVar82 = (ulong)pOVar47->B16_0;
    pcVar83 = L" U16_%d ";
    goto LAB_007d3fb6;
  case 0x1a1:
    data_x00120 = ByteCodeReader::Int1Uint8x16_1Int1_Medium(reader);
    DumpInt1Uint8x16_1Int1<Js::OpLayoutT_Int1Uint8x16_1Int1<Js::LayoutSizePolicy<(Js::LayoutSize)1>>__unaligned>
              (op,data_x00120,dumpFunction,reader);
    return;
  case 0x1a2:
    data_81 = ByteCodeReader::Uint8x16_2Int16_Medium(reader);
    DumpUint8x16_2Int16<Js::OpLayoutT_Uint8x16_2Int16<Js::LayoutSizePolicy<(Js::LayoutSize)1>>__unaligned>
              (op,data_81,dumpFunction,reader);
    return;
  case 0x1a3:
    data_x00105 = ByteCodeReader::Uint8x16_3Int16_Medium(reader);
    DumpUint8x16_3Int16<Js::OpLayoutT_Uint8x16_3Int16<Js::LayoutSizePolicy<(Js::LayoutSize)1>>__unaligned>
              (op,data_x00105,dumpFunction,reader);
    return;
  case 0x1a4:
    pOVar41 = (OpLayoutBool8x16_1Int1_Medium *)ByteCodeReader::Uint8x16_1Int1_Medium(reader);
    uVar82 = (ulong)pOVar41->B16_0;
    pcVar83 = L" U16_%d ";
    goto LAB_007d3f6f;
  case 0x1a5:
    data_x00207 = ByteCodeReader::Uint8x16_2Int2_Medium(reader);
    DumpUint8x16_2Int2<Js::OpLayoutT_Uint8x16_2Int2<Js::LayoutSizePolicy<(Js::LayoutSize)1>>__unaligned>
              (op,data_x00207,dumpFunction,reader);
    return;
  case 0x1a6:
    data_x00284 = ByteCodeReader::Uint8x16_3_Medium(reader);
    DumpUint8x16_3<Js::OpLayoutT_Uint8x16_3<Js::LayoutSizePolicy<(Js::LayoutSize)1>>__unaligned>
              (op,data_x00284,dumpFunction,reader);
    return;
  case 0x1a7:
    data_67 = ByteCodeReader::Bool8x16_1Uint8x16_2_Medium(reader);
    DumpBool8x16_1Uint8x16_2<Js::OpLayoutT_Bool8x16_1Uint8x16_2<Js::LayoutSizePolicy<(Js::LayoutSize)1>>__unaligned>
              (op,data_67,dumpFunction,reader);
    return;
  case 0x1a8:
    data_x00288 = ByteCodeReader::Uint8x16_1Bool8x16_1Uint8x16_2_Medium(reader);
    DumpUint8x16_1Bool8x16_1Uint8x16_2<Js::OpLayoutT_Uint8x16_1Bool8x16_1Uint8x16_2<Js::LayoutSizePolicy<(Js::LayoutSize)1>>__unaligned>
              (op,data_x00288,dumpFunction,reader);
    return;
  case 0x1a9:
    data_63 = ByteCodeReader::Uint8x16_2Int1_Medium(reader);
    DumpUint8x16_2Int1<Js::OpLayoutT_Uint8x16_2Int1<Js::LayoutSizePolicy<(Js::LayoutSize)1>>__unaligned>
              (op,data_63,dumpFunction,reader);
    return;
  case 0x1aa:
    pOVar53 = (OpLayoutInt8x16_1Float32x4_1_Medium *)
              ByteCodeReader::Uint8x16_1Float32x4_1_Medium(reader);
    uVar82 = (ulong)pOVar53->I16_0;
    pcVar83 = L" U16_%d ";
LAB_007d351a:
    Output::Print(pcVar83,uVar82);
LAB_007d3521:
    uVar82 = (ulong)pOVar53->F4_1;
    goto LAB_007d4798;
  case 0x1ab:
    pOVar14 = (OpLayoutFloat32x4_1Int32x4_1_Medium *)
              ByteCodeReader::Uint8x16_1Int32x4_1_Medium(reader);
    uVar82 = (ulong)pOVar14->F4_0;
    pcVar83 = L" U16_%d ";
LAB_007d3c08:
    Output::Print(pcVar83,uVar82);
LAB_007d3c0f:
    uVar82 = (ulong)pOVar14->I4_1;
    goto LAB_007d3c79;
  case 0x1ac:
    pOVar44 = (OpLayoutFloat32x4_1Int16x8_1_Medium *)
              ByteCodeReader::Uint8x16_1Int16x8_1_Medium(reader);
    uVar82 = (ulong)pOVar44->F4_0;
    pcVar83 = L" U16_%d ";
LAB_007d3e06:
    Output::Print(pcVar83,uVar82);
LAB_007d3e0d:
    uVar82 = (ulong)pOVar44->I8_1;
    goto LAB_007d4441;
  case 0x1ad:
    pOVar15 = (OpLayoutFloat32x4_1Int8x16_1_Medium *)
              ByteCodeReader::Uint8x16_1Int8x16_1_Medium(reader);
    uVar82 = (ulong)pOVar15->F4_0;
    pcVar83 = L" U16_%d ";
LAB_007d3d59:
    Output::Print(pcVar83,uVar82);
LAB_007d3d60:
    uVar82 = (ulong)pOVar15->I16_1;
    goto LAB_007d45e0;
  case 0x1ae:
    pOVar54 = (OpLayoutFloat32x4_1Uint32x4_1_Medium *)
              ByteCodeReader::Uint8x16_1Uint32x4_1_Medium(reader);
    uVar82 = (ulong)pOVar54->F4_0;
    pcVar83 = L" U16_%d ";
LAB_007d3cf8:
    Output::Print(pcVar83,uVar82);
LAB_007d3cff:
    uVar82 = (ulong)pOVar54->U4_1;
    goto LAB_007d46b8;
  case 0x1af:
    pOVar26 = (OpLayoutFloat32x4_1Uint16x8_1_Medium *)
              ByteCodeReader::Uint8x16_1Uint16x8_1_Medium(reader);
    uVar82 = (ulong)pOVar26->F4_0;
    pcVar83 = L" U16_%d ";
LAB_007d3fde:
    Output::Print(pcVar83,uVar82);
LAB_007d3fe5:
    uVar82 = (ulong)pOVar26->U8_1;
    goto LAB_007d471e;
  case 0x1b0:
    pOVar41 = (OpLayoutBool8x16_1Int1_Medium *)ByteCodeReader::Bool32x4_1Int1_Medium(reader);
    uVar82 = (ulong)pOVar41->B16_0;
    pcVar83 = L" B4_%d ";
    goto LAB_007d3f6f;
  case 0x1b1:
    data_79 = ByteCodeReader::Bool32x4_1Int4_Medium(reader);
    DumpBool32x4_1Int4<Js::OpLayoutT_Bool32x4_1Int4<Js::LayoutSizePolicy<(Js::LayoutSize)1>>__unaligned>
              (op,data_79,dumpFunction,reader);
    return;
  case 0x1b2:
    data_58 = ByteCodeReader::Int1Bool32x4_1Int1_Medium(reader);
    DumpInt1Bool32x4_1Int1<Js::OpLayoutT_Int1Bool32x4_1Int1<Js::LayoutSizePolicy<(Js::LayoutSize)1>>__unaligned>
              (op,data_58,dumpFunction,reader);
    return;
  case 0x1b3:
    data_x00261 = ByteCodeReader::Bool32x4_2Int2_Medium(reader);
    DumpBool32x4_2Int2<Js::OpLayoutT_Bool32x4_2Int2<Js::LayoutSizePolicy<(Js::LayoutSize)1>>__unaligned>
              (op,data_x00261,dumpFunction,reader);
    return;
  case 0x1b4:
    pOVar68 = ByteCodeReader::Int1Bool32x4_1_Medium(reader);
    Output::Print(L" I%d ",(ulong)pOVar68->I0);
    goto LAB_007d38b8;
  case 0x1b5:
    pOVar47 = (OpLayoutBool8x16_2_Medium *)ByteCodeReader::Bool32x4_2_Medium(reader);
    uVar82 = (ulong)pOVar47->B16_0;
    pcVar83 = L" B4_%d ";
    goto LAB_007d3fb6;
  case 0x1b6:
    data_x00259 = ByteCodeReader::Bool32x4_3_Medium(reader);
    DumpBool32x4_3<Js::OpLayoutT_Bool32x4_3<Js::LayoutSizePolicy<(Js::LayoutSize)1>>__unaligned>
              (op,data_x00259,dumpFunction,reader);
    return;
  case 0x1b7:
    pOVar68 = (OpLayoutInt1Bool32x4_1_Medium *)ByteCodeReader::Reg1Bool32x4_1_Medium(reader);
    ByteCodeDumper::DumpReg((uint)pOVar68->I0);
LAB_007d38b8:
    uVar82 = (ulong)pOVar68->B4_1;
    goto LAB_007d3bb5;
  case 0x1b8:
    pOVar41 = (OpLayoutBool8x16_1Int1_Medium *)ByteCodeReader::Bool16x8_1Int1_Medium(reader);
    uVar82 = (ulong)pOVar41->B16_0;
    pcVar83 = L" B8_%d ";
    goto LAB_007d3f6f;
  case 0x1b9:
    data_x00246 = ByteCodeReader::Bool16x8_1Int8_Medium(reader);
    DumpBool16x8_1Int8<Js::OpLayoutT_Bool16x8_1Int8<Js::LayoutSizePolicy<(Js::LayoutSize)1>>__unaligned>
              (op,data_x00246,dumpFunction,reader);
    return;
  case 0x1ba:
    data_x00267 = ByteCodeReader::Int1Bool16x8_1Int1_Medium(reader);
    DumpInt1Bool16x8_1Int1<Js::OpLayoutT_Int1Bool16x8_1Int1<Js::LayoutSizePolicy<(Js::LayoutSize)1>>__unaligned>
              (op,data_x00267,dumpFunction,reader);
    return;
  case 0x1bb:
    data_53 = ByteCodeReader::Bool16x8_2Int2_Medium(reader);
    DumpBool16x8_2Int2<Js::OpLayoutT_Bool16x8_2Int2<Js::LayoutSizePolicy<(Js::LayoutSize)1>>__unaligned>
              (op,data_53,dumpFunction,reader);
    return;
  case 0x1bc:
    pOVar71 = ByteCodeReader::Int1Bool16x8_1_Medium(reader);
    Output::Print(L" I%d ",(ulong)pOVar71->I0);
    goto LAB_007d3a37;
  case 0x1bd:
    pOVar47 = (OpLayoutBool8x16_2_Medium *)ByteCodeReader::Bool16x8_2_Medium(reader);
    uVar82 = (ulong)pOVar47->B16_0;
    pcVar83 = L" B8_%d ";
    goto LAB_007d3fb6;
  case 0x1be:
    data_55 = ByteCodeReader::Bool16x8_3_Medium(reader);
    DumpBool16x8_3<Js::OpLayoutT_Bool16x8_3<Js::LayoutSizePolicy<(Js::LayoutSize)1>>__unaligned>
              (op,data_55,dumpFunction,reader);
    return;
  case 0x1bf:
    pOVar71 = (OpLayoutInt1Bool16x8_1_Medium *)ByteCodeReader::Reg1Bool16x8_1_Medium(reader);
    ByteCodeDumper::DumpReg((uint)pOVar71->I0);
LAB_007d3a37:
    uVar82 = (ulong)pOVar71->B8_1;
    goto LAB_007d3a3b;
  case 0x1c0:
    pOVar41 = ByteCodeReader::Bool8x16_1Int1_Medium(reader);
    uVar82 = (ulong)pOVar41->B16_0;
    pcVar83 = L" B16_%d ";
LAB_007d3f6f:
    Output::Print(pcVar83,uVar82);
LAB_007d3f76:
    uVar82 = (ulong)pOVar41->I1;
    goto LAB_007d4415;
  case 0x1c1:
    data_x00249 = ByteCodeReader::Bool8x16_1Int16_Medium(reader);
    DumpBool8x16_1Int16<Js::OpLayoutT_Bool8x16_1Int16<Js::LayoutSizePolicy<(Js::LayoutSize)1>>__unaligned>
              (op,data_x00249,dumpFunction,reader);
    return;
  case 0x1c2:
    pOVar35 = ByteCodeReader::Int1Bool8x16_1_Medium(reader);
    Output::Print(L" I%d ",(ulong)pOVar35->I0);
    goto LAB_007d0fe5;
  case 0x1c3:
    data_x00169 = ByteCodeReader::Int1Bool8x16_1Int1_Medium(reader);
    DumpInt1Bool8x16_1Int1<Js::OpLayoutT_Int1Bool8x16_1Int1<Js::LayoutSizePolicy<(Js::LayoutSize)1>>__unaligned>
              (op,data_x00169,dumpFunction,reader);
    return;
  case 0x1c4:
    data_x00184 = ByteCodeReader::Bool8x16_2Int2_Medium(reader);
    DumpBool8x16_2Int2<Js::OpLayoutT_Bool8x16_2Int2<Js::LayoutSizePolicy<(Js::LayoutSize)1>>__unaligned>
              (op,data_x00184,dumpFunction,reader);
    return;
  case 0x1c5:
    pOVar47 = ByteCodeReader::Bool8x16_2_Medium(reader);
    uVar82 = (ulong)pOVar47->B16_0;
    pcVar83 = L" B16_%d ";
LAB_007d3fb6:
    Output::Print(pcVar83,uVar82);
    uVar82 = (ulong)pOVar47->B16_1;
    goto LAB_007d4859;
  case 0x1c6:
    data_x00274 = ByteCodeReader::Bool8x16_3_Medium(reader);
    DumpBool8x16_3<Js::OpLayoutT_Bool8x16_3<Js::LayoutSizePolicy<(Js::LayoutSize)1>>__unaligned>
              (op,data_x00274,dumpFunction,reader);
    return;
  case 0x1c7:
    pOVar35 = (OpLayoutInt1Bool8x16_1_Medium *)ByteCodeReader::Reg1Bool8x16_1_Medium(reader);
    ByteCodeDumper::DumpReg((uint)pOVar35->I0);
LAB_007d0fe5:
    uVar82 = (ulong)pOVar35->B16_1;
    goto LAB_007d44ca;
  case 0x1c8:
    data_x00127 = ByteCodeReader::AsmSimdTypedArr_Medium(reader);
    DumpAsmSimdTypedArr<Js::OpLayoutT_AsmSimdTypedArr<Js::LayoutSizePolicy<(Js::LayoutSize)1>>__unaligned>
              (op,data_x00127,dumpFunction,reader);
    return;
  case 0x1c9:
    data_x00265 = ByteCodeReader::AsmShuffle_Medium(reader);
    DumpAsmShuffle<Js::OpLayoutT_AsmShuffle<Js::LayoutSizePolicy<(Js::LayoutSize)1>>__unaligned>
              (op,data_x00265,dumpFunction,reader);
    return;
  case 0x1ca:
    data_x00183 = ByteCodeReader::ElementSlot_Large(reader);
    DumpElementSlot<Js::OpLayoutT_ElementSlot<Js::LayoutSizePolicy<(Js::LayoutSize)2>>__unaligned>
              (op,data_x00183,dumpFunction,reader);
    return;
  case 0x1cd:
    data_88 = ByteCodeReader::AsmTypedArr_Large(reader);
    DumpAsmTypedArr<Js::OpLayoutT_AsmTypedArr<Js::LayoutSizePolicy<(Js::LayoutSize)2>>__unaligned>
              (op,data_88,dumpFunction,reader);
    return;
  case 0x1ce:
    data_61 = ByteCodeReader::WasmMemAccess_Large(reader);
    DumpWasmMemAccess<Js::OpLayoutT_WasmMemAccess<Js::LayoutSizePolicy<(Js::LayoutSize)2>>__unaligned>
              (op,data_61,dumpFunction,reader);
    return;
  case 0x1cf:
    data_56 = ByteCodeReader::AsmCall_Large(reader);
    DumpAsmCall<Js::OpLayoutT_AsmCall<Js::LayoutSizePolicy<(Js::LayoutSize)2>>__unaligned>
              (op,data_56,dumpFunction,reader);
    return;
  case 0x1d0:
    data_93 = ByteCodeReader::ProfiledAsmCall_Large(reader);
    DumpProfiledAsmCall<Js::OpLayoutDynamicProfile<Js::OpLayoutT_AsmCall<Js::LayoutSizePolicy<(Js::LayoutSize)2>>>__unaligned>
              (op,data_93,dumpFunction,reader);
    return;
  case 0x1d2:
    pOVar24 = ByteCodeReader::AsmReg1_Large(reader);
    registerID_01 = pOVar24->R0;
    goto LAB_007d48cc;
  case 0x1d3:
    pOVar64 = (OpLayoutDouble1Reg1_Large *)ByteCodeReader::AsmReg2_Large(reader);
    ByteCodeDumper::DumpReg(pOVar64->D0);
    goto LAB_007d333a;
  case 0x1d4:
    data_x00268 = ByteCodeReader::AsmReg3_Large(reader);
    DumpAsmReg3<Js::OpLayoutT_AsmReg3<Js::LayoutSizePolicy<(Js::LayoutSize)2>>__unaligned>
              (op,data_x00268,dumpFunction,reader);
    return;
  case 0x1d5:
    data_x00270 = ByteCodeReader::AsmReg4_Large(reader);
    DumpAsmReg4<Js::OpLayoutT_AsmReg4<Js::LayoutSizePolicy<(Js::LayoutSize)2>>__unaligned>
              (op,data_x00270,dumpFunction,reader);
    return;
  case 0x1d6:
    data_x00163 = ByteCodeReader::AsmReg5_Large(reader);
    DumpAsmReg5<Js::OpLayoutT_AsmReg5<Js::LayoutSizePolicy<(Js::LayoutSize)2>>__unaligned>
              (op,data_x00163,dumpFunction,reader);
    return;
  case 0x1d7:
    data_x00128 = ByteCodeReader::AsmReg6_Large(reader);
    DumpAsmReg6<Js::OpLayoutT_AsmReg6<Js::LayoutSizePolicy<(Js::LayoutSize)2>>__unaligned>
              (op,data_x00128,dumpFunction,reader);
    return;
  case 0x1d8:
    data_x00185 = ByteCodeReader::AsmReg7_Large(reader);
    DumpAsmReg7<Js::OpLayoutT_AsmReg7<Js::LayoutSizePolicy<(Js::LayoutSize)2>>__unaligned>
              (op,data_x00185,dumpFunction,reader);
    return;
  case 0x1d9:
    data_x00250 = ByteCodeReader::AsmReg9_Large(reader);
    DumpAsmReg9<Js::OpLayoutT_AsmReg9<Js::LayoutSizePolicy<(Js::LayoutSize)2>>__unaligned>
              (op,data_x00250,dumpFunction,reader);
    return;
  case 0x1da:
    data_x00109 = ByteCodeReader::AsmReg10_Large(reader);
    DumpAsmReg10<Js::OpLayoutT_AsmReg10<Js::LayoutSizePolicy<(Js::LayoutSize)2>>__unaligned>
              (op,data_x00109,dumpFunction,reader);
    return;
  case 0x1db:
    data_x00106 = ByteCodeReader::AsmReg11_Large(reader);
    DumpAsmReg11<Js::OpLayoutT_AsmReg11<Js::LayoutSizePolicy<(Js::LayoutSize)2>>__unaligned>
              (op,data_x00106,dumpFunction,reader);
    return;
  case 0x1dc:
    data_68 = ByteCodeReader::AsmReg17_Large(reader);
    DumpAsmReg17<Js::OpLayoutT_AsmReg17<Js::LayoutSizePolicy<(Js::LayoutSize)2>>__unaligned>
              (op,data_68,dumpFunction,reader);
    return;
  case 0x1dd:
    data_66 = ByteCodeReader::AsmReg18_Large(reader);
    DumpAsmReg18<Js::OpLayoutT_AsmReg18<Js::LayoutSizePolicy<(Js::LayoutSize)2>>__unaligned>
              (op,data_66,dumpFunction,reader);
    return;
  case 0x1de:
    data_x00258 = ByteCodeReader::AsmReg19_Large(reader);
    DumpAsmReg19<Js::OpLayoutT_AsmReg19<Js::LayoutSizePolicy<(Js::LayoutSize)2>>__unaligned>
              (op,data_x00258,dumpFunction,reader);
    return;
  case 0x1df:
    pOVar29 = (OpLayoutFloat64x2_1Double1_Large *)ByteCodeReader::Int1Double1_Large(reader);
    uVar82 = (ulong)pOVar29->D2_0;
    pcVar83 = L" I%d ";
    goto LAB_007d12b4;
  case 0x1e0:
    pOVar66 = (OpLayoutDouble1Float1_Large *)ByteCodeReader::Int1Float1_Large(reader);
    uVar82 = (ulong)pOVar66->D0;
    pcVar83 = L" I%d ";
    goto LAB_007d357a;
  case 0x1e1:
    pOVar36 = ByteCodeReader::Double1Const1_Large(reader);
    Output::Print(L" D%d ",(ulong)pOVar36->D0);
    value_03 = pOVar36->C1;
LAB_007d1524:
    ByteCodeDumper::DumpR8(value_03);
    return;
  case 0x1e2:
    pOVar46 = (OpLayoutBool8x16_1Int1_Large *)ByteCodeReader::Double1Int1_Large(reader);
    uVar82 = (ulong)pOVar46->B16_0;
    pcVar83 = L" D%d ";
    goto LAB_007d3106;
  case 0x1e3:
    pOVar66 = ByteCodeReader::Double1Float1_Large(reader);
    uVar82 = (ulong)pOVar66->D0;
    pcVar83 = L" D%d ";
    goto LAB_007d357a;
  case 0x1e4:
    pOVar64 = ByteCodeReader::Double1Reg1_Large(reader);
    uVar82 = (ulong)pOVar64->D0;
    pcVar83 = L" D%d ";
    goto LAB_007d3333;
  case 0x1e5:
    pOVar64 = (OpLayoutDouble1Reg1_Large *)ByteCodeReader::Float1Reg1_Large(reader);
    uVar82 = (ulong)pOVar64->D0;
    pcVar83 = L" F%d ";
    goto LAB_007d3333;
  case 0x1e6:
    pOVar64 = (OpLayoutDouble1Reg1_Large *)ByteCodeReader::Int1Reg1_Large(reader);
    uVar82 = (ulong)pOVar64->D0;
    pcVar83 = L" I%d ";
    goto LAB_007d3333;
  case 0x1e7:
    pOVar29 = (OpLayoutFloat64x2_1Double1_Large *)ByteCodeReader::Reg1Double1_Large(reader);
    ByteCodeDumper::DumpReg(pOVar29->D2_0);
    goto LAB_007d12bb;
  case 0x1e8:
    pOVar66 = (OpLayoutDouble1Float1_Large *)ByteCodeReader::Reg1Float1_Large(reader);
    ByteCodeDumper::DumpReg(pOVar66->D0);
    goto LAB_007d3581;
  case 0x1e9:
    pOVar46 = (OpLayoutBool8x16_1Int1_Large *)ByteCodeReader::Reg1Int1_Large(reader);
    ByteCodeDumper::DumpReg(pOVar46->B16_0);
    goto LAB_007d310d;
  case 0x1ea:
    pOVar63 = ByteCodeReader::Int1Const1_Large(reader);
    Output::Print(L" I%d ",(ulong)pOVar63->I0);
    goto LAB_007d2ffe;
  case 0x1eb:
    pOVar63 = (OpLayoutInt1Const1_Large *)ByteCodeReader::Reg1IntConst1_Large(reader);
    ByteCodeDumper::DumpReg(pOVar63->I0);
LAB_007d2ffe:
    value_00 = pOVar63->C1;
    goto LAB_007d4749;
  case 0x1ec:
    data_73 = ByteCodeReader::Int1Double2_Large(reader);
    DumpInt1Double2<Js::OpLayoutT_Int1Double2<Js::LayoutSizePolicy<(Js::LayoutSize)2>>__unaligned>
              (op,data_73,dumpFunction,reader);
    return;
  case 0x1ed:
    data_x00248 = ByteCodeReader::Int1Float2_Large(reader);
    DumpInt1Float2<Js::OpLayoutT_Int1Float2<Js::LayoutSizePolicy<(Js::LayoutSize)2>>__unaligned>
              (op,data_x00248,dumpFunction,reader);
    return;
  case 0x1ee:
    pOVar45 = (OpLayoutBool8x16_2_Large *)ByteCodeReader::Int2_Large(reader);
    uVar82 = (ulong)pOVar45->B16_0;
    pcVar83 = L" I%d ";
    goto LAB_007d3251;
  case 0x1ef:
    data_77 = ByteCodeReader::Int3_Large(reader);
    DumpInt3<Js::OpLayoutT_Int3<Js::LayoutSizePolicy<(Js::LayoutSize)2>>__unaligned>
              (op,data_77,dumpFunction,reader);
    return;
  case 0x1f0:
    pOVar45 = (OpLayoutBool8x16_2_Large *)ByteCodeReader::Double2_Large(reader);
    uVar82 = (ulong)pOVar45->B16_0;
    pcVar83 = L" D%d ";
    goto LAB_007d3251;
  case 0x1f1:
    pOVar45 = (OpLayoutBool8x16_2_Large *)ByteCodeReader::Float2_Large(reader);
    uVar82 = (ulong)pOVar45->B16_0;
    pcVar83 = L" F%d ";
    goto LAB_007d3251;
  case 0x1f2:
    data_x00247 = ByteCodeReader::Float3_Large(reader);
    DumpFloat3<Js::OpLayoutT_Float3<Js::LayoutSizePolicy<(Js::LayoutSize)2>>__unaligned>
              (op,data_x00247,dumpFunction,reader);
    return;
  case 499:
    pOVar65 = ByteCodeReader::Float1Const1_Large(reader);
    Output::Print(L" F%d ",(ulong)pOVar65->F0);
    value_02 = pOVar65->C1;
LAB_007d3459:
    ByteCodeDumper::DumpR4(value_02);
    return;
  case 500:
    pOVar29 = (OpLayoutFloat64x2_1Double1_Large *)ByteCodeReader::Float1Double1_Large(reader);
    uVar82 = (ulong)pOVar29->D2_0;
    pcVar83 = L" F%d ";
    goto LAB_007d12b4;
  case 0x1f5:
    pOVar46 = (OpLayoutBool8x16_1Int1_Large *)ByteCodeReader::Float1Int1_Large(reader);
    uVar82 = (ulong)pOVar46->B16_0;
    pcVar83 = L" F%d ";
    goto LAB_007d3106;
  case 0x1f6:
    data_91 = ByteCodeReader::Double3_Large(reader);
    DumpDouble3<Js::OpLayoutT_Double3<Js::LayoutSizePolicy<(Js::LayoutSize)2>>__unaligned>
              (op,data_91,dumpFunction,reader);
    return;
  case 0x1f7:
    pOVar34 = ByteCodeReader::BrInt1_Large(reader);
    ByteCodeDumper::DumpOffset(pOVar34->RelativeJumpOffset,reader);
    uVar82 = (ulong)pOVar34->I1;
    goto LAB_007d4415;
  case 0x1f8:
    data_x00244 = ByteCodeReader::BrInt2_Large(reader);
    DumpBrInt2<Js::OpLayoutT_BrInt2<Js::LayoutSizePolicy<(Js::LayoutSize)2>>__unaligned>
              (op,data_x00244,dumpFunction,reader);
    return;
  case 0x1f9:
    data_83 = ByteCodeReader::BrInt1Const1_Large(reader);
    DumpBrInt1Const1<Js::OpLayoutT_BrInt1Const1<Js::LayoutSizePolicy<(Js::LayoutSize)2>>__unaligned>
              (op,data_83,dumpFunction,reader);
    return;
  case 0x1fa:
    pOVar31 = (OpLayoutWasmLoopStart_Large *)ByteCodeReader::AsmUnsigned1_Large(reader);
    goto LAB_007d0c7d;
  case 0x1fb:
    pOVar31 = ByteCodeReader::WasmLoopStart_Large(reader);
LAB_007d0c7d:
    value = pOVar31->loopId;
    goto LAB_007d2f0a;
  case 0x1fc:
    pOVar64 = (OpLayoutDouble1Reg1_Large *)ByteCodeReader::Long1Reg1_Large(reader);
    uVar82 = (ulong)pOVar64->D0;
    pcVar83 = L" L%d ";
LAB_007d3333:
    Output::Print(pcVar83,uVar82);
LAB_007d333a:
    registerID_01 = pOVar64->R1;
    goto LAB_007d48cc;
  case 0x1fd:
    pOVar33 = (OpLayoutDouble1Long1_Large *)ByteCodeReader::Reg1Long1_Large(reader);
    ByteCodeDumper::DumpReg(pOVar33->D0);
    goto LAB_007d2550;
  case 0x1fe:
    pOVar43 = ByteCodeReader::Long1Const1_Large(reader);
    Output::Print(L" L%d ",(ulong)pOVar43->L0);
    value_01 = pOVar43->C1;
LAB_007d1b88:
    ByteCodeDumper::DumpI8(value_01);
    return;
  case 0x1ff:
    pOVar45 = (OpLayoutBool8x16_2_Large *)ByteCodeReader::Long2_Large(reader);
    uVar82 = (ulong)pOVar45->B16_0;
    pcVar83 = L" L%d ";
    goto LAB_007d3251;
  case 0x200:
    data_x00213 = ByteCodeReader::Long3_Large(reader);
    DumpLong3<Js::OpLayoutT_Long3<Js::LayoutSizePolicy<(Js::LayoutSize)2>>__unaligned>
              (op,data_x00213,dumpFunction,reader);
    return;
  case 0x201:
    data_x00187 = ByteCodeReader::Int1Long2_Large(reader);
    DumpInt1Long2<Js::OpLayoutT_Int1Long2<Js::LayoutSizePolicy<(Js::LayoutSize)2>>__unaligned>
              (op,data_x00187,dumpFunction,reader);
    return;
  case 0x202:
    pOVar46 = (OpLayoutBool8x16_1Int1_Large *)ByteCodeReader::Long1Int1_Large(reader);
    uVar82 = (ulong)pOVar46->B16_0;
    pcVar83 = L" L%d ";
    goto LAB_007d3106;
  case 0x203:
    pOVar33 = (OpLayoutDouble1Long1_Large *)ByteCodeReader::Int1Long1_Large(reader);
    uVar82 = (ulong)pOVar33->D0;
    pcVar83 = L" I%d ";
    goto LAB_007d2549;
  case 0x204:
    pOVar66 = (OpLayoutDouble1Float1_Large *)ByteCodeReader::Long1Float1_Large(reader);
    uVar82 = (ulong)pOVar66->D0;
    pcVar83 = L" L%d ";
    goto LAB_007d357a;
  case 0x205:
    pOVar33 = (OpLayoutDouble1Long1_Large *)ByteCodeReader::Float1Long1_Large(reader);
    uVar82 = (ulong)pOVar33->D0;
    pcVar83 = L" F%d ";
    goto LAB_007d2549;
  case 0x206:
    pOVar29 = (OpLayoutFloat64x2_1Double1_Large *)ByteCodeReader::Long1Double1_Large(reader);
    uVar82 = (ulong)pOVar29->D2_0;
    pcVar83 = L" L%d ";
    goto LAB_007d12b4;
  case 0x207:
    pOVar33 = ByteCodeReader::Double1Long1_Large(reader);
    uVar82 = (ulong)pOVar33->D0;
    pcVar83 = L" D%d ";
    goto LAB_007d2549;
  case 0x208:
    pOVar45 = (OpLayoutBool8x16_2_Large *)ByteCodeReader::Float32x4_2_Large(reader);
    uVar82 = (ulong)pOVar45->B16_0;
    pcVar83 = L" F4_%d ";
    goto LAB_007d3251;
  case 0x209:
    data_x00263 = ByteCodeReader::Float32x4_3_Large(reader);
    DumpFloat32x4_3<Js::OpLayoutT_Float32x4_3<Js::LayoutSizePolicy<(Js::LayoutSize)2>>__unaligned>
              (op,data_x00263,dumpFunction,reader);
    return;
  case 0x20a:
    data_x00253 = ByteCodeReader::Float32x4_4_Large(reader);
    DumpFloat32x4_4<Js::OpLayoutT_Float32x4_4<Js::LayoutSizePolicy<(Js::LayoutSize)2>>__unaligned>
              (op,data_x00253,dumpFunction,reader);
    return;
  case 0x20b:
    data_x00260 = ByteCodeReader::Bool32x4_1Float32x4_2_Large(reader);
    DumpBool32x4_1Float32x4_2<Js::OpLayoutT_Bool32x4_1Float32x4_2<Js::LayoutSizePolicy<(Js::LayoutSize)2>>__unaligned>
              (op,data_x00260,dumpFunction,reader);
    return;
  case 0x20c:
    data_x00238 = ByteCodeReader::Float32x4_1Bool32x4_1Float32x4_2_Large(reader);
    DumpFloat32x4_1Bool32x4_1Float32x4_2<Js::OpLayoutT_Float32x4_1Bool32x4_1Float32x4_2<Js::LayoutSizePolicy<(Js::LayoutSize)2>>__unaligned>
              (op,data_x00238,dumpFunction,reader);
    return;
  case 0x20d:
    data_x00130 = ByteCodeReader::Float32x4_1Float4_Large(reader);
    DumpFloat32x4_1Float4<Js::OpLayoutT_Float32x4_1Float4<Js::LayoutSizePolicy<(Js::LayoutSize)2>>__unaligned>
              (op,data_x00130,dumpFunction,reader);
    return;
  case 0x20e:
    data_x00100 = ByteCodeReader::Float32x4_2Int4_Large(reader);
    DumpFloat32x4_2Int4<Js::OpLayoutT_Float32x4_2Int4<Js::LayoutSizePolicy<(Js::LayoutSize)2>>__unaligned>
              (op,data_x00100,dumpFunction,reader);
    return;
  case 0x20f:
    data_x00108 = ByteCodeReader::Float32x4_3Int4_Large(reader);
    DumpFloat32x4_3Int4<Js::OpLayoutT_Float32x4_3Int4<Js::LayoutSizePolicy<(Js::LayoutSize)2>>__unaligned>
              (op,data_x00108,dumpFunction,reader);
    return;
  case 0x210:
    pOVar66 = (OpLayoutDouble1Float1_Large *)ByteCodeReader::Float32x4_1Float1_Large(reader);
    uVar82 = (ulong)pOVar66->D0;
    pcVar83 = L" F4_%d ";
LAB_007d357a:
    Output::Print(pcVar83,uVar82);
LAB_007d3581:
    uVar82 = (ulong)pOVar66->F1;
    goto LAB_007d45b4;
  case 0x211:
    data_84 = ByteCodeReader::Float32x4_2Float1_Large(reader);
    DumpFloat32x4_2Float1<Js::OpLayoutT_Float32x4_2Float1<Js::LayoutSizePolicy<(Js::LayoutSize)2>>__unaligned>
              (op,data_84,dumpFunction,reader);
    return;
  case 0x212:
    pOVar52 = ByteCodeReader::Float32x4_1Int32x4_1_Large(reader);
    uVar82 = (ulong)pOVar52->F4_0;
    pcVar83 = L" F4_%d ";
    goto LAB_007d267c;
  case 0x213:
    pOVar40 = ByteCodeReader::Float32x4_1Uint32x4_1_Large(reader);
    uVar82 = (ulong)pOVar40->F4_0;
    pcVar83 = L" F4_%d ";
    goto LAB_007d2e81;
  case 0x214:
    pOVar57 = ByteCodeReader::Float32x4_1Int16x8_1_Large(reader);
    uVar82 = (ulong)pOVar57->F4_0;
    pcVar83 = L" F4_%d ";
    goto LAB_007d2f43;
  case 0x215:
    pOVar59 = ByteCodeReader::Float32x4_1Uint16x8_1_Large(reader);
    uVar82 = (ulong)pOVar59->F4_0;
    pcVar83 = L" F4_%d ";
    goto LAB_007d31b6;
  case 0x216:
    pOVar56 = ByteCodeReader::Float32x4_1Int8x16_1_Large(reader);
    uVar82 = (ulong)pOVar56->F4_0;
    pcVar83 = L" F4_%d ";
    goto LAB_007d2cf1;
  case 0x217:
    pOVar55 = ByteCodeReader::Float32x4_1Uint8x16_1_Large(reader);
    uVar82 = (ulong)pOVar55->F4_0;
    pcVar83 = L" F4_%d ";
    goto LAB_007d231c;
  case 0x218:
    pOVar49 = (OpLayoutInt8x16_1Float32x4_1_Large *)ByteCodeReader::Reg1Float32x4_1_Large(reader);
    ByteCodeDumper::DumpReg(pOVar49->I16_0);
    goto LAB_007d2c84;
  case 0x219:
    data_94 = ByteCodeReader::Float1Float32x4_1Int1_Large(reader);
    DumpFloat1Float32x4_1Int1<Js::OpLayoutT_Float1Float32x4_1Int1<Js::LayoutSizePolicy<(Js::LayoutSize)2>>__unaligned>
              (op,data_94,dumpFunction,reader);
    return;
  case 0x21a:
    data_x00144 = ByteCodeReader::Float32x4_2Int1Float1_Large(reader);
    DumpFloat32x4_2Int1Float1<Js::OpLayoutT_Float32x4_2Int1Float1<Js::LayoutSizePolicy<(Js::LayoutSize)2>>__unaligned>
              (op,data_x00144,dumpFunction,reader);
    return;
  case 0x21b:
    pOVar45 = (OpLayoutBool8x16_2_Large *)ByteCodeReader::Int32x4_2_Large(reader);
    uVar82 = (ulong)pOVar45->B16_0;
    pcVar83 = L" I4_%d ";
    goto LAB_007d3251;
  case 0x21c:
    data_x00234 = ByteCodeReader::Int32x4_3_Large(reader);
    DumpInt32x4_3<Js::OpLayoutT_Int32x4_3<Js::LayoutSizePolicy<(Js::LayoutSize)2>>__unaligned>
              (op,data_x00234,dumpFunction,reader);
    return;
  case 0x21d:
    data_x00210 = ByteCodeReader::Int32x4_4_Large(reader);
    DumpInt32x4_4<Js::OpLayoutT_Int32x4_4<Js::LayoutSizePolicy<(Js::LayoutSize)2>>__unaligned>
              (op,data_x00210,dumpFunction,reader);
    return;
  case 0x21e:
    data_x00188 = ByteCodeReader::Bool32x4_1Int32x4_2_Large(reader);
    DumpBool32x4_1Int32x4_2<Js::OpLayoutT_Bool32x4_1Int32x4_2<Js::LayoutSizePolicy<(Js::LayoutSize)2>>__unaligned>
              (op,data_x00188,dumpFunction,reader);
    return;
  case 0x21f:
    data_x00132 = ByteCodeReader::Int32x4_1Bool32x4_1Int32x4_2_Large(reader);
    DumpInt32x4_1Bool32x4_1Int32x4_2<Js::OpLayoutT_Int32x4_1Bool32x4_1Int32x4_2<Js::LayoutSizePolicy<(Js::LayoutSize)2>>__unaligned>
              (op,data_x00132,dumpFunction,reader);
    return;
  case 0x220:
    data_x00217 = ByteCodeReader::Int32x4_1Int4_Large(reader);
    DumpInt32x4_1Int4<Js::OpLayoutT_Int32x4_1Int4<Js::LayoutSizePolicy<(Js::LayoutSize)2>>__unaligned>
              (op,data_x00217,dumpFunction,reader);
    return;
  case 0x221:
    data_x00233 = ByteCodeReader::Int32x4_2Int4_Large(reader);
    DumpInt32x4_2Int4<Js::OpLayoutT_Int32x4_2Int4<Js::LayoutSizePolicy<(Js::LayoutSize)2>>__unaligned>
              (op,data_x00233,dumpFunction,reader);
    return;
  case 0x222:
    data_x00251 = ByteCodeReader::Int32x4_3Int4_Large(reader);
    DumpInt32x4_3Int4<Js::OpLayoutT_Int32x4_3Int4<Js::LayoutSizePolicy<(Js::LayoutSize)2>>__unaligned>
              (op,data_x00251,dumpFunction,reader);
    return;
  case 0x223:
    pOVar46 = (OpLayoutBool8x16_1Int1_Large *)ByteCodeReader::Int32x4_1Int1_Large(reader);
    uVar82 = (ulong)pOVar46->B16_0;
    pcVar83 = L" I4_%d ";
    goto LAB_007d3106;
  case 0x224:
    data_98 = ByteCodeReader::Int32x4_2Int1_Large(reader);
    DumpInt32x4_2Int1<Js::OpLayoutT_Int32x4_2Int1<Js::LayoutSizePolicy<(Js::LayoutSize)2>>__unaligned>
              (op,data_98,dumpFunction,reader);
    return;
  case 0x225:
    pOVar52 = (OpLayoutFloat32x4_1Int32x4_1_Large *)ByteCodeReader::Reg1Int32x4_1_Large(reader);
    ByteCodeDumper::DumpReg(pOVar52->F4_0);
    goto LAB_007d2683;
  case 0x226:
    pOVar49 = (OpLayoutInt8x16_1Float32x4_1_Large *)
              ByteCodeReader::Int32x4_1Float32x4_1_Large(reader);
    uVar82 = (ulong)pOVar49->I16_0;
    pcVar83 = L" I4_%d ";
    goto LAB_007d2c7d;
  case 0x227:
    pOVar40 = (OpLayoutFloat32x4_1Uint32x4_1_Large *)
              ByteCodeReader::Int32x4_1Uint32x4_1_Large(reader);
    uVar82 = (ulong)pOVar40->F4_0;
    pcVar83 = L" I4_%d ";
    goto LAB_007d2e81;
  case 0x228:
    pOVar57 = (OpLayoutFloat32x4_1Int16x8_1_Large *)ByteCodeReader::Int32x4_1Int16x8_1_Large(reader)
    ;
    uVar82 = (ulong)pOVar57->F4_0;
    pcVar83 = L" I4_%d ";
    goto LAB_007d2f43;
  case 0x229:
    pOVar59 = (OpLayoutFloat32x4_1Uint16x8_1_Large *)
              ByteCodeReader::Int32x4_1Uint16x8_1_Large(reader);
    uVar82 = (ulong)pOVar59->F4_0;
    pcVar83 = L" I4_%d ";
    goto LAB_007d31b6;
  case 0x22a:
    pOVar56 = (OpLayoutFloat32x4_1Int8x16_1_Large *)ByteCodeReader::Int32x4_1Int8x16_1_Large(reader)
    ;
    uVar82 = (ulong)pOVar56->F4_0;
    pcVar83 = L" I4_%d ";
    goto LAB_007d2cf1;
  case 0x22b:
    pOVar55 = (OpLayoutFloat32x4_1Uint8x16_1_Large *)
              ByteCodeReader::Int32x4_1Uint8x16_1_Large(reader);
    uVar82 = (ulong)pOVar55->F4_0;
    pcVar83 = L" I4_%d ";
    goto LAB_007d231c;
  case 0x22c:
    data_x00147 = ByteCodeReader::Int1Int32x4_1Int1_Large(reader);
    DumpInt1Int32x4_1Int1<Js::OpLayoutT_Int1Int32x4_1Int1<Js::LayoutSizePolicy<(Js::LayoutSize)2>>__unaligned>
              (op,data_x00147,dumpFunction,reader);
    return;
  case 0x22d:
    data_x00155 = ByteCodeReader::Int32x4_2Int2_Large(reader);
    DumpInt32x4_2Int2<Js::OpLayoutT_Int32x4_2Int2<Js::LayoutSizePolicy<(Js::LayoutSize)2>>__unaligned>
              (op,data_x00155,dumpFunction,reader);
    return;
  case 0x22e:
    data_x00190 = ByteCodeReader::Float32x4_IntConst4_Large(reader);
    DumpFloat32x4_IntConst4<Js::OpLayoutT_Float32x4_IntConst4<Js::LayoutSizePolicy<(Js::LayoutSize)2>>__unaligned>
              (op,data_x00190,dumpFunction,reader);
    return;
  case 0x22f:
    data_x00161 = ByteCodeReader::Double1Float64x2_1Int1_Large(reader);
    DumpDouble1Float64x2_1Int1<Js::OpLayoutT_Double1Float64x2_1Int1<Js::LayoutSizePolicy<(Js::LayoutSize)2>>__unaligned>
              (op,data_x00161,dumpFunction,reader);
    return;
  case 0x230:
    data_x00189 = ByteCodeReader::Float64x2_2Int1Double1_Large(reader);
    DumpFloat64x2_2Int1Double1<Js::OpLayoutT_Float64x2_2Int1Double1<Js::LayoutSizePolicy<(Js::LayoutSize)2>>__unaligned>
              (op,data_x00189,dumpFunction,reader);
    return;
  case 0x231:
    pOVar45 = (OpLayoutBool8x16_2_Large *)ByteCodeReader::Float64x2_2_Large(reader);
    uVar82 = (ulong)pOVar45->B16_0;
    pcVar83 = L" D2_%d ";
    goto LAB_007d3251;
  case 0x232:
    data_x00214 = ByteCodeReader::Float64x2_3_Large(reader);
    DumpFloat64x2_3<Js::OpLayoutT_Float64x2_3<Js::LayoutSizePolicy<(Js::LayoutSize)2>>__unaligned>
              (op,data_x00214,dumpFunction,reader);
    return;
  case 0x233:
    pOVar29 = ByteCodeReader::Float64x2_1Double1_Large(reader);
    uVar82 = (ulong)pOVar29->D2_0;
    pcVar83 = L" D2_%d ";
LAB_007d12b4:
    Output::Print(pcVar83,uVar82);
LAB_007d12bb:
    uVar82 = (ulong)pOVar29->D1;
    goto LAB_007d43e9;
  case 0x234:
    pOVar33 = (OpLayoutDouble1Long1_Large *)ByteCodeReader::Int64x2_1Long1_Large(reader);
    uVar82 = (ulong)pOVar33->D0;
    pcVar83 = L" I2_%d ";
LAB_007d2549:
    Output::Print(pcVar83,uVar82);
LAB_007d2550:
    uVar82 = (ulong)pOVar33->L1;
    goto LAB_007d462e;
  case 0x235:
    data_x00157 = ByteCodeReader::Long1Int64x2_1Int1_Large(reader);
    DumpLong1Int64x2_1Int1<Js::OpLayoutT_Long1Int64x2_1Int1<Js::LayoutSizePolicy<(Js::LayoutSize)2>>__unaligned>
              (op,data_x00157,dumpFunction,reader);
    return;
  case 0x236:
    data_x00113 = ByteCodeReader::Int64x2_2_Int1_Long1_Large(reader);
    DumpInt64x2_2_Int1_Long1<Js::OpLayoutT_Int64x2_2_Int1_Long1<Js::LayoutSizePolicy<(Js::LayoutSize)2>>__unaligned>
              (op,data_x00113,dumpFunction,reader);
    return;
  case 0x237:
    data_x00193 = ByteCodeReader::Int64x2_3_Large(reader);
    DumpInt64x2_3<Js::OpLayoutT_Int64x2_3<Js::LayoutSizePolicy<(Js::LayoutSize)2>>__unaligned>
              (op,data_x00193,dumpFunction,reader);
    return;
  case 0x238:
    pOVar45 = (OpLayoutBool8x16_2_Large *)ByteCodeReader::Int64x2_2_Large(reader);
    uVar82 = (ulong)pOVar45->B16_0;
    pcVar83 = L" I2_%d ";
    goto LAB_007d3251;
  case 0x239:
    data_x00152 = ByteCodeReader::Int64x2_2Int1_Large(reader);
    DumpInt64x2_2Int1<Js::OpLayoutT_Int64x2_2Int1<Js::LayoutSizePolicy<(Js::LayoutSize)2>>__unaligned>
              (op,data_x00152,dumpFunction,reader);
    return;
  case 0x23a:
    pOVar58 = ByteCodeReader::Int1Bool64x2_1_Large(reader);
    Output::Print(L" I%d ",(ulong)pOVar58->I0);
    uVar82 = (ulong)pOVar58->I2_1;
LAB_007d38fb:
    pcVar83 = L" I2_%d ";
    goto LAB_007d4859;
  case 0x23b:
    data_x00192 = ByteCodeReader::Int16x8_1Int8_Large(reader);
    DumpInt16x8_1Int8<Js::OpLayoutT_Int16x8_1Int8<Js::LayoutSizePolicy<(Js::LayoutSize)2>>__unaligned>
              (op,data_x00192,dumpFunction,reader);
    return;
  case 0x23c:
    pOVar57 = (OpLayoutFloat32x4_1Int16x8_1_Large *)ByteCodeReader::Reg1Int16x8_1_Large(reader);
    ByteCodeDumper::DumpReg(pOVar57->F4_0);
    goto LAB_007d2f4a;
  case 0x23d:
    pOVar45 = (OpLayoutBool8x16_2_Large *)ByteCodeReader::Int16x8_2_Large(reader);
    uVar82 = (ulong)pOVar45->B16_0;
    pcVar83 = L" I8_%d ";
    goto LAB_007d3251;
  case 0x23e:
    data_x00194 = ByteCodeReader::Int1Int16x8_1Int1_Large(reader);
    DumpInt1Int16x8_1Int1<Js::OpLayoutT_Int1Int16x8_1Int1<Js::LayoutSizePolicy<(Js::LayoutSize)2>>__unaligned>
              (op,data_x00194,dumpFunction,reader);
    return;
  case 0x23f:
    data_x00211 = ByteCodeReader::Int16x8_2Int8_Large(reader);
    DumpInt16x8_2Int8<Js::OpLayoutT_Int16x8_2Int8<Js::LayoutSizePolicy<(Js::LayoutSize)2>>__unaligned>
              (op,data_x00211,dumpFunction,reader);
    return;
  case 0x240:
    data_95 = ByteCodeReader::Int16x8_3Int8_Large(reader);
    DumpInt16x8_3Int8<Js::OpLayoutT_Int16x8_3Int8<Js::LayoutSizePolicy<(Js::LayoutSize)2>>__unaligned>
              (op,data_95,dumpFunction,reader);
    return;
  case 0x241:
    pOVar46 = (OpLayoutBool8x16_1Int1_Large *)ByteCodeReader::Int16x8_1Int1_Large(reader);
    uVar82 = (ulong)pOVar46->B16_0;
    pcVar83 = L" I8_%d ";
    goto LAB_007d3106;
  case 0x242:
    data_x00133 = ByteCodeReader::Int16x8_2Int2_Large(reader);
    DumpInt16x8_2Int2<Js::OpLayoutT_Int16x8_2Int2<Js::LayoutSizePolicy<(Js::LayoutSize)2>>__unaligned>
              (op,data_x00133,dumpFunction,reader);
    return;
  case 0x243:
    data_x00138 = ByteCodeReader::Int16x8_3_Large(reader);
    DumpInt16x8_3<Js::OpLayoutT_Int16x8_3<Js::LayoutSizePolicy<(Js::LayoutSize)2>>__unaligned>
              (op,data_x00138,dumpFunction,reader);
    return;
  case 0x244:
    data_x00104 = ByteCodeReader::Bool16x8_1Int16x8_2_Large(reader);
    DumpBool16x8_1Int16x8_2<Js::OpLayoutT_Bool16x8_1Int16x8_2<Js::LayoutSizePolicy<(Js::LayoutSize)2>>__unaligned>
              (op,data_x00104,dumpFunction,reader);
    return;
  case 0x245:
    data_x00115 = ByteCodeReader::Int16x8_1Bool16x8_1Int16x8_2_Large(reader);
    DumpInt16x8_1Bool16x8_1Int16x8_2<Js::OpLayoutT_Int16x8_1Bool16x8_1Int16x8_2<Js::LayoutSizePolicy<(Js::LayoutSize)2>>__unaligned>
              (op,data_x00115,dumpFunction,reader);
    return;
  case 0x246:
    data_x00220 = ByteCodeReader::Int16x8_2Int1_Large(reader);
    DumpInt16x8_2Int1<Js::OpLayoutT_Int16x8_2Int1<Js::LayoutSizePolicy<(Js::LayoutSize)2>>__unaligned>
              (op,data_x00220,dumpFunction,reader);
    return;
  case 0x247:
    pOVar49 = (OpLayoutInt8x16_1Float32x4_1_Large *)
              ByteCodeReader::Int16x8_1Float32x4_1_Large(reader);
    uVar82 = (ulong)pOVar49->I16_0;
    pcVar83 = L" I8_%d ";
    goto LAB_007d2c7d;
  case 0x248:
    pOVar52 = (OpLayoutFloat32x4_1Int32x4_1_Large *)ByteCodeReader::Int16x8_1Int32x4_1_Large(reader)
    ;
    uVar82 = (ulong)pOVar52->F4_0;
    pcVar83 = L" I8_%d ";
    goto LAB_007d267c;
  case 0x249:
    pOVar56 = (OpLayoutFloat32x4_1Int8x16_1_Large *)ByteCodeReader::Int16x8_1Int8x16_1_Large(reader)
    ;
    uVar82 = (ulong)pOVar56->F4_0;
    pcVar83 = L" I8_%d ";
    goto LAB_007d2cf1;
  case 0x24a:
    pOVar40 = (OpLayoutFloat32x4_1Uint32x4_1_Large *)
              ByteCodeReader::Int16x8_1Uint32x4_1_Large(reader);
    uVar82 = (ulong)pOVar40->F4_0;
    pcVar83 = L" I8_%d ";
    goto LAB_007d2e81;
  case 0x24b:
    pOVar59 = (OpLayoutFloat32x4_1Uint16x8_1_Large *)
              ByteCodeReader::Int16x8_1Uint16x8_1_Large(reader);
    uVar82 = (ulong)pOVar59->F4_0;
    pcVar83 = L" I8_%d ";
    goto LAB_007d31b6;
  case 0x24c:
    pOVar55 = (OpLayoutFloat32x4_1Uint8x16_1_Large *)
              ByteCodeReader::Int16x8_1Uint8x16_1_Large(reader);
    uVar82 = (ulong)pOVar55->F4_0;
    pcVar83 = L" I8_%d ";
    goto LAB_007d231c;
  case 0x24d:
    pOVar45 = (OpLayoutBool8x16_2_Large *)ByteCodeReader::Int8x16_2_Large(reader);
    uVar82 = (ulong)pOVar45->B16_0;
    pcVar83 = L" I16_%d ";
    goto LAB_007d3251;
  case 0x24e:
    data_x00114 = ByteCodeReader::Int8x16_3_Large(reader);
    DumpInt8x16_3<Js::OpLayoutT_Int8x16_3<Js::LayoutSizePolicy<(Js::LayoutSize)2>>__unaligned>
              (op,data_x00114,dumpFunction,reader);
    return;
  case 0x24f:
    data_x00227 = ByteCodeReader::Int8x16_1Int16_Large(reader);
    DumpInt8x16_1Int16<Js::OpLayoutT_Int8x16_1Int16<Js::LayoutSizePolicy<(Js::LayoutSize)2>>__unaligned>
              (op,data_x00227,dumpFunction,reader);
    return;
  case 0x250:
    data_x00175 = ByteCodeReader::Int8x16_2Int16_Large(reader);
    DumpInt8x16_2Int16<Js::OpLayoutT_Int8x16_2Int16<Js::LayoutSizePolicy<(Js::LayoutSize)2>>__unaligned>
              (op,data_x00175,dumpFunction,reader);
    return;
  case 0x251:
    data_x00119 = ByteCodeReader::Int8x16_3Int16_Large(reader);
    DumpInt8x16_3Int16<Js::OpLayoutT_Int8x16_3Int16<Js::LayoutSizePolicy<(Js::LayoutSize)2>>__unaligned>
              (op,data_x00119,dumpFunction,reader);
    return;
  case 0x252:
    pOVar46 = (OpLayoutBool8x16_1Int1_Large *)ByteCodeReader::Int8x16_1Int1_Large(reader);
    uVar82 = (ulong)pOVar46->B16_0;
    pcVar83 = L" I16_%d ";
    goto LAB_007d3106;
  case 0x253:
    data_x00103 = ByteCodeReader::Int8x16_2Int1_Large(reader);
    DumpInt8x16_2Int1<Js::OpLayoutT_Int8x16_2Int1<Js::LayoutSizePolicy<(Js::LayoutSize)2>>__unaligned>
              (op,data_x00103,dumpFunction,reader);
    return;
  case 0x254:
    pOVar56 = (OpLayoutFloat32x4_1Int8x16_1_Large *)ByteCodeReader::Reg1Int8x16_1_Large(reader);
    ByteCodeDumper::DumpReg(pOVar56->F4_0);
    goto LAB_007d2cf8;
  case 0x255:
    data_x00232 = ByteCodeReader::Bool8x16_1Int8x16_2_Large(reader);
    DumpBool8x16_1Int8x16_2<Js::OpLayoutT_Bool8x16_1Int8x16_2<Js::LayoutSizePolicy<(Js::LayoutSize)2>>__unaligned>
              (op,data_x00232,dumpFunction,reader);
    return;
  case 0x256:
    data_x00125 = ByteCodeReader::Int8x16_1Bool8x16_1Int8x16_2_Large(reader);
    DumpInt8x16_1Bool8x16_1Int8x16_2<Js::OpLayoutT_Int8x16_1Bool8x16_1Int8x16_2<Js::LayoutSizePolicy<(Js::LayoutSize)2>>__unaligned>
              (op,data_x00125,dumpFunction,reader);
    return;
  case 599:
    pOVar49 = ByteCodeReader::Int8x16_1Float32x4_1_Large(reader);
    uVar82 = (ulong)pOVar49->I16_0;
    pcVar83 = L" I16_%d ";
    goto LAB_007d2c7d;
  case 600:
    pOVar52 = (OpLayoutFloat32x4_1Int32x4_1_Large *)ByteCodeReader::Int8x16_1Int32x4_1_Large(reader)
    ;
    uVar82 = (ulong)pOVar52->F4_0;
    pcVar83 = L" I16_%d ";
    goto LAB_007d267c;
  case 0x259:
    pOVar57 = (OpLayoutFloat32x4_1Int16x8_1_Large *)ByteCodeReader::Int8x16_1Int16x8_1_Large(reader)
    ;
    uVar82 = (ulong)pOVar57->F4_0;
    pcVar83 = L" I16_%d ";
    goto LAB_007d2f43;
  case 0x25a:
    pOVar40 = (OpLayoutFloat32x4_1Uint32x4_1_Large *)
              ByteCodeReader::Int8x16_1Uint32x4_1_Large(reader);
    uVar82 = (ulong)pOVar40->F4_0;
    pcVar83 = L" I16_%d ";
    goto LAB_007d2e81;
  case 0x25b:
    pOVar59 = (OpLayoutFloat32x4_1Uint16x8_1_Large *)
              ByteCodeReader::Int8x16_1Uint16x8_1_Large(reader);
    uVar82 = (ulong)pOVar59->F4_0;
    pcVar83 = L" I16_%d ";
    goto LAB_007d31b6;
  case 0x25c:
    pOVar55 = (OpLayoutFloat32x4_1Uint8x16_1_Large *)
              ByteCodeReader::Int8x16_1Uint8x16_1_Large(reader);
    uVar82 = (ulong)pOVar55->F4_0;
    pcVar83 = L" I16_%d ";
    goto LAB_007d231c;
  case 0x25d:
    data_x00159 = ByteCodeReader::Int1Int8x16_1Int1_Large(reader);
    DumpInt1Int8x16_1Int1<Js::OpLayoutT_Int1Int8x16_1Int1<Js::LayoutSizePolicy<(Js::LayoutSize)2>>__unaligned>
              (op,data_x00159,dumpFunction,reader);
    return;
  case 0x25e:
    data_x00135 = ByteCodeReader::Int8x16_2Int2_Large(reader);
    DumpInt8x16_2Int2<Js::OpLayoutT_Int8x16_2Int2<Js::LayoutSizePolicy<(Js::LayoutSize)2>>__unaligned>
              (op,data_x00135,dumpFunction,reader);
    return;
  case 0x25f:
    data_x00112 = ByteCodeReader::Uint32x4_1Int4_Large(reader);
    DumpUint32x4_1Int4<Js::OpLayoutT_Uint32x4_1Int4<Js::LayoutSizePolicy<(Js::LayoutSize)2>>__unaligned>
              (op,data_x00112,dumpFunction,reader);
    return;
  case 0x260:
    pOVar40 = (OpLayoutFloat32x4_1Uint32x4_1_Large *)ByteCodeReader::Reg1Uint32x4_1_Large(reader);
    ByteCodeDumper::DumpReg(pOVar40->F4_0);
    goto LAB_007d2e88;
  case 0x261:
    pOVar45 = (OpLayoutBool8x16_2_Large *)ByteCodeReader::Uint32x4_2_Large(reader);
    uVar82 = (ulong)pOVar45->B16_0;
    pcVar83 = L" U4_%d ";
    goto LAB_007d3251;
  case 0x262:
    data_x00176 = ByteCodeReader::Int1Uint32x4_1Int1_Large(reader);
    DumpInt1Uint32x4_1Int1<Js::OpLayoutT_Int1Uint32x4_1Int1<Js::LayoutSizePolicy<(Js::LayoutSize)2>>__unaligned>
              (op,data_x00176,dumpFunction,reader);
    return;
  case 0x263:
    data_x00140 = ByteCodeReader::Uint32x4_2Int4_Large(reader);
    DumpUint32x4_2Int4<Js::OpLayoutT_Uint32x4_2Int4<Js::LayoutSizePolicy<(Js::LayoutSize)2>>__unaligned>
              (op,data_x00140,dumpFunction,reader);
    return;
  case 0x264:
    data_x00219 = ByteCodeReader::Uint32x4_3Int4_Large(reader);
    DumpUint32x4_3Int4<Js::OpLayoutT_Uint32x4_3Int4<Js::LayoutSizePolicy<(Js::LayoutSize)2>>__unaligned>
              (op,data_x00219,dumpFunction,reader);
    return;
  case 0x265:
    pOVar46 = (OpLayoutBool8x16_1Int1_Large *)ByteCodeReader::Uint32x4_1Int1_Large(reader);
    uVar82 = (ulong)pOVar46->B16_0;
    pcVar83 = L" U4_%d ";
    goto LAB_007d3106;
  case 0x266:
    data_x00212 = ByteCodeReader::Uint32x4_2Int2_Large(reader);
    DumpUint32x4_2Int2<Js::OpLayoutT_Uint32x4_2Int2<Js::LayoutSizePolicy<(Js::LayoutSize)2>>__unaligned>
              (op,data_x00212,dumpFunction,reader);
    return;
  case 0x267:
    data_x00136 = ByteCodeReader::Uint32x4_3_Large(reader);
    DumpUint32x4_3<Js::OpLayoutT_Uint32x4_3<Js::LayoutSizePolicy<(Js::LayoutSize)2>>__unaligned>
              (op,data_x00136,dumpFunction,reader);
    return;
  case 0x268:
    data_x00116 = ByteCodeReader::Bool32x4_1Uint32x4_2_Large(reader);
    DumpBool32x4_1Uint32x4_2<Js::OpLayoutT_Bool32x4_1Uint32x4_2<Js::LayoutSizePolicy<(Js::LayoutSize)2>>__unaligned>
              (op,data_x00116,dumpFunction,reader);
    return;
  case 0x269:
    data_x00145 = ByteCodeReader::Uint32x4_1Bool32x4_1Uint32x4_2_Large(reader);
    DumpUint32x4_1Bool32x4_1Uint32x4_2<Js::OpLayoutT_Uint32x4_1Bool32x4_1Uint32x4_2<Js::LayoutSizePolicy<(Js::LayoutSize)2>>__unaligned>
              (op,data_x00145,dumpFunction,reader);
    return;
  case 0x26a:
    data_x00224 = ByteCodeReader::Uint32x4_2Int1_Large(reader);
    DumpUint32x4_2Int1<Js::OpLayoutT_Uint32x4_2Int1<Js::LayoutSizePolicy<(Js::LayoutSize)2>>__unaligned>
              (op,data_x00224,dumpFunction,reader);
    return;
  case 0x26b:
    pOVar49 = (OpLayoutInt8x16_1Float32x4_1_Large *)
              ByteCodeReader::Uint32x4_1Float32x4_1_Large(reader);
    uVar82 = (ulong)pOVar49->I16_0;
    pcVar83 = L" U4_%d ";
    goto LAB_007d2c7d;
  case 0x26c:
    pOVar52 = (OpLayoutFloat32x4_1Int32x4_1_Large *)
              ByteCodeReader::Uint32x4_1Int32x4_1_Large(reader);
    uVar82 = (ulong)pOVar52->F4_0;
    pcVar83 = L" U4_%d ";
    goto LAB_007d267c;
  case 0x26d:
    pOVar57 = (OpLayoutFloat32x4_1Int16x8_1_Large *)
              ByteCodeReader::Uint32x4_1Int16x8_1_Large(reader);
    uVar82 = (ulong)pOVar57->F4_0;
    pcVar83 = L" U4_%d ";
    goto LAB_007d2f43;
  case 0x26e:
    pOVar56 = (OpLayoutFloat32x4_1Int8x16_1_Large *)
              ByteCodeReader::Uint32x4_1Int8x16_1_Large(reader);
    uVar82 = (ulong)pOVar56->F4_0;
    pcVar83 = L" U4_%d ";
    goto LAB_007d2cf1;
  case 0x26f:
    pOVar59 = (OpLayoutFloat32x4_1Uint16x8_1_Large *)
              ByteCodeReader::Uint32x4_1Uint16x8_1_Large(reader);
    uVar82 = (ulong)pOVar59->F4_0;
    pcVar83 = L" U4_%d ";
    goto LAB_007d31b6;
  case 0x270:
    pOVar55 = (OpLayoutFloat32x4_1Uint8x16_1_Large *)
              ByteCodeReader::Uint32x4_1Uint8x16_1_Large(reader);
    uVar82 = (ulong)pOVar55->F4_0;
    pcVar83 = L" U4_%d ";
    goto LAB_007d231c;
  case 0x271:
    data_x00177 = ByteCodeReader::Uint16x8_1Int8_Large(reader);
    DumpUint16x8_1Int8<Js::OpLayoutT_Uint16x8_1Int8<Js::LayoutSizePolicy<(Js::LayoutSize)2>>__unaligned>
              (op,data_x00177,dumpFunction,reader);
    return;
  case 0x272:
    pOVar59 = (OpLayoutFloat32x4_1Uint16x8_1_Large *)ByteCodeReader::Reg1Uint16x8_1_Large(reader);
    ByteCodeDumper::DumpReg(pOVar59->F4_0);
    goto LAB_007d31bd;
  case 0x273:
    pOVar45 = (OpLayoutBool8x16_2_Large *)ByteCodeReader::Uint16x8_2_Large(reader);
    uVar82 = (ulong)pOVar45->B16_0;
    pcVar83 = L" U8_%d ";
    goto LAB_007d3251;
  case 0x274:
    data_x00154 = ByteCodeReader::Int1Uint16x8_1Int1_Large(reader);
    DumpInt1Uint16x8_1Int1<Js::OpLayoutT_Int1Uint16x8_1Int1<Js::LayoutSizePolicy<(Js::LayoutSize)2>>__unaligned>
              (op,data_x00154,dumpFunction,reader);
    return;
  case 0x275:
    data_x00200 = ByteCodeReader::Uint16x8_2Int8_Large(reader);
    DumpUint16x8_2Int8<Js::OpLayoutT_Uint16x8_2Int8<Js::LayoutSizePolicy<(Js::LayoutSize)2>>__unaligned>
              (op,data_x00200,dumpFunction,reader);
    return;
  case 0x276:
    data_x00139 = ByteCodeReader::Uint16x8_3Int8_Large(reader);
    DumpUint16x8_3Int8<Js::OpLayoutT_Uint16x8_3Int8<Js::LayoutSizePolicy<(Js::LayoutSize)2>>__unaligned>
              (op,data_x00139,dumpFunction,reader);
    return;
  case 0x277:
    pOVar46 = (OpLayoutBool8x16_1Int1_Large *)ByteCodeReader::Uint16x8_1Int1_Large(reader);
    uVar82 = (ulong)pOVar46->B16_0;
    pcVar83 = L" U8_%d ";
    goto LAB_007d3106;
  case 0x278:
    data_x00208 = ByteCodeReader::Uint16x8_2Int2_Large(reader);
    DumpUint16x8_2Int2<Js::OpLayoutT_Uint16x8_2Int2<Js::LayoutSizePolicy<(Js::LayoutSize)2>>__unaligned>
              (op,data_x00208,dumpFunction,reader);
    return;
  case 0x279:
    data_x00137 = ByteCodeReader::Uint16x8_3_Large(reader);
    DumpUint16x8_3<Js::OpLayoutT_Uint16x8_3<Js::LayoutSizePolicy<(Js::LayoutSize)2>>__unaligned>
              (op,data_x00137,dumpFunction,reader);
    return;
  case 0x27a:
    data_x00215 = ByteCodeReader::Bool16x8_1Uint16x8_2_Large(reader);
    DumpBool16x8_1Uint16x8_2<Js::OpLayoutT_Bool16x8_1Uint16x8_2<Js::LayoutSizePolicy<(Js::LayoutSize)2>>__unaligned>
              (op,data_x00215,dumpFunction,reader);
    return;
  case 0x27b:
    data_x00221 = ByteCodeReader::Uint16x8_1Bool16x8_1Uint16x8_2_Large(reader);
    DumpUint16x8_1Bool16x8_1Uint16x8_2<Js::OpLayoutT_Uint16x8_1Bool16x8_1Uint16x8_2<Js::LayoutSizePolicy<(Js::LayoutSize)2>>__unaligned>
              (op,data_x00221,dumpFunction,reader);
    return;
  case 0x27c:
    data_x00122 = ByteCodeReader::Uint16x8_2Int1_Large(reader);
    DumpUint16x8_2Int1<Js::OpLayoutT_Uint16x8_2Int1<Js::LayoutSizePolicy<(Js::LayoutSize)2>>__unaligned>
              (op,data_x00122,dumpFunction,reader);
    return;
  case 0x27d:
    pOVar49 = (OpLayoutInt8x16_1Float32x4_1_Large *)
              ByteCodeReader::Uint16x8_1Float32x4_1_Large(reader);
    uVar82 = (ulong)pOVar49->I16_0;
    pcVar83 = L" U8_%d ";
    goto LAB_007d2c7d;
  case 0x27e:
    pOVar52 = (OpLayoutFloat32x4_1Int32x4_1_Large *)
              ByteCodeReader::Uint16x8_1Int32x4_1_Large(reader);
    uVar82 = (ulong)pOVar52->F4_0;
    pcVar83 = L" U8_%d ";
    goto LAB_007d267c;
  case 0x27f:
    pOVar57 = (OpLayoutFloat32x4_1Int16x8_1_Large *)
              ByteCodeReader::Uint16x8_1Int16x8_1_Large(reader);
    uVar82 = (ulong)pOVar57->F4_0;
    pcVar83 = L" U8_%d ";
    goto LAB_007d2f43;
  case 0x280:
    pOVar56 = (OpLayoutFloat32x4_1Int8x16_1_Large *)
              ByteCodeReader::Uint16x8_1Int8x16_1_Large(reader);
    uVar82 = (ulong)pOVar56->F4_0;
    pcVar83 = L" U8_%d ";
    goto LAB_007d2cf1;
  case 0x281:
    pOVar40 = (OpLayoutFloat32x4_1Uint32x4_1_Large *)
              ByteCodeReader::Uint16x8_1Uint32x4_1_Large(reader);
    uVar82 = (ulong)pOVar40->F4_0;
    pcVar83 = L" U8_%d ";
    goto LAB_007d2e81;
  case 0x282:
    pOVar55 = (OpLayoutFloat32x4_1Uint8x16_1_Large *)
              ByteCodeReader::Uint16x8_1Uint8x16_1_Large(reader);
    uVar82 = (ulong)pOVar55->F4_0;
    pcVar83 = L" U8_%d ";
LAB_007d231c:
    Output::Print(pcVar83,uVar82);
LAB_007d2323:
    uVar82 = (ulong)pOVar55->U16_1;
    goto LAB_007d4852;
  case 0x283:
    data_x00126 = ByteCodeReader::Uint8x16_1Int16_Large(reader);
    DumpUint8x16_1Int16<Js::OpLayoutT_Uint8x16_1Int16<Js::LayoutSizePolicy<(Js::LayoutSize)2>>__unaligned>
              (op,data_x00126,dumpFunction,reader);
    return;
  case 0x284:
    pOVar55 = (OpLayoutFloat32x4_1Uint8x16_1_Large *)ByteCodeReader::Reg1Uint8x16_1_Large(reader);
    ByteCodeDumper::DumpReg(pOVar55->F4_0);
    goto LAB_007d2323;
  case 0x285:
    pOVar45 = (OpLayoutBool8x16_2_Large *)ByteCodeReader::Uint8x16_2_Large(reader);
    uVar82 = (ulong)pOVar45->B16_0;
    pcVar83 = L" U16_%d ";
    goto LAB_007d3251;
  case 0x286:
    data_x00160 = ByteCodeReader::Int1Uint8x16_1Int1_Large(reader);
    DumpInt1Uint8x16_1Int1<Js::OpLayoutT_Int1Uint8x16_1Int1<Js::LayoutSizePolicy<(Js::LayoutSize)2>>__unaligned>
              (op,data_x00160,dumpFunction,reader);
    return;
  case 0x287:
    data_x00198 = ByteCodeReader::Uint8x16_2Int16_Large(reader);
    DumpUint8x16_2Int16<Js::OpLayoutT_Uint8x16_2Int16<Js::LayoutSizePolicy<(Js::LayoutSize)2>>__unaligned>
              (op,data_x00198,dumpFunction,reader);
    return;
  case 0x288:
    data_x00203 = ByteCodeReader::Uint8x16_3Int16_Large(reader);
    DumpUint8x16_3Int16<Js::OpLayoutT_Uint8x16_3Int16<Js::LayoutSizePolicy<(Js::LayoutSize)2>>__unaligned>
              (op,data_x00203,dumpFunction,reader);
    return;
  case 0x289:
    pOVar46 = (OpLayoutBool8x16_1Int1_Large *)ByteCodeReader::Uint8x16_1Int1_Large(reader);
    uVar82 = (ulong)pOVar46->B16_0;
    pcVar83 = L" U16_%d ";
    goto LAB_007d3106;
  case 0x28a:
    data_x00142 = ByteCodeReader::Uint8x16_2Int2_Large(reader);
    DumpUint8x16_2Int2<Js::OpLayoutT_Uint8x16_2Int2<Js::LayoutSizePolicy<(Js::LayoutSize)2>>__unaligned>
              (op,data_x00142,dumpFunction,reader);
    return;
  case 0x28b:
    data_x00141 = ByteCodeReader::Uint8x16_3_Large(reader);
    DumpUint8x16_3<Js::OpLayoutT_Uint8x16_3<Js::LayoutSizePolicy<(Js::LayoutSize)2>>__unaligned>
              (op,data_x00141,dumpFunction,reader);
    return;
  case 0x28c:
    data_x00146 = ByteCodeReader::Bool8x16_1Uint8x16_2_Large(reader);
    DumpBool8x16_1Uint8x16_2<Js::OpLayoutT_Bool8x16_1Uint8x16_2<Js::LayoutSizePolicy<(Js::LayoutSize)2>>__unaligned>
              (op,data_x00146,dumpFunction,reader);
    return;
  case 0x28d:
    data_x00151 = ByteCodeReader::Uint8x16_1Bool8x16_1Uint8x16_2_Large(reader);
    DumpUint8x16_1Bool8x16_1Uint8x16_2<Js::OpLayoutT_Uint8x16_1Bool8x16_1Uint8x16_2<Js::LayoutSizePolicy<(Js::LayoutSize)2>>__unaligned>
              (op,data_x00151,dumpFunction,reader);
    return;
  case 0x28e:
    data_x00182 = ByteCodeReader::Uint8x16_2Int1_Large(reader);
    DumpUint8x16_2Int1<Js::OpLayoutT_Uint8x16_2Int1<Js::LayoutSizePolicy<(Js::LayoutSize)2>>__unaligned>
              (op,data_x00182,dumpFunction,reader);
    return;
  case 0x28f:
    pOVar49 = (OpLayoutInt8x16_1Float32x4_1_Large *)
              ByteCodeReader::Uint8x16_1Float32x4_1_Large(reader);
    uVar82 = (ulong)pOVar49->I16_0;
    pcVar83 = L" U16_%d ";
LAB_007d2c7d:
    Output::Print(pcVar83,uVar82);
LAB_007d2c84:
    uVar82 = (ulong)pOVar49->F4_1;
    goto LAB_007d4798;
  case 0x290:
    pOVar52 = (OpLayoutFloat32x4_1Int32x4_1_Large *)
              ByteCodeReader::Uint8x16_1Int32x4_1_Large(reader);
    uVar82 = (ulong)pOVar52->F4_0;
    pcVar83 = L" U16_%d ";
LAB_007d267c:
    Output::Print(pcVar83,uVar82);
LAB_007d2683:
    uVar82 = (ulong)pOVar52->I4_1;
    goto LAB_007d3c79;
  case 0x291:
    pOVar57 = (OpLayoutFloat32x4_1Int16x8_1_Large *)
              ByteCodeReader::Uint8x16_1Int16x8_1_Large(reader);
    uVar82 = (ulong)pOVar57->F4_0;
    pcVar83 = L" U16_%d ";
LAB_007d2f43:
    Output::Print(pcVar83,uVar82);
LAB_007d2f4a:
    uVar82 = (ulong)pOVar57->I8_1;
    goto LAB_007d4441;
  case 0x292:
    pOVar56 = (OpLayoutFloat32x4_1Int8x16_1_Large *)
              ByteCodeReader::Uint8x16_1Int8x16_1_Large(reader);
    uVar82 = (ulong)pOVar56->F4_0;
    pcVar83 = L" U16_%d ";
LAB_007d2cf1:
    Output::Print(pcVar83,uVar82);
LAB_007d2cf8:
    uVar82 = (ulong)pOVar56->I16_1;
    goto LAB_007d45e0;
  case 0x293:
    pOVar40 = (OpLayoutFloat32x4_1Uint32x4_1_Large *)
              ByteCodeReader::Uint8x16_1Uint32x4_1_Large(reader);
    uVar82 = (ulong)pOVar40->F4_0;
    pcVar83 = L" U16_%d ";
LAB_007d2e81:
    Output::Print(pcVar83,uVar82);
LAB_007d2e88:
    uVar82 = (ulong)pOVar40->U4_1;
    goto LAB_007d46b8;
  case 0x294:
    pOVar59 = (OpLayoutFloat32x4_1Uint16x8_1_Large *)
              ByteCodeReader::Uint8x16_1Uint16x8_1_Large(reader);
    uVar82 = (ulong)pOVar59->F4_0;
    pcVar83 = L" U16_%d ";
LAB_007d31b6:
    Output::Print(pcVar83,uVar82);
LAB_007d31bd:
    uVar82 = (ulong)pOVar59->U8_1;
    goto LAB_007d471e;
  case 0x295:
    pOVar46 = (OpLayoutBool8x16_1Int1_Large *)ByteCodeReader::Bool32x4_1Int1_Large(reader);
    uVar82 = (ulong)pOVar46->B16_0;
    pcVar83 = L" B4_%d ";
    goto LAB_007d3106;
  case 0x296:
    data_x00164 = ByteCodeReader::Bool32x4_1Int4_Large(reader);
    DumpBool32x4_1Int4<Js::OpLayoutT_Bool32x4_1Int4<Js::LayoutSizePolicy<(Js::LayoutSize)2>>__unaligned>
              (op,data_x00164,dumpFunction,reader);
    return;
  case 0x297:
    data_x00201 = ByteCodeReader::Int1Bool32x4_1Int1_Large(reader);
    DumpInt1Bool32x4_1Int1<Js::OpLayoutT_Int1Bool32x4_1Int1<Js::LayoutSizePolicy<(Js::LayoutSize)2>>__unaligned>
              (op,data_x00201,dumpFunction,reader);
    return;
  case 0x298:
    data_x00191 = ByteCodeReader::Bool32x4_2Int2_Large(reader);
    DumpBool32x4_2Int2<Js::OpLayoutT_Bool32x4_2Int2<Js::LayoutSizePolicy<(Js::LayoutSize)2>>__unaligned>
              (op,data_x00191,dumpFunction,reader);
    return;
  case 0x299:
    pOVar50 = ByteCodeReader::Int1Bool32x4_1_Large(reader);
    Output::Print(L" I%d ",(ulong)pOVar50->I0);
    goto LAB_007d2399;
  case 0x29a:
    pOVar45 = (OpLayoutBool8x16_2_Large *)ByteCodeReader::Bool32x4_2_Large(reader);
    uVar82 = (ulong)pOVar45->B16_0;
    pcVar83 = L" B4_%d ";
    goto LAB_007d3251;
  case 0x29b:
    data_x00199 = ByteCodeReader::Bool32x4_3_Large(reader);
    DumpBool32x4_3<Js::OpLayoutT_Bool32x4_3<Js::LayoutSizePolicy<(Js::LayoutSize)2>>__unaligned>
              (op,data_x00199,dumpFunction,reader);
    return;
  case 0x29c:
    pOVar50 = (OpLayoutInt1Bool32x4_1_Large *)ByteCodeReader::Reg1Bool32x4_1_Large(reader);
    ByteCodeDumper::DumpReg(pOVar50->I0);
LAB_007d2399:
    uVar82 = (ulong)pOVar50->B4_1;
    goto LAB_007d3bb5;
  case 0x29d:
    pOVar46 = (OpLayoutBool8x16_1Int1_Large *)ByteCodeReader::Bool16x8_1Int1_Large(reader);
    uVar82 = (ulong)pOVar46->B16_0;
    pcVar83 = L" B8_%d ";
    goto LAB_007d3106;
  case 0x29e:
    data_x00148 = ByteCodeReader::Bool16x8_1Int8_Large(reader);
    DumpBool16x8_1Int8<Js::OpLayoutT_Bool16x8_1Int8<Js::LayoutSizePolicy<(Js::LayoutSize)2>>__unaligned>
              (op,data_x00148,dumpFunction,reader);
    return;
  case 0x29f:
    data_x00166 = ByteCodeReader::Int1Bool16x8_1Int1_Large(reader);
    DumpInt1Bool16x8_1Int1<Js::OpLayoutT_Int1Bool16x8_1Int1<Js::LayoutSizePolicy<(Js::LayoutSize)2>>__unaligned>
              (op,data_x00166,dumpFunction,reader);
    return;
  case 0x2a0:
    data_x00150 = ByteCodeReader::Bool16x8_2Int2_Large(reader);
    DumpBool16x8_2Int2<Js::OpLayoutT_Bool16x8_2Int2<Js::LayoutSizePolicy<(Js::LayoutSize)2>>__unaligned>
              (op,data_x00150,dumpFunction,reader);
    return;
  case 0x2a1:
    pOVar51 = ByteCodeReader::Int1Bool16x8_1_Large(reader);
    Output::Print(L" I%d ",(ulong)pOVar51->I0);
    goto LAB_007d23b3;
  case 0x2a2:
    pOVar45 = (OpLayoutBool8x16_2_Large *)ByteCodeReader::Bool16x8_2_Large(reader);
    uVar82 = (ulong)pOVar45->B16_0;
    pcVar83 = L" B8_%d ";
    goto LAB_007d3251;
  case 0x2a3:
    data_x00156 = ByteCodeReader::Bool16x8_3_Large(reader);
    DumpBool16x8_3<Js::OpLayoutT_Bool16x8_3<Js::LayoutSizePolicy<(Js::LayoutSize)2>>__unaligned>
              (op,data_x00156,dumpFunction,reader);
    return;
  case 0x2a4:
    pOVar51 = (OpLayoutInt1Bool16x8_1_Large *)ByteCodeReader::Reg1Bool16x8_1_Large(reader);
    ByteCodeDumper::DumpReg(pOVar51->I0);
LAB_007d23b3:
    uVar82 = (ulong)pOVar51->B8_1;
    goto LAB_007d3a3b;
  case 0x2a5:
    pOVar46 = ByteCodeReader::Bool8x16_1Int1_Large(reader);
    uVar82 = (ulong)pOVar46->B16_0;
    pcVar83 = L" B16_%d ";
LAB_007d3106:
    Output::Print(pcVar83,uVar82);
LAB_007d310d:
    uVar82 = (ulong)pOVar46->I1;
    goto LAB_007d4415;
  case 0x2a6:
    data_x00180 = ByteCodeReader::Bool8x16_1Int16_Large(reader);
    DumpBool8x16_1Int16<Js::OpLayoutT_Bool8x16_1Int16<Js::LayoutSizePolicy<(Js::LayoutSize)2>>__unaligned>
              (op,data_x00180,dumpFunction,reader);
    return;
  case 0x2a7:
    pOVar48 = ByteCodeReader::Int1Bool8x16_1_Large(reader);
    Output::Print(L" I%d ",(ulong)pOVar48->I0);
    goto LAB_007d208f;
  case 0x2a8:
    data_x00179 = ByteCodeReader::Int1Bool8x16_1Int1_Large(reader);
    DumpInt1Bool8x16_1Int1<Js::OpLayoutT_Int1Bool8x16_1Int1<Js::LayoutSizePolicy<(Js::LayoutSize)2>>__unaligned>
              (op,data_x00179,dumpFunction,reader);
    return;
  case 0x2a9:
    data_x00178 = ByteCodeReader::Bool8x16_2Int2_Large(reader);
    DumpBool8x16_2Int2<Js::OpLayoutT_Bool8x16_2Int2<Js::LayoutSizePolicy<(Js::LayoutSize)2>>__unaligned>
              (op,data_x00178,dumpFunction,reader);
    return;
  case 0x2aa:
    pOVar45 = ByteCodeReader::Bool8x16_2_Large(reader);
    uVar82 = (ulong)pOVar45->B16_0;
    pcVar83 = L" B16_%d ";
LAB_007d3251:
    Output::Print(pcVar83,uVar82);
    uVar82 = (ulong)pOVar45->B16_1;
    goto LAB_007d4859;
  case 0x2ab:
    data_x00167 = ByteCodeReader::Bool8x16_3_Large(reader);
    DumpBool8x16_3<Js::OpLayoutT_Bool8x16_3<Js::LayoutSizePolicy<(Js::LayoutSize)2>>__unaligned>
              (op,data_x00167,dumpFunction,reader);
    return;
  case 0x2ac:
    pOVar48 = (OpLayoutInt1Bool8x16_1_Large *)ByteCodeReader::Reg1Bool8x16_1_Large(reader);
    ByteCodeDumper::DumpReg(pOVar48->I0);
LAB_007d208f:
    uVar82 = (ulong)pOVar48->B16_1;
    goto LAB_007d44ca;
  case 0x2ad:
    data_x00172 = ByteCodeReader::AsmSimdTypedArr_Large(reader);
    DumpAsmSimdTypedArr<Js::OpLayoutT_AsmSimdTypedArr<Js::LayoutSizePolicy<(Js::LayoutSize)2>>__unaligned>
              (op,data_x00172,dumpFunction,reader);
    return;
  case 0x2ae:
    data_x00173 = ByteCodeReader::AsmShuffle_Large(reader);
    DumpAsmShuffle<Js::OpLayoutT_AsmShuffle<Js::LayoutSizePolicy<(Js::LayoutSize)2>>__unaligned>
              (op,data_x00173,dumpFunction,reader);
    return;
  }
  Output::Print(pcVar83,uVar82);
  uVar82 = (ulong)pOVar75->B16_1;
LAB_007d4859:
  Output::Print(pcVar83,uVar82);
  return;
}

Assistant:

void AsmJsByteCodeDumper::DumpOp(OpCodeAsmJs op, LayoutSize layoutSize, ByteCodeReader& reader, FunctionBody* dumpFunction)
    {
        Output::Print(_u("%-20s"), OpCodeUtilAsmJs::GetOpCodeName(op));
        OpLayoutTypeAsmJs nType = OpCodeUtilAsmJs::GetOpCodeLayout(op);
        switch (layoutSize * OpLayoutTypeAsmJs::Count + nType)
        {
#define LAYOUT_TYPE(layout) \
            case OpLayoutTypeAsmJs::layout: \
                Assert(layoutSize == SmallLayout); \
                Dump##layout(op, reader.layout(), dumpFunction, reader); \
                break;
#define LAYOUT_TYPE_WMS(layout) \
            case SmallLayout * OpLayoutTypeAsmJs::Count + OpLayoutTypeAsmJs::layout: \
                Dump##layout(op, reader.layout##_Small(), dumpFunction, reader); \
                break; \
            case MediumLayout * OpLayoutTypeAsmJs::Count + OpLayoutTypeAsmJs::layout: \
                Dump##layout(op, reader.layout##_Medium(), dumpFunction, reader); \
                break; \
            case LargeLayout * OpLayoutTypeAsmJs::Count + OpLayoutTypeAsmJs::layout: \
                Dump##layout(op, reader.layout##_Large(), dumpFunction, reader); \
                break;
#include "LayoutTypesAsmJs.h"

        default:
            AssertMsg(false, "Unknown OpLayout");
            break;
        }
    }